

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx::CurveNiIntersectorK<8,4>::
     occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  float *pfVar2;
  undefined1 (*pauVar3) [32];
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Primitive PVar18;
  uint uVar19;
  uint uVar20;
  Geometry *pGVar21;
  __int_type_conflict _Var22;
  RTCFilterFunctionN p_Var23;
  long lVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [28];
  undefined1 auVar132 [28];
  undefined1 auVar133 [28];
  undefined1 auVar134 [28];
  undefined1 auVar135 [28];
  undefined1 auVar136 [28];
  undefined1 auVar137 [24];
  uint uVar138;
  int iVar139;
  RTCIntersectArguments *pRVar140;
  Geometry *geometry;
  long lVar141;
  long lVar142;
  ulong uVar143;
  ulong uVar144;
  ulong uVar145;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar146;
  float fVar160;
  float fVar163;
  float fVar168;
  float fVar170;
  float fVar172;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  float fVar161;
  float fVar162;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar169;
  float fVar171;
  float fVar173;
  float fVar174;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [64];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar177 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar190;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar178 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar194 [16];
  float fVar204;
  undefined1 auVar203 [32];
  float fVar205;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar216;
  float fVar217;
  float fVar219;
  float fVar221;
  float fVar223;
  undefined1 auVar208 [32];
  float fVar218;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar220;
  float fVar222;
  float fVar224;
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  float fVar225;
  float fVar226;
  undefined1 auVar228 [16];
  undefined1 auVar249 [16];
  float fVar239;
  undefined1 auVar227 [16];
  float fVar235;
  float fVar237;
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar229 [32];
  float fVar236;
  float fVar238;
  float fVar240;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  float fVar244;
  float fVar256;
  float fVar258;
  undefined1 auVar246 [16];
  float fVar262;
  float fVar263;
  float fVar264;
  undefined1 auVar250 [32];
  float fVar260;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar245;
  float fVar257;
  float fVar259;
  float fVar261;
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar266 [16];
  float fVar265;
  float fVar276;
  float fVar277;
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  float fVar279;
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  float fVar280;
  float fVar281;
  undefined1 auVar274 [32];
  float fVar278;
  undefined1 auVar275 [64];
  float fVar282;
  undefined1 auVar283 [4];
  float fVar284;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  float fVar300;
  undefined1 auVar301 [16];
  float fVar306;
  float fVar307;
  float fVar309;
  float fVar310;
  float fVar311;
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  float fVar308;
  undefined1 auVar305 [32];
  float fVar312;
  float fVar313;
  float fVar319;
  float fVar321;
  float fVar322;
  float fVar325;
  float fVar326;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  undefined1 auVar314 [32];
  float fVar320;
  float fVar323;
  float fVar324;
  float fVar327;
  float fVar332;
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  float fVar333;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [64];
  float fVar346;
  float fVar347;
  float fVar348;
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  float fVar349;
  float fVar356;
  float fVar357;
  float fVar358;
  float in_register_0000151c;
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  float fVar359;
  undefined1 auVar360 [16];
  float fVar366;
  float fVar367;
  undefined1 auVar361 [32];
  float fVar368;
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  float fVar369;
  float fVar373;
  float fVar374;
  float fVar375;
  float in_register_0000159c;
  undefined1 auVar370 [32];
  float fVar376;
  undefined1 auVar371 [32];
  undefined1 auVar372 [64];
  float in_register_000015dc;
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  bool local_89d;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  uint local_820;
  undefined4 uStack_81c;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  ulong local_7c8;
  undefined1 local_7c0 [32];
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [4];
  undefined1 auStack_77c [8];
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  undefined1 auStack_6f0 [8];
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 auStack_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  undefined8 uStack_6b8;
  undefined1 auStack_6b0 [8];
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  undefined8 uStack_698;
  undefined1 auStack_690 [8];
  float fStack_688;
  undefined1 (*local_678) [16];
  RTCFilterFunctionNArguments local_670;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [16];
  LinearSpace3fa *local_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined1 local_540 [16];
  undefined1 auStack_530 [16];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  RTCHitN local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  undefined4 local_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  uint local_440;
  uint uStack_43c;
  uint uStack_438;
  uint uStack_434;
  uint uStack_430;
  uint uStack_42c;
  uint uStack_428;
  uint uStack_424;
  undefined1 local_420 [8];
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined1 local_400 [8];
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_350 [16];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  uint local_2e0;
  uint local_2dc;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_280 [32];
  float local_260 [4];
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  
  PVar18 = prim[1];
  uVar145 = (ulong)(byte)PVar18;
  lVar142 = uVar145 * 5;
  fVar244 = *(float *)(prim + uVar145 * 0x19 + 0x12);
  auVar249 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar249 = vinsertps_avx(auVar249,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar195 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar195 = vinsertps_avx(auVar195,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar249 = vsubps_avx(auVar249,*(undefined1 (*) [16])(prim + uVar145 * 0x19 + 6));
  auVar175._0_4_ = fVar244 * auVar249._0_4_;
  auVar175._4_4_ = fVar244 * auVar249._4_4_;
  auVar175._8_4_ = fVar244 * auVar249._8_4_;
  auVar175._12_4_ = fVar244 * auVar249._12_4_;
  auVar246._0_4_ = fVar244 * auVar195._0_4_;
  auVar246._4_4_ = fVar244 * auVar195._4_4_;
  auVar246._8_4_ = fVar244 * auVar195._8_4_;
  auVar246._12_4_ = fVar244 * auVar195._12_4_;
  auVar249 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 * 4 + 6)));
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 * 4 + 10)));
  auVar149._16_16_ = auVar195;
  auVar149._0_16_ = auVar249;
  auVar149 = vcvtdq2ps_avx(auVar149);
  auVar249 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar142 + 6)));
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar142 + 10)));
  auVar198._16_16_ = auVar195;
  auVar198._0_16_ = auVar249;
  auVar249 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 * 6 + 6)));
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 * 6 + 10)));
  auVar25 = vcvtdq2ps_avx(auVar198);
  auVar208._16_16_ = auVar195;
  auVar208._0_16_ = auVar249;
  auVar26 = vcvtdq2ps_avx(auVar208);
  auVar249 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 * 0xb + 6)));
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 * 0xb + 10)));
  auVar229._16_16_ = auVar195;
  auVar229._0_16_ = auVar249;
  uVar144 = (ulong)((uint)(byte)PVar18 * 0xc);
  auVar249 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + 6)));
  auVar27 = vcvtdq2ps_avx(auVar229);
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + 10)));
  auVar267._16_16_ = auVar195;
  auVar267._0_16_ = auVar249;
  auVar28 = vcvtdq2ps_avx(auVar267);
  auVar249 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + uVar145 + 6)));
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + uVar145 + 10)));
  auVar285._16_16_ = auVar195;
  auVar285._0_16_ = auVar249;
  auVar29 = vcvtdq2ps_avx(auVar285);
  lVar141 = uVar145 * 9;
  uVar144 = (ulong)(uint)((int)lVar141 * 2);
  auVar249 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + 6)));
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + 10)));
  auVar302._16_16_ = auVar195;
  auVar302._0_16_ = auVar249;
  auVar249 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + uVar145 + 6)));
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + uVar145 + 10)));
  auVar30 = vcvtdq2ps_avx(auVar302);
  auVar314._16_16_ = auVar195;
  auVar314._0_16_ = auVar249;
  auVar31 = vcvtdq2ps_avx(auVar314);
  uVar144 = (ulong)(uint)((int)lVar142 << 2);
  auVar249 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + 6)));
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 + 10)));
  auVar334._16_16_ = auVar195;
  auVar334._0_16_ = auVar249;
  auVar32 = vcvtdq2ps_avx(auVar334);
  auVar249 = vshufps_avx(auVar246,auVar246,0);
  auVar195 = vshufps_avx(auVar246,auVar246,0x55);
  auVar228 = vshufps_avx(auVar246,auVar246,0xaa);
  fVar244 = auVar228._0_4_;
  fVar256 = auVar228._4_4_;
  fVar258 = auVar228._8_4_;
  fVar260 = auVar228._12_4_;
  fVar262 = auVar195._0_4_;
  fVar263 = auVar195._4_4_;
  fVar264 = auVar195._8_4_;
  fVar205 = auVar195._12_4_;
  fVar216 = auVar249._0_4_;
  fVar217 = auVar249._4_4_;
  fVar218 = auVar249._8_4_;
  fVar219 = auVar249._12_4_;
  auVar350._0_4_ = fVar216 * auVar149._0_4_ + fVar262 * auVar25._0_4_ + fVar244 * auVar26._0_4_;
  auVar350._4_4_ = fVar217 * auVar149._4_4_ + fVar263 * auVar25._4_4_ + fVar256 * auVar26._4_4_;
  auVar350._8_4_ = fVar218 * auVar149._8_4_ + fVar264 * auVar25._8_4_ + fVar258 * auVar26._8_4_;
  auVar350._12_4_ = fVar219 * auVar149._12_4_ + fVar205 * auVar25._12_4_ + fVar260 * auVar26._12_4_;
  auVar350._16_4_ = fVar216 * auVar149._16_4_ + fVar262 * auVar25._16_4_ + fVar244 * auVar26._16_4_;
  auVar350._20_4_ = fVar217 * auVar149._20_4_ + fVar263 * auVar25._20_4_ + fVar256 * auVar26._20_4_;
  auVar350._24_4_ = fVar218 * auVar149._24_4_ + fVar264 * auVar25._24_4_ + fVar258 * auVar26._24_4_;
  auVar350._28_4_ = fVar205 + in_register_000015dc + in_register_0000151c;
  auVar344._0_4_ = fVar216 * auVar27._0_4_ + fVar262 * auVar28._0_4_ + fVar244 * auVar29._0_4_;
  auVar344._4_4_ = fVar217 * auVar27._4_4_ + fVar263 * auVar28._4_4_ + fVar256 * auVar29._4_4_;
  auVar344._8_4_ = fVar218 * auVar27._8_4_ + fVar264 * auVar28._8_4_ + fVar258 * auVar29._8_4_;
  auVar344._12_4_ = fVar219 * auVar27._12_4_ + fVar205 * auVar28._12_4_ + fVar260 * auVar29._12_4_;
  auVar344._16_4_ = fVar216 * auVar27._16_4_ + fVar262 * auVar28._16_4_ + fVar244 * auVar29._16_4_;
  auVar344._20_4_ = fVar217 * auVar27._20_4_ + fVar263 * auVar28._20_4_ + fVar256 * auVar29._20_4_;
  auVar344._24_4_ = fVar218 * auVar27._24_4_ + fVar264 * auVar28._24_4_ + fVar258 * auVar29._24_4_;
  auVar344._28_4_ = fVar205 + in_register_000015dc + in_register_0000159c;
  auVar250._0_4_ = fVar216 * auVar30._0_4_ + fVar262 * auVar31._0_4_ + auVar32._0_4_ * fVar244;
  auVar250._4_4_ = fVar217 * auVar30._4_4_ + fVar263 * auVar31._4_4_ + auVar32._4_4_ * fVar256;
  auVar250._8_4_ = fVar218 * auVar30._8_4_ + fVar264 * auVar31._8_4_ + auVar32._8_4_ * fVar258;
  auVar250._12_4_ = fVar219 * auVar30._12_4_ + fVar205 * auVar31._12_4_ + auVar32._12_4_ * fVar260;
  auVar250._16_4_ = fVar216 * auVar30._16_4_ + fVar262 * auVar31._16_4_ + auVar32._16_4_ * fVar244;
  auVar250._20_4_ = fVar217 * auVar30._20_4_ + fVar263 * auVar31._20_4_ + auVar32._20_4_ * fVar256;
  auVar250._24_4_ = fVar218 * auVar30._24_4_ + fVar264 * auVar31._24_4_ + auVar32._24_4_ * fVar258;
  auVar250._28_4_ = fVar219 + fVar205 + fVar260;
  auVar249 = vshufps_avx(auVar175,auVar175,0);
  auVar195 = vshufps_avx(auVar175,auVar175,0x55);
  auVar228 = vshufps_avx(auVar175,auVar175,0xaa);
  fVar256 = auVar228._0_4_;
  fVar258 = auVar228._4_4_;
  fVar260 = auVar228._8_4_;
  fVar262 = auVar228._12_4_;
  fVar217 = auVar195._0_4_;
  fVar218 = auVar195._4_4_;
  fVar219 = auVar195._8_4_;
  fVar221 = auVar195._12_4_;
  fVar263 = auVar249._0_4_;
  fVar264 = auVar249._4_4_;
  fVar205 = auVar249._8_4_;
  fVar216 = auVar249._12_4_;
  fVar244 = auVar149._28_4_;
  auVar268._0_4_ = fVar263 * auVar149._0_4_ + fVar217 * auVar25._0_4_ + fVar256 * auVar26._0_4_;
  auVar268._4_4_ = fVar264 * auVar149._4_4_ + fVar218 * auVar25._4_4_ + fVar258 * auVar26._4_4_;
  auVar268._8_4_ = fVar205 * auVar149._8_4_ + fVar219 * auVar25._8_4_ + fVar260 * auVar26._8_4_;
  auVar268._12_4_ = fVar216 * auVar149._12_4_ + fVar221 * auVar25._12_4_ + fVar262 * auVar26._12_4_;
  auVar268._16_4_ = fVar263 * auVar149._16_4_ + fVar217 * auVar25._16_4_ + fVar256 * auVar26._16_4_;
  auVar268._20_4_ = fVar264 * auVar149._20_4_ + fVar218 * auVar25._20_4_ + fVar258 * auVar26._20_4_;
  auVar268._24_4_ = fVar205 * auVar149._24_4_ + fVar219 * auVar25._24_4_ + fVar260 * auVar26._24_4_;
  auVar268._28_4_ = fVar244 + auVar25._28_4_ + auVar26._28_4_;
  auVar199._0_4_ = fVar263 * auVar27._0_4_ + fVar217 * auVar28._0_4_ + fVar256 * auVar29._0_4_;
  auVar199._4_4_ = fVar264 * auVar27._4_4_ + fVar218 * auVar28._4_4_ + fVar258 * auVar29._4_4_;
  auVar199._8_4_ = fVar205 * auVar27._8_4_ + fVar219 * auVar28._8_4_ + fVar260 * auVar29._8_4_;
  auVar199._12_4_ = fVar216 * auVar27._12_4_ + fVar221 * auVar28._12_4_ + fVar262 * auVar29._12_4_;
  auVar199._16_4_ = fVar263 * auVar27._16_4_ + fVar217 * auVar28._16_4_ + fVar256 * auVar29._16_4_;
  auVar199._20_4_ = fVar264 * auVar27._20_4_ + fVar218 * auVar28._20_4_ + fVar258 * auVar29._20_4_;
  auVar199._24_4_ = fVar205 * auVar27._24_4_ + fVar219 * auVar28._24_4_ + fVar260 * auVar29._24_4_;
  auVar199._28_4_ = fVar244 + auVar26._28_4_ + auVar29._28_4_;
  auVar150._0_4_ = fVar263 * auVar30._0_4_ + fVar217 * auVar31._0_4_ + auVar32._0_4_ * fVar256;
  auVar150._4_4_ = fVar264 * auVar30._4_4_ + fVar218 * auVar31._4_4_ + auVar32._4_4_ * fVar258;
  auVar150._8_4_ = fVar205 * auVar30._8_4_ + fVar219 * auVar31._8_4_ + auVar32._8_4_ * fVar260;
  auVar150._12_4_ = fVar216 * auVar30._12_4_ + fVar221 * auVar31._12_4_ + auVar32._12_4_ * fVar262;
  auVar150._16_4_ = fVar263 * auVar30._16_4_ + fVar217 * auVar31._16_4_ + auVar32._16_4_ * fVar256;
  auVar150._20_4_ = fVar264 * auVar30._20_4_ + fVar218 * auVar31._20_4_ + auVar32._20_4_ * fVar258;
  auVar150._24_4_ = fVar205 * auVar30._24_4_ + fVar219 * auVar31._24_4_ + auVar32._24_4_ * fVar260;
  auVar150._28_4_ = fVar244 + auVar28._28_4_ + fVar262;
  auVar286._8_4_ = 0x7fffffff;
  auVar286._0_8_ = 0x7fffffff7fffffff;
  auVar286._12_4_ = 0x7fffffff;
  auVar286._16_4_ = 0x7fffffff;
  auVar286._20_4_ = 0x7fffffff;
  auVar286._24_4_ = 0x7fffffff;
  auVar286._28_4_ = 0x7fffffff;
  auVar181._8_4_ = 0x219392ef;
  auVar181._0_8_ = 0x219392ef219392ef;
  auVar181._12_4_ = 0x219392ef;
  auVar181._16_4_ = 0x219392ef;
  auVar181._20_4_ = 0x219392ef;
  auVar181._24_4_ = 0x219392ef;
  auVar181._28_4_ = 0x219392ef;
  auVar149 = vandps_avx(auVar350,auVar286);
  auVar149 = vcmpps_avx(auVar149,auVar181,1);
  auVar25 = vblendvps_avx(auVar350,auVar181,auVar149);
  auVar149 = vandps_avx(auVar344,auVar286);
  auVar149 = vcmpps_avx(auVar149,auVar181,1);
  auVar26 = vblendvps_avx(auVar344,auVar181,auVar149);
  auVar149 = vandps_avx(auVar250,auVar286);
  auVar149 = vcmpps_avx(auVar149,auVar181,1);
  auVar149 = vblendvps_avx(auVar250,auVar181,auVar149);
  auVar27 = vrcpps_avx(auVar25);
  fVar244 = auVar27._0_4_;
  fVar256 = auVar27._4_4_;
  auVar28._4_4_ = auVar25._4_4_ * fVar256;
  auVar28._0_4_ = auVar25._0_4_ * fVar244;
  fVar258 = auVar27._8_4_;
  auVar28._8_4_ = auVar25._8_4_ * fVar258;
  fVar260 = auVar27._12_4_;
  auVar28._12_4_ = auVar25._12_4_ * fVar260;
  fVar262 = auVar27._16_4_;
  auVar28._16_4_ = auVar25._16_4_ * fVar262;
  fVar263 = auVar27._20_4_;
  auVar28._20_4_ = auVar25._20_4_ * fVar263;
  fVar264 = auVar27._24_4_;
  auVar28._24_4_ = auVar25._24_4_ * fVar264;
  auVar28._28_4_ = auVar25._28_4_;
  auVar287._8_4_ = 0x3f800000;
  auVar287._0_8_ = &DAT_3f8000003f800000;
  auVar287._12_4_ = 0x3f800000;
  auVar287._16_4_ = 0x3f800000;
  auVar287._20_4_ = 0x3f800000;
  auVar287._24_4_ = 0x3f800000;
  auVar287._28_4_ = 0x3f800000;
  auVar28 = vsubps_avx(auVar287,auVar28);
  fVar244 = fVar244 + fVar244 * auVar28._0_4_;
  fVar256 = fVar256 + fVar256 * auVar28._4_4_;
  fVar258 = fVar258 + fVar258 * auVar28._8_4_;
  fVar260 = fVar260 + fVar260 * auVar28._12_4_;
  fVar262 = fVar262 + fVar262 * auVar28._16_4_;
  fVar263 = fVar263 + fVar263 * auVar28._20_4_;
  fVar264 = fVar264 + fVar264 * auVar28._24_4_;
  auVar25 = vrcpps_avx(auVar26);
  fVar205 = auVar25._0_4_;
  fVar216 = auVar25._4_4_;
  auVar29._4_4_ = fVar216 * auVar26._4_4_;
  auVar29._0_4_ = fVar205 * auVar26._0_4_;
  fVar217 = auVar25._8_4_;
  auVar29._8_4_ = fVar217 * auVar26._8_4_;
  fVar218 = auVar25._12_4_;
  auVar29._12_4_ = fVar218 * auVar26._12_4_;
  fVar219 = auVar25._16_4_;
  auVar29._16_4_ = fVar219 * auVar26._16_4_;
  fVar221 = auVar25._20_4_;
  auVar29._20_4_ = fVar221 * auVar26._20_4_;
  fVar223 = auVar25._24_4_;
  auVar29._24_4_ = fVar223 * auVar26._24_4_;
  auVar29._28_4_ = auVar26._28_4_;
  auVar25 = vsubps_avx(auVar287,auVar29);
  fVar205 = fVar205 + fVar205 * auVar25._0_4_;
  fVar216 = fVar216 + fVar216 * auVar25._4_4_;
  fVar217 = fVar217 + fVar217 * auVar25._8_4_;
  fVar218 = fVar218 + fVar218 * auVar25._12_4_;
  fVar219 = fVar219 + fVar219 * auVar25._16_4_;
  fVar221 = fVar221 + fVar221 * auVar25._20_4_;
  fVar223 = fVar223 + fVar223 * auVar25._24_4_;
  auVar25 = vrcpps_avx(auVar149);
  fVar225 = auVar25._0_4_;
  fVar235 = auVar25._4_4_;
  auVar26._4_4_ = fVar235 * auVar149._4_4_;
  auVar26._0_4_ = fVar225 * auVar149._0_4_;
  fVar237 = auVar25._8_4_;
  auVar26._8_4_ = fVar237 * auVar149._8_4_;
  fVar239 = auVar25._12_4_;
  auVar26._12_4_ = fVar239 * auVar149._12_4_;
  fVar241 = auVar25._16_4_;
  auVar26._16_4_ = fVar241 * auVar149._16_4_;
  fVar242 = auVar25._20_4_;
  auVar26._20_4_ = fVar242 * auVar149._20_4_;
  fVar243 = auVar25._24_4_;
  auVar26._24_4_ = fVar243 * auVar149._24_4_;
  auVar26._28_4_ = auVar149._28_4_;
  auVar149 = vsubps_avx(auVar287,auVar26);
  auVar249._8_8_ = 0;
  auVar249._0_8_ = *(ulong *)(prim + uVar145 * 7 + 6);
  auVar249 = vpmovsxwd_avx(auVar249);
  auVar195._8_8_ = 0;
  auVar195._0_8_ = *(ulong *)(prim + uVar145 * 7 + 0xe);
  auVar195 = vpmovsxwd_avx(auVar195);
  fVar225 = fVar225 + fVar225 * auVar149._0_4_;
  fVar235 = fVar235 + fVar235 * auVar149._4_4_;
  fVar237 = fVar237 + fVar237 * auVar149._8_4_;
  fVar239 = fVar239 + fVar239 * auVar149._12_4_;
  fVar241 = fVar241 + fVar241 * auVar149._16_4_;
  fVar242 = fVar242 + fVar242 * auVar149._20_4_;
  fVar243 = fVar243 + fVar243 * auVar149._24_4_;
  auVar182._16_16_ = auVar195;
  auVar182._0_16_ = auVar249;
  auVar149 = vcvtdq2ps_avx(auVar182);
  auVar149 = vsubps_avx(auVar149,auVar268);
  auVar228._8_8_ = 0;
  auVar228._0_8_ = *(ulong *)(prim + lVar141 + 6);
  auVar249 = vpmovsxwd_avx(auVar228);
  auVar207._8_8_ = 0;
  auVar207._0_8_ = *(ulong *)(prim + lVar141 + 0xe);
  auVar195 = vpmovsxwd_avx(auVar207);
  auVar176._0_4_ = fVar244 * auVar149._0_4_;
  auVar176._4_4_ = fVar256 * auVar149._4_4_;
  auVar176._8_4_ = fVar258 * auVar149._8_4_;
  auVar176._12_4_ = fVar260 * auVar149._12_4_;
  auVar30._16_4_ = fVar262 * auVar149._16_4_;
  auVar30._0_16_ = auVar176;
  auVar30._20_4_ = fVar263 * auVar149._20_4_;
  auVar30._24_4_ = fVar264 * auVar149._24_4_;
  auVar30._28_4_ = auVar149._28_4_;
  auVar288._16_16_ = auVar195;
  auVar288._0_16_ = auVar249;
  auVar149 = vcvtdq2ps_avx(auVar288);
  auVar149 = vsubps_avx(auVar149,auVar268);
  lVar142 = (ulong)(byte)PVar18 * 0x10;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + lVar142 + 6);
  auVar249 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + lVar142 + 0xe);
  auVar195 = vpmovsxwd_avx(auVar11);
  lVar142 = lVar142 + uVar145 * -2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + lVar142 + 6);
  auVar228 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + lVar142 + 0xe);
  auVar207 = vpmovsxwd_avx(auVar13);
  auVar247._0_4_ = fVar244 * auVar149._0_4_;
  auVar247._4_4_ = fVar256 * auVar149._4_4_;
  auVar247._8_4_ = fVar258 * auVar149._8_4_;
  auVar247._12_4_ = fVar260 * auVar149._12_4_;
  auVar31._16_4_ = fVar262 * auVar149._16_4_;
  auVar31._0_16_ = auVar247;
  auVar31._20_4_ = fVar263 * auVar149._20_4_;
  auVar31._24_4_ = fVar264 * auVar149._24_4_;
  auVar31._28_4_ = auVar27._28_4_ + auVar28._28_4_;
  auVar269._16_16_ = auVar207;
  auVar269._0_16_ = auVar228;
  auVar149 = vcvtdq2ps_avx(auVar269);
  auVar149 = vsubps_avx(auVar149,auVar199);
  auVar266._0_4_ = fVar205 * auVar149._0_4_;
  auVar266._4_4_ = fVar216 * auVar149._4_4_;
  auVar266._8_4_ = fVar217 * auVar149._8_4_;
  auVar266._12_4_ = fVar218 * auVar149._12_4_;
  auVar27._16_4_ = fVar219 * auVar149._16_4_;
  auVar27._0_16_ = auVar266;
  auVar27._20_4_ = fVar221 * auVar149._20_4_;
  auVar27._24_4_ = fVar223 * auVar149._24_4_;
  auVar27._28_4_ = auVar149._28_4_;
  auVar289._16_16_ = auVar195;
  auVar289._0_16_ = auVar249;
  auVar149 = vcvtdq2ps_avx(auVar289);
  auVar149 = vsubps_avx(auVar149,auVar199);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar144 + uVar145 + 6);
  auVar249 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar144 + uVar145 + 0xe);
  auVar195 = vpmovsxwd_avx(auVar15);
  auVar191._0_4_ = fVar205 * auVar149._0_4_;
  auVar191._4_4_ = fVar216 * auVar149._4_4_;
  auVar191._8_4_ = fVar217 * auVar149._8_4_;
  auVar191._12_4_ = fVar218 * auVar149._12_4_;
  auVar32._16_4_ = fVar219 * auVar149._16_4_;
  auVar32._0_16_ = auVar191;
  auVar32._20_4_ = fVar221 * auVar149._20_4_;
  auVar32._24_4_ = fVar223 * auVar149._24_4_;
  auVar32._28_4_ = auVar149._28_4_;
  auVar209._16_16_ = auVar195;
  auVar209._0_16_ = auVar249;
  auVar149 = vcvtdq2ps_avx(auVar209);
  auVar149 = vsubps_avx(auVar149,auVar150);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar145 * 0x17 + 6);
  auVar249 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar145 * 0x17 + 0xe);
  auVar195 = vpmovsxwd_avx(auVar17);
  auVar206._0_4_ = fVar225 * auVar149._0_4_;
  auVar206._4_4_ = fVar235 * auVar149._4_4_;
  auVar206._8_4_ = fVar237 * auVar149._8_4_;
  auVar206._12_4_ = fVar239 * auVar149._12_4_;
  auVar33._16_4_ = fVar241 * auVar149._16_4_;
  auVar33._0_16_ = auVar206;
  auVar33._20_4_ = fVar242 * auVar149._20_4_;
  auVar33._24_4_ = fVar243 * auVar149._24_4_;
  auVar33._28_4_ = auVar149._28_4_;
  auVar290._16_16_ = auVar195;
  auVar290._0_16_ = auVar249;
  auVar149 = vcvtdq2ps_avx(auVar290);
  auVar149 = vsubps_avx(auVar149,auVar150);
  auVar147._0_4_ = fVar225 * auVar149._0_4_;
  auVar147._4_4_ = fVar235 * auVar149._4_4_;
  auVar147._8_4_ = fVar237 * auVar149._8_4_;
  auVar147._12_4_ = fVar239 * auVar149._12_4_;
  auVar34._16_4_ = fVar241 * auVar149._16_4_;
  auVar34._0_16_ = auVar147;
  auVar34._20_4_ = fVar242 * auVar149._20_4_;
  auVar34._24_4_ = fVar243 * auVar149._24_4_;
  auVar34._28_4_ = auVar149._28_4_;
  auVar249 = vpminsd_avx(auVar30._16_16_,auVar31._16_16_);
  auVar195 = vpminsd_avx(auVar176,auVar247);
  auVar303._16_16_ = auVar249;
  auVar303._0_16_ = auVar195;
  auVar249 = vpminsd_avx(auVar27._16_16_,auVar32._16_16_);
  auVar195 = vpminsd_avx(auVar266,auVar191);
  auVar345._16_16_ = auVar249;
  auVar345._0_16_ = auVar195;
  auVar149 = vmaxps_avx(auVar303,auVar345);
  auVar249 = vpminsd_avx(auVar33._16_16_,auVar34._16_16_);
  auVar195 = vpminsd_avx(auVar206,auVar147);
  auVar361._16_16_ = auVar249;
  auVar361._0_16_ = auVar195;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar370._4_4_ = uVar8;
  auVar370._0_4_ = uVar8;
  auVar370._8_4_ = uVar8;
  auVar370._12_4_ = uVar8;
  auVar370._16_4_ = uVar8;
  auVar370._20_4_ = uVar8;
  auVar370._24_4_ = uVar8;
  auVar370._28_4_ = uVar8;
  auVar25 = vmaxps_avx(auVar361,auVar370);
  auVar149 = vmaxps_avx(auVar149,auVar25);
  local_80._4_4_ = auVar149._4_4_ * 0.99999964;
  local_80._0_4_ = auVar149._0_4_ * 0.99999964;
  local_80._8_4_ = auVar149._8_4_ * 0.99999964;
  local_80._12_4_ = auVar149._12_4_ * 0.99999964;
  local_80._16_4_ = auVar149._16_4_ * 0.99999964;
  local_80._20_4_ = auVar149._20_4_ * 0.99999964;
  local_80._24_4_ = auVar149._24_4_ * 0.99999964;
  local_80._28_4_ = auVar149._28_4_;
  auVar249 = vpmaxsd_avx(auVar30._16_16_,auVar31._16_16_);
  auVar195 = vpmaxsd_avx(auVar176,auVar247);
  auVar183._16_16_ = auVar249;
  auVar183._0_16_ = auVar195;
  auVar249 = vpmaxsd_avx(auVar27._16_16_,auVar32._16_16_);
  auVar195 = vpmaxsd_avx(auVar266,auVar191);
  auVar200._16_16_ = auVar249;
  auVar200._0_16_ = auVar195;
  auVar149 = vminps_avx(auVar183,auVar200);
  auVar249 = vpmaxsd_avx(auVar33._16_16_,auVar34._16_16_);
  auVar195 = vpmaxsd_avx(auVar206,auVar147);
  auVar151._16_16_ = auVar249;
  auVar151._0_16_ = auVar195;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar201._4_4_ = uVar8;
  auVar201._0_4_ = uVar8;
  auVar201._8_4_ = uVar8;
  auVar201._12_4_ = uVar8;
  auVar201._16_4_ = uVar8;
  auVar201._20_4_ = uVar8;
  auVar201._24_4_ = uVar8;
  auVar201._28_4_ = uVar8;
  auVar25 = vminps_avx(auVar151,auVar201);
  auVar149 = vminps_avx(auVar149,auVar25);
  auVar25._4_4_ = auVar149._4_4_ * 1.0000004;
  auVar25._0_4_ = auVar149._0_4_ * 1.0000004;
  auVar25._8_4_ = auVar149._8_4_ * 1.0000004;
  auVar25._12_4_ = auVar149._12_4_ * 1.0000004;
  auVar25._16_4_ = auVar149._16_4_ * 1.0000004;
  auVar25._20_4_ = auVar149._20_4_ * 1.0000004;
  auVar25._24_4_ = auVar149._24_4_ * 1.0000004;
  auVar25._28_4_ = auVar149._28_4_;
  auVar149 = vcmpps_avx(local_80,auVar25,2);
  auVar249 = vpshufd_avx(ZEXT116((byte)PVar18),0);
  auVar184._16_16_ = auVar249;
  auVar184._0_16_ = auVar249;
  auVar25 = vcvtdq2ps_avx(auVar184);
  auVar25 = vcmpps_avx(_DAT_02020f40,auVar25,1);
  auVar149 = vandps_avx(auVar149,auVar25);
  uVar138 = vmovmskps_avx(auVar149);
  local_89d = uVar138 != 0;
  if (local_89d) {
    uVar138 = uVar138 & 0xff;
    local_568 = pre->ray_space + k;
    local_560 = mm_lookupmask_ps._16_8_;
    uStack_558 = mm_lookupmask_ps._24_8_;
    uStack_550 = mm_lookupmask_ps._16_8_;
    uStack_548 = mm_lookupmask_ps._24_8_;
    local_678 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    auVar338 = ZEXT3264(auVar33);
    do {
      uVar145 = (ulong)uVar138;
      auVar149 = auVar338._0_32_;
      lVar142 = 0;
      if (uVar145 != 0) {
        for (; (uVar138 >> lVar142 & 1) == 0; lVar142 = lVar142 + 1) {
        }
      }
      uVar145 = uVar145 - 1 & uVar145;
      uVar138 = *(uint *)(prim + 2);
      local_7c8 = (ulong)uVar138;
      uVar19 = *(uint *)(prim + lVar142 * 4 + 6);
      pGVar21 = (context->scene->geometries).items[local_7c8].ptr;
      _Var22 = pGVar21[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      local_5b0._0_8_ = CONCAT44(0,uVar19);
      uVar143 = (ulong)*(uint *)(*(long *)&pGVar21->field_0x58 + _Var22 * CONCAT44(0,uVar19));
      p_Var23 = pGVar21[1].intersectionFilterN;
      lVar142 = *(long *)&pGVar21[1].time_range.upper;
      auVar249 = *(undefined1 (*) [16])(lVar142 + (long)p_Var23 * uVar143);
      local_710 = *(undefined1 (*) [16])(lVar142 + (uVar143 + 1) * (long)p_Var23);
      local_720 = *(undefined1 (*) [16])(lVar142 + (uVar143 + 2) * (long)p_Var23);
      uVar144 = 0;
      if (uVar145 != 0) {
        for (; (uVar145 >> uVar144 & 1) == 0; uVar144 = uVar144 + 1) {
        }
      }
      local_580 = *(undefined1 (*) [16])(lVar142 + (uVar143 + 3) * (long)p_Var23);
      if (uVar145 != 0) {
        uVar143 = uVar145 - 1 & uVar145;
        uVar144 = (ulong)*(uint *)(*(long *)&pGVar21->field_0x58 +
                                  *(uint *)(prim + uVar144 * 4 + 6) * _Var22) * (long)p_Var23;
        if ((uVar143 != 0) && (lVar142 = 0, uVar143 != 0)) {
          for (; (uVar143 >> lVar142 & 1) == 0; lVar142 = lVar142 + 1) {
          }
        }
      }
      uVar20 = (uint)pGVar21[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar195 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar10 = vinsertps_avx(auVar195,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar207 = vsubps_avx(auVar249,auVar10);
      auVar195 = vshufps_avx(auVar207,auVar207,0);
      auVar228 = vshufps_avx(auVar207,auVar207,0x55);
      auVar207 = vshufps_avx(auVar207,auVar207,0xaa);
      fVar244 = (local_568->vx).field_0.m128[0];
      fVar256 = (local_568->vx).field_0.m128[1];
      fVar258 = (local_568->vx).field_0.m128[2];
      fVar260 = (local_568->vx).field_0.m128[3];
      fVar262 = (local_568->vy).field_0.m128[0];
      fVar263 = (local_568->vy).field_0.m128[1];
      fVar264 = (local_568->vy).field_0.m128[2];
      fVar205 = (local_568->vy).field_0.m128[3];
      fVar216 = (local_568->vz).field_0.m128[0];
      fVar217 = (local_568->vz).field_0.m128[1];
      fVar218 = (local_568->vz).field_0.m128[2];
      fVar219 = (local_568->vz).field_0.m128[3];
      auVar177._0_8_ =
           CONCAT44(auVar195._4_4_ * fVar256 + auVar228._4_4_ * fVar263 + fVar217 * auVar207._4_4_,
                    auVar195._0_4_ * fVar244 + auVar228._0_4_ * fVar262 + fVar216 * auVar207._0_4_);
      auVar177._8_4_ =
           auVar195._8_4_ * fVar258 + auVar228._8_4_ * fVar264 + fVar218 * auVar207._8_4_;
      auVar177._12_4_ =
           auVar195._12_4_ * fVar260 + auVar228._12_4_ * fVar205 + fVar219 * auVar207._12_4_;
      auVar195 = vblendps_avx(auVar177,auVar249,8);
      auVar11 = vsubps_avx(local_710,auVar10);
      auVar228 = vshufps_avx(auVar11,auVar11,0);
      auVar207 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      auVar360._0_4_ = auVar228._0_4_ * fVar244 + auVar207._0_4_ * fVar262 + fVar216 * auVar11._0_4_
      ;
      auVar360._4_4_ = auVar228._4_4_ * fVar256 + auVar207._4_4_ * fVar263 + fVar217 * auVar11._4_4_
      ;
      auVar360._8_4_ = auVar228._8_4_ * fVar258 + auVar207._8_4_ * fVar264 + fVar218 * auVar11._8_4_
      ;
      auVar360._12_4_ =
           auVar228._12_4_ * fVar260 + auVar207._12_4_ * fVar205 + fVar219 * auVar11._12_4_;
      auVar228 = vblendps_avx(auVar360,local_710,8);
      auVar12 = vsubps_avx(local_720,auVar10);
      auVar207 = vshufps_avx(auVar12,auVar12,0);
      auVar11 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar248._0_4_ = auVar207._0_4_ * fVar244 + auVar11._0_4_ * fVar262 + fVar216 * auVar12._0_4_;
      auVar248._4_4_ = auVar207._4_4_ * fVar256 + auVar11._4_4_ * fVar263 + fVar217 * auVar12._4_4_;
      auVar248._8_4_ = auVar207._8_4_ * fVar258 + auVar11._8_4_ * fVar264 + fVar218 * auVar12._8_4_;
      auVar248._12_4_ =
           auVar207._12_4_ * fVar260 + auVar11._12_4_ * fVar205 + fVar219 * auVar12._12_4_;
      auVar12 = vshufps_avx(local_720,local_720,0xff);
      auVar207 = vblendps_avx(auVar248,local_720,8);
      auVar13 = vsubps_avx(local_580,auVar10);
      auVar10 = vshufps_avx(auVar13,auVar13,0);
      auVar11 = vshufps_avx(auVar13,auVar13,0x55);
      auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
      auVar301._0_4_ = auVar10._0_4_ * fVar244 + auVar11._0_4_ * fVar262 + fVar216 * auVar13._0_4_;
      auVar301._4_4_ = auVar10._4_4_ * fVar256 + auVar11._4_4_ * fVar263 + fVar217 * auVar13._4_4_;
      auVar301._8_4_ = auVar10._8_4_ * fVar258 + auVar11._8_4_ * fVar264 + fVar218 * auVar13._8_4_;
      auVar301._12_4_ =
           auVar10._12_4_ * fVar260 + auVar11._12_4_ * fVar205 + fVar219 * auVar13._12_4_;
      auVar13 = vshufps_avx(local_580,local_580,0xff);
      auVar10 = vblendps_avx(auVar301,local_580,8);
      auVar227._8_4_ = 0x7fffffff;
      auVar227._0_8_ = 0x7fffffff7fffffff;
      auVar227._12_4_ = 0x7fffffff;
      auVar195 = vandps_avx(auVar195,auVar227);
      auVar228 = vandps_avx(auVar228,auVar227);
      auVar11 = vmaxps_avx(auVar195,auVar228);
      auVar195 = vandps_avx(auVar207,auVar227);
      auVar228 = vandps_avx(auVar10,auVar227);
      auVar195 = vmaxps_avx(auVar195,auVar228);
      auVar195 = vmaxps_avx(auVar11,auVar195);
      auVar228 = vmovshdup_avx(auVar195);
      auVar228 = vmaxss_avx(auVar228,auVar195);
      auVar195 = vshufpd_avx(auVar195,auVar195,1);
      auVar195 = vmaxss_avx(auVar195,auVar228);
      lVar142 = (long)(int)uVar20 * 0x44;
      fVar256 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar142 + 0x908);
      fVar258 = *(float *)(bspline_basis0 + lVar142 + 0x90c);
      fVar260 = *(float *)(bspline_basis0 + lVar142 + 0x910);
      fVar263 = *(float *)(bspline_basis0 + lVar142 + 0x914);
      fVar264 = *(float *)(bspline_basis0 + lVar142 + 0x918);
      fVar205 = *(float *)(bspline_basis0 + lVar142 + 0x91c);
      fVar217 = *(float *)(bspline_basis0 + lVar142 + 0x920);
      auVar131 = *(undefined1 (*) [28])(bspline_basis0 + lVar142 + 0x908);
      local_620._0_16_ = auVar248;
      auVar228 = vshufps_avx(auVar248,auVar248,0);
      register0x00001450 = auVar228;
      _local_5a0 = auVar228;
      auVar207 = vshufps_avx(auVar248,auVar248,0x55);
      local_7c0._16_16_ = auVar207;
      local_7c0._0_16_ = auVar207;
      register0x000014d0 = auVar12;
      _local_120 = auVar12;
      fVar347 = *(float *)(bspline_basis0 + lVar142 + 0xd8c);
      fVar300 = *(float *)(bspline_basis0 + lVar142 + 0xd90);
      fVar222 = *(float *)(bspline_basis0 + lVar142 + 0xd94);
      fVar342 = *(float *)(bspline_basis0 + lVar142 + 0xd98);
      fVar306 = *(float *)(bspline_basis0 + lVar142 + 0xd9c);
      fVar307 = *(float *)(bspline_basis0 + lVar142 + 0xda0);
      fVar224 = *(float *)(bspline_basis0 + lVar142 + 0xda4);
      auVar10 = vshufps_avx(auVar301,auVar301,0);
      register0x00001490 = auVar10;
      _local_4e0 = auVar10;
      auVar11 = vshufps_avx(auVar301,auVar301,0x55);
      register0x000013d0 = auVar13;
      _local_160 = auVar13;
      fVar333 = auVar10._0_4_;
      fVar339 = auVar10._4_4_;
      fVar340 = auVar10._8_4_;
      fVar341 = auVar10._12_4_;
      fVar245 = auVar11._0_4_;
      fVar257 = auVar11._4_4_;
      fVar259 = auVar11._8_4_;
      fVar261 = auVar11._12_4_;
      fVar165 = auVar228._0_4_;
      fVar281 = auVar228._4_4_;
      fVar322 = auVar228._8_4_;
      fVar326 = auVar228._12_4_;
      fVar265 = auVar207._0_4_;
      fVar276 = auVar207._4_4_;
      fVar277 = auVar207._8_4_;
      fVar278 = auVar207._12_4_;
      fVar282 = auVar13._0_4_;
      fVar220 = auVar13._4_4_;
      fVar348 = auVar13._8_4_;
      fVar162 = auVar13._12_4_;
      fVar284 = auVar12._0_4_;
      fVar295 = auVar12._4_4_;
      fVar297 = auVar12._8_4_;
      auVar228 = vshufps_avx(auVar360,auVar360,0);
      register0x000014d0 = auVar228;
      _local_640 = auVar228;
      pauVar3 = (undefined1 (*) [32])(bspline_basis0 + lVar142 + 0x484);
      fVar218 = *(float *)*pauVar3;
      fVar219 = *(float *)(bspline_basis0 + lVar142 + 0x488);
      fVar223 = *(float *)(bspline_basis0 + lVar142 + 0x48c);
      fVar225 = *(float *)(bspline_basis0 + lVar142 + 0x490);
      fVar235 = *(float *)(bspline_basis0 + lVar142 + 0x494);
      fVar237 = *(float *)(bspline_basis0 + lVar142 + 0x498);
      fVar239 = *(float *)(bspline_basis0 + lVar142 + 0x49c);
      auVar132 = *(undefined1 (*) [28])*pauVar3;
      fVar241 = *(float *)(bspline_basis0 + lVar142 + 0x4a0);
      fVar294 = auVar228._0_4_;
      fVar296 = auVar228._4_4_;
      fVar298 = auVar228._8_4_;
      fVar299 = auVar228._12_4_;
      auVar228 = vshufps_avx(auVar360,auVar360,0x55);
      fVar226 = auVar228._0_4_;
      fVar236 = auVar228._4_4_;
      fVar238 = auVar228._8_4_;
      fVar240 = auVar228._12_4_;
      auVar228 = vshufps_avx(local_710,local_710,0xff);
      register0x00001590 = auVar228;
      _local_a0 = auVar228;
      fVar329 = auVar228._0_4_;
      fVar330 = auVar228._4_4_;
      fVar331 = auVar228._8_4_;
      fVar375 = auVar228._12_4_;
      fVar243 = *(float *)(bspline_basis0 + lVar142 + 0x924) + 0.0 + 0.0;
      auVar119._8_4_ = auVar177._8_4_;
      auVar119._0_8_ = auVar177._0_8_;
      auVar119._12_4_ = auVar177._12_4_;
      auVar228 = vshufps_avx(auVar119,auVar119,0);
      register0x00001550 = auVar228;
      _local_c0 = auVar228;
      local_3a0 = *(float *)(bspline_basis0 + lVar142);
      fStack_39c = *(float *)(bspline_basis0 + lVar142 + 4);
      fStack_398 = *(float *)(bspline_basis0 + lVar142 + 8);
      fStack_394 = *(float *)(bspline_basis0 + lVar142 + 0xc);
      fStack_390 = *(float *)(bspline_basis0 + lVar142 + 0x10);
      fStack_38c = *(float *)(bspline_basis0 + lVar142 + 0x14);
      fStack_388 = *(float *)(bspline_basis0 + lVar142 + 0x18);
      fStack_384 = *(float *)(bspline_basis0 + lVar142 + 0x1c);
      fVar313 = auVar228._0_4_;
      fVar321 = auVar228._4_4_;
      fVar325 = auVar228._8_4_;
      fVar328 = auVar228._12_4_;
      auVar351._0_4_ =
           fVar313 * local_3a0 + fVar294 * fVar218 + fVar165 * fVar256 + fVar333 * fVar347;
      auVar351._4_4_ =
           fVar321 * fStack_39c + fVar296 * fVar219 + fVar281 * fVar258 + fVar339 * fVar300;
      auVar351._8_4_ =
           fVar325 * fStack_398 + fVar298 * fVar223 + fVar322 * fVar260 + fVar340 * fVar222;
      auVar351._12_4_ =
           fVar328 * fStack_394 + fVar299 * fVar225 + fVar326 * fVar263 + fVar341 * fVar342;
      auVar351._16_4_ =
           fVar313 * fStack_390 + fVar294 * fVar235 + fVar165 * fVar264 + fVar333 * fVar306;
      auVar351._20_4_ =
           fVar321 * fStack_38c + fVar296 * fVar237 + fVar281 * fVar205 + fVar339 * fVar307;
      auVar351._24_4_ =
           fVar325 * fStack_388 + fVar298 * fVar239 + fVar322 * fVar217 + fVar340 * fVar224;
      auVar351._28_4_ = fVar241 + 0.0;
      auVar228 = vshufps_avx(auVar119,auVar119,0x55);
      register0x00001210 = auVar228;
      _local_140 = auVar228;
      fVar244 = auVar228._0_4_;
      fVar262 = auVar228._4_4_;
      fVar216 = auVar228._8_4_;
      fVar221 = auVar228._12_4_;
      auVar304._0_4_ =
           local_3a0 * fVar244 + fVar226 * fVar218 + fVar265 * fVar256 + fVar245 * fVar347;
      auVar304._4_4_ =
           fStack_39c * fVar262 + fVar236 * fVar219 + fVar276 * fVar258 + fVar257 * fVar300;
      auVar304._8_4_ =
           fStack_398 * fVar216 + fVar238 * fVar223 + fVar277 * fVar260 + fVar259 * fVar222;
      auVar304._12_4_ =
           fStack_394 * fVar221 + fVar240 * fVar225 + fVar278 * fVar263 + fVar261 * fVar342;
      auVar304._16_4_ =
           fStack_390 * fVar244 + fVar226 * fVar235 + fVar265 * fVar264 + fVar245 * fVar306;
      auVar304._20_4_ =
           fStack_38c * fVar262 + fVar236 * fVar237 + fVar276 * fVar205 + fVar257 * fVar307;
      auVar304._24_4_ =
           fStack_388 * fVar216 + fVar238 * fVar239 + fVar277 * fVar217 + fVar259 * fVar224;
      auVar304._28_4_ = 0;
      auVar228 = vpermilps_avx(auVar249,0xff);
      register0x00001450 = auVar228;
      _local_180 = auVar228;
      fVar167 = auVar228._0_4_;
      fVar319 = auVar228._4_4_;
      fVar323 = auVar228._8_4_;
      local_840._0_4_ =
           fVar167 * local_3a0 + fVar329 * fVar218 + fVar284 * fVar256 + fVar282 * fVar347;
      local_840._4_4_ =
           fVar319 * fStack_39c + fVar330 * fVar219 + fVar295 * fVar258 + fVar220 * fVar300;
      fStack_838 = fVar323 * fStack_398 + fVar331 * fVar223 + fVar297 * fVar260 + fVar348 * fVar222;
      fStack_834 = auVar228._12_4_ * fStack_394 +
                   fVar375 * fVar225 + auVar12._12_4_ * fVar263 + fVar162 * fVar342;
      fStack_830 = fVar167 * fStack_390 + fVar329 * fVar235 + fVar284 * fVar264 + fVar282 * fVar306;
      fStack_82c = fVar319 * fStack_38c + fVar330 * fVar237 + fVar295 * fVar205 + fVar220 * fVar307;
      fStack_828 = fVar323 * fStack_388 + fVar331 * fVar239 + fVar297 * fVar217 + fVar348 * fVar224;
      fStack_824 = fVar243 + 0.0;
      fVar308 = *(float *)(bspline_basis1 + lVar142 + 0x908);
      fVar343 = *(float *)(bspline_basis1 + lVar142 + 0x90c);
      fVar160 = *(float *)(bspline_basis1 + lVar142 + 0x910);
      fVar163 = *(float *)(bspline_basis1 + lVar142 + 0x914);
      fVar190 = *(float *)(bspline_basis1 + lVar142 + 0x918);
      fVar168 = *(float *)(bspline_basis1 + lVar142 + 0x91c);
      fVar170 = *(float *)(bspline_basis1 + lVar142 + 0x920);
      fVar172 = *(float *)(bspline_basis1 + lVar142 + 0xd8c);
      fVar146 = *(float *)(bspline_basis1 + lVar142 + 0xd90);
      fVar161 = *(float *)(bspline_basis1 + lVar142 + 0xd94);
      fVar164 = *(float *)(bspline_basis1 + lVar142 + 0xd98);
      fVar166 = *(float *)(bspline_basis1 + lVar142 + 0xd9c);
      fVar169 = *(float *)(bspline_basis1 + lVar142 + 0xda0);
      fVar171 = *(float *)(bspline_basis1 + lVar142 + 0xda4);
      auVar25 = *(undefined1 (*) [32])(bspline_basis1 + lVar142 + 0x484);
      auVar275 = ZEXT3264(auVar25);
      fVar256 = auVar25._0_4_;
      fVar263 = auVar25._4_4_;
      fVar217 = auVar25._8_4_;
      fVar223 = auVar25._12_4_;
      fVar237 = auVar25._16_4_;
      fVar242 = auVar25._20_4_;
      fVar346 = auVar25._24_4_;
      fVar260 = fVar328 + fVar243 + 0.0;
      fVar173 = *(float *)(bspline_basis1 + lVar142);
      fVar174 = *(float *)(bspline_basis1 + lVar142 + 4);
      fVar204 = *(float *)(bspline_basis1 + lVar142 + 8);
      fVar280 = *(float *)(bspline_basis1 + lVar142 + 0xc);
      fVar309 = *(float *)(bspline_basis1 + lVar142 + 0x10);
      fVar310 = *(float *)(bspline_basis1 + lVar142 + 0x14);
      fVar311 = *(float *)(bspline_basis1 + lVar142 + 0x18);
      auVar230._0_4_ = fVar313 * fVar173 + fVar294 * fVar256 + fVar308 * fVar165 + fVar333 * fVar172
      ;
      auVar230._4_4_ = fVar321 * fVar174 + fVar296 * fVar263 + fVar343 * fVar281 + fVar339 * fVar146
      ;
      auVar230._8_4_ = fVar325 * fVar204 + fVar298 * fVar217 + fVar160 * fVar322 + fVar340 * fVar161
      ;
      auVar230._12_4_ =
           fVar328 * fVar280 + fVar299 * fVar223 + fVar163 * fVar326 + fVar341 * fVar164;
      auVar230._16_4_ =
           fVar313 * fVar309 + fVar294 * fVar237 + fVar190 * fVar165 + fVar333 * fVar166;
      auVar230._20_4_ =
           fVar321 * fVar310 + fVar296 * fVar242 + fVar168 * fVar281 + fVar339 * fVar169;
      auVar230._24_4_ =
           fVar325 * fVar311 + fVar298 * fVar346 + fVar170 * fVar322 + fVar340 * fVar171;
      auVar230._28_4_ = fVar375 + fVar260;
      auVar210._0_4_ = fVar244 * fVar173 + fVar226 * fVar256 + fVar308 * fVar265 + fVar172 * fVar245
      ;
      auVar210._4_4_ = fVar262 * fVar174 + fVar236 * fVar263 + fVar343 * fVar276 + fVar146 * fVar257
      ;
      auVar210._8_4_ = fVar216 * fVar204 + fVar238 * fVar217 + fVar160 * fVar277 + fVar161 * fVar259
      ;
      auVar210._12_4_ =
           fVar221 * fVar280 + fVar240 * fVar223 + fVar163 * fVar278 + fVar164 * fVar261;
      auVar210._16_4_ =
           fVar244 * fVar309 + fVar226 * fVar237 + fVar190 * fVar265 + fVar166 * fVar245;
      auVar210._20_4_ =
           fVar262 * fVar310 + fVar236 * fVar242 + fVar168 * fVar276 + fVar169 * fVar257;
      auVar210._24_4_ =
           fVar216 * fVar311 + fVar238 * fVar346 + fVar170 * fVar277 + fVar171 * fVar259;
      auVar210._28_4_ = fVar260 + fVar328 + fVar241 + 0.0;
      local_760._0_4_ =
           fVar329 * fVar256 + fVar308 * fVar284 + fVar172 * fVar282 + fVar167 * fVar173;
      local_760._4_4_ =
           fVar330 * fVar263 + fVar343 * fVar295 + fVar146 * fVar220 + fVar319 * fVar174;
      local_760._8_4_ =
           fVar331 * fVar217 + fVar160 * fVar297 + fVar161 * fVar348 + fVar323 * fVar204;
      local_760._12_4_ =
           fVar375 * fVar223 + fVar163 * auVar12._12_4_ + fVar164 * fVar162 +
           auVar228._12_4_ * fVar280;
      local_760._16_4_ =
           fVar329 * fVar237 + fVar190 * fVar284 + fVar166 * fVar282 + fVar167 * fVar309;
      local_760._20_4_ =
           fVar330 * fVar242 + fVar168 * fVar295 + fVar169 * fVar220 + fVar319 * fVar310;
      local_760._24_4_ =
           fVar331 * fVar346 + fVar170 * fVar297 + fVar171 * fVar348 + fVar323 * fVar311;
      local_760._28_4_ = fVar328 + fVar162 + fVar241 + fVar260;
      auVar28 = vsubps_avx(auVar230,auVar351);
      auVar29 = vsubps_avx(auVar210,auVar304);
      auStack_530 = auVar29._16_16_;
      fVar258 = auVar28._0_4_;
      fVar264 = auVar28._4_4_;
      auVar35._4_4_ = auVar304._4_4_ * fVar264;
      auVar35._0_4_ = auVar304._0_4_ * fVar258;
      fVar218 = auVar28._8_4_;
      auVar35._8_4_ = auVar304._8_4_ * fVar218;
      fVar225 = auVar28._12_4_;
      auVar35._12_4_ = auVar304._12_4_ * fVar225;
      fVar239 = auVar28._16_4_;
      auVar35._16_4_ = auVar304._16_4_ * fVar239;
      fVar243 = auVar28._20_4_;
      auVar35._20_4_ = auVar304._20_4_ * fVar243;
      fVar220 = auVar28._24_4_;
      auVar35._24_4_ = auVar304._24_4_ * fVar220;
      auVar35._28_4_ = fVar260;
      fVar260 = auVar29._0_4_;
      fVar205 = auVar29._4_4_;
      auVar36._4_4_ = auVar351._4_4_ * fVar205;
      auVar36._0_4_ = auVar351._0_4_ * fVar260;
      fVar219 = auVar29._8_4_;
      auVar36._8_4_ = auVar351._8_4_ * fVar219;
      fVar235 = auVar29._12_4_;
      auVar36._12_4_ = auVar351._12_4_ * fVar235;
      fVar241 = auVar29._16_4_;
      auVar36._16_4_ = auVar351._16_4_ * fVar241;
      fVar282 = auVar29._20_4_;
      auVar36._20_4_ = auVar351._20_4_ * fVar282;
      fVar348 = auVar29._24_4_;
      auVar36._24_4_ = auVar351._24_4_ * fVar348;
      auVar36._28_4_ = auVar210._28_4_;
      auVar27 = vsubps_avx(auVar35,auVar36);
      auVar26 = vmaxps_avx(_local_840,local_760);
      auVar37._4_4_ = auVar26._4_4_ * auVar26._4_4_ * (fVar264 * fVar264 + fVar205 * fVar205);
      auVar37._0_4_ = auVar26._0_4_ * auVar26._0_4_ * (fVar258 * fVar258 + fVar260 * fVar260);
      auVar37._8_4_ = auVar26._8_4_ * auVar26._8_4_ * (fVar218 * fVar218 + fVar219 * fVar219);
      auVar37._12_4_ = auVar26._12_4_ * auVar26._12_4_ * (fVar225 * fVar225 + fVar235 * fVar235);
      auVar37._16_4_ = auVar26._16_4_ * auVar26._16_4_ * (fVar239 * fVar239 + fVar241 * fVar241);
      auVar37._20_4_ = auVar26._20_4_ * auVar26._20_4_ * (fVar243 * fVar243 + fVar282 * fVar282);
      auVar37._24_4_ = auVar26._24_4_ * auVar26._24_4_ * (fVar220 * fVar220 + fVar348 * fVar348);
      auVar37._28_4_ = auVar28._28_4_ + auVar210._28_4_;
      auVar38._4_4_ = auVar27._4_4_ * auVar27._4_4_;
      auVar38._0_4_ = auVar27._0_4_ * auVar27._0_4_;
      auVar38._8_4_ = auVar27._8_4_ * auVar27._8_4_;
      auVar38._12_4_ = auVar27._12_4_ * auVar27._12_4_;
      auVar38._16_4_ = auVar27._16_4_ * auVar27._16_4_;
      auVar38._20_4_ = auVar27._20_4_ * auVar27._20_4_;
      auVar38._24_4_ = auVar27._24_4_ * auVar27._24_4_;
      auVar38._28_4_ = auVar27._28_4_;
      auVar26 = vcmpps_avx(auVar38,auVar37,2);
      local_500 = (float)(int)uVar20;
      fStack_4fc = 0.0;
      fStack_4f8 = 0.0;
      fStack_4f4 = 0.0;
      auVar228 = vshufps_avx(ZEXT416((uint)local_500),ZEXT416((uint)local_500),0);
      auVar211._16_16_ = auVar228;
      auVar211._0_16_ = auVar228;
      auVar27 = vcmpps_avx(_DAT_02020f40,auVar211,1);
      auVar120._8_4_ = auVar177._8_4_;
      auVar120._0_8_ = auVar177._0_8_;
      auVar120._12_4_ = auVar177._12_4_;
      auVar228 = vpermilps_avx(auVar120,0xaa);
      register0x00001450 = auVar228;
      _local_1a0 = auVar228;
      auVar207 = vpermilps_avx(auVar360,0xaa);
      register0x00001550 = auVar207;
      _local_520 = auVar207;
      auVar10 = vpermilps_avx(auVar248,0xaa);
      register0x00001590 = auVar10;
      _local_e0 = auVar10;
      auVar11 = vpermilps_avx(auVar301,0xaa);
      register0x00001510 = auVar11;
      _local_600 = auVar11;
      auVar30 = auVar27 & auVar26;
      uVar9 = *(uint *)(ray + k * 4 + 0x30);
      auVar195 = ZEXT416((uint)(auVar195._0_4_ * 4.7683716e-07));
      local_7f0._0_4_ = auVar249._0_4_;
      fVar258 = (float)local_7f0;
      local_7f0._4_4_ = auVar249._4_4_;
      fVar260 = local_7f0._4_4_;
      uStack_7e8._0_4_ = auVar249._8_4_;
      fVar264 = (float)uStack_7e8;
      uStack_7e8._4_4_ = auVar249._12_4_;
      fVar205 = uStack_7e8._4_4_;
      local_7f0 = auVar249._0_8_;
      uStack_7e8 = auVar249._8_8_;
      if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar30 >> 0x7f,0) == '\0') &&
            (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar30 >> 0xbf,0) == '\0') &&
          (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar30[0x1f])
      {
        uVar144 = 0;
        auVar215 = ZEXT3264(auVar149);
        auVar338 = ZEXT3264(local_7c0);
        auVar372 = ZEXT3264(_local_640);
      }
      else {
        local_3c0 = vandps_avx(auVar26,auVar27);
        fVar312 = auVar228._0_4_;
        fVar320 = auVar228._4_4_;
        fVar324 = auVar228._8_4_;
        fVar327 = auVar228._12_4_;
        fVar359 = auVar207._0_4_;
        fVar366 = auVar207._4_4_;
        fVar367 = auVar207._8_4_;
        fVar368 = auVar207._12_4_;
        fVar369 = auVar10._0_4_;
        fVar373 = auVar10._4_4_;
        fVar374 = auVar10._8_4_;
        fVar376 = auVar10._12_4_;
        fVar349 = auVar11._0_4_;
        fVar356 = auVar11._4_4_;
        fVar357 = auVar11._8_4_;
        fVar358 = auVar11._12_4_;
        local_3e0._0_4_ =
             fVar312 * fVar173 + fVar359 * fVar256 + fVar369 * fVar308 + fVar349 * fVar172;
        local_3e0._4_4_ =
             fVar320 * fVar174 + fVar366 * fVar263 + fVar373 * fVar343 + fVar356 * fVar146;
        fStack_3d8 = fVar324 * fVar204 + fVar367 * fVar217 + fVar374 * fVar160 + fVar357 * fVar161;
        fStack_3d4 = fVar327 * fVar280 + fVar368 * fVar223 + fVar376 * fVar163 + fVar358 * fVar164;
        fStack_3d0 = fVar312 * fVar309 + fVar359 * fVar237 + fVar369 * fVar190 + fVar349 * fVar166;
        fStack_3cc = fVar320 * fVar310 + fVar366 * fVar242 + fVar373 * fVar168 + fVar356 * fVar169;
        fStack_3c8 = fVar324 * fVar311 + fVar367 * fVar346 + fVar374 * fVar170 + fVar357 * fVar171;
        fStack_3c4 = local_3c0._28_4_ +
                     auVar27._28_4_ + *(float *)(bspline_basis1 + lVar142 + 0x924) + 0.0;
        local_380._0_4_ = auVar132._0_4_;
        local_380._4_4_ = auVar132._4_4_;
        fStack_378 = auVar132._8_4_;
        fStack_374 = auVar132._12_4_;
        fStack_370 = auVar132._16_4_;
        fStack_36c = auVar132._20_4_;
        fStack_368 = auVar132._24_4_;
        local_700._0_4_ = auVar131._0_4_;
        local_700._4_4_ = auVar131._4_4_;
        fStack_6f8 = auVar131._8_4_;
        fStack_6f4 = auVar131._12_4_;
        auStack_6f0._0_4_ = auVar131._16_4_;
        auStack_6f0._4_4_ = auVar131._20_4_;
        fStack_6e8 = auVar131._24_4_;
        local_700._0_4_ =
             fVar312 * local_3a0 +
             fVar359 * (float)local_380._0_4_ + fVar369 * (float)local_700._0_4_ + fVar349 * fVar347
        ;
        local_700._4_4_ =
             fVar320 * fStack_39c +
             fVar366 * (float)local_380._4_4_ + fVar373 * (float)local_700._4_4_ + fVar356 * fVar300
        ;
        fStack_6f8 = fVar324 * fStack_398 +
                     fVar367 * fStack_378 + fVar374 * fStack_6f8 + fVar357 * fVar222;
        fStack_6f4 = fVar327 * fStack_394 +
                     fVar368 * fStack_374 + fVar376 * fStack_6f4 + fVar358 * fVar342;
        auStack_6f0._0_4_ =
             fVar312 * fStack_390 +
             fVar359 * fStack_370 + fVar369 * (float)auStack_6f0._0_4_ + fVar349 * fVar306;
        auStack_6f0._4_4_ =
             fVar320 * fStack_38c +
             fVar366 * fStack_36c + fVar373 * (float)auStack_6f0._4_4_ + fVar356 * fVar307;
        fStack_6e8 = fVar324 * fStack_388 +
                     fVar367 * fStack_368 + fVar374 * fStack_6e8 + fVar357 * fVar224;
        fStack_6e4 = fStack_3c4 + local_3c0._28_4_ + auVar27._28_4_ + 0.0;
        fVar256 = *(float *)(bspline_basis0 + lVar142 + 0x1210);
        fVar263 = *(float *)(bspline_basis0 + lVar142 + 0x1214);
        fVar217 = *(float *)(bspline_basis0 + lVar142 + 0x1218);
        fVar218 = *(float *)(bspline_basis0 + lVar142 + 0x121c);
        fVar219 = *(float *)(bspline_basis0 + lVar142 + 0x1220);
        fVar223 = *(float *)(bspline_basis0 + lVar142 + 0x1224);
        fVar225 = *(float *)(bspline_basis0 + lVar142 + 0x1228);
        fVar235 = *(float *)(bspline_basis0 + lVar142 + 0x1694);
        fVar237 = *(float *)(bspline_basis0 + lVar142 + 0x1698);
        fVar239 = *(float *)(bspline_basis0 + lVar142 + 0x169c);
        fVar241 = *(float *)(bspline_basis0 + lVar142 + 0x16a0);
        fVar242 = *(float *)(bspline_basis0 + lVar142 + 0x16a4);
        fVar243 = *(float *)(bspline_basis0 + lVar142 + 0x16a8);
        fVar282 = *(float *)(bspline_basis0 + lVar142 + 0x16ac);
        fVar346 = *(float *)(bspline_basis0 + lVar142 + 0x1b18);
        fVar220 = *(float *)(bspline_basis0 + lVar142 + 0x1b1c);
        fVar348 = *(float *)(bspline_basis0 + lVar142 + 0x1b20);
        fVar347 = *(float *)(bspline_basis0 + lVar142 + 0x1b24);
        fVar300 = *(float *)(bspline_basis0 + lVar142 + 0x1b28);
        fVar222 = *(float *)(bspline_basis0 + lVar142 + 0x1b2c);
        fVar342 = *(float *)(bspline_basis0 + lVar142 + 0x1b30);
        fVar306 = *(float *)(bspline_basis0 + lVar142 + 0x1f9c);
        fVar307 = *(float *)(bspline_basis0 + lVar142 + 0x1fa0);
        fVar224 = *(float *)(bspline_basis0 + lVar142 + 0x1fa4);
        fVar308 = *(float *)(bspline_basis0 + lVar142 + 0x1fa8);
        fVar343 = *(float *)(bspline_basis0 + lVar142 + 0x1fac);
        fVar160 = *(float *)(bspline_basis0 + lVar142 + 0x1fb0);
        fVar163 = *(float *)(bspline_basis0 + lVar142 + 0x1fb4);
        local_620._0_16_ = auVar195;
        fVar279 = fVar327 + auVar25._28_4_;
        fVar190 = *(float *)(bspline_basis0 + lVar142 + 0x1b34) +
                  *(float *)(bspline_basis0 + lVar142 + 0x1fb8);
        fVar332 = *(float *)(bspline_basis0 + lVar142 + 0x16b0) + fVar190;
        auVar185._0_4_ =
             fVar244 * fVar256 + fVar265 * fVar346 + fVar245 * fVar306 + fVar226 * fVar235;
        auVar185._4_4_ =
             fVar262 * fVar263 + fVar276 * fVar220 + fVar257 * fVar307 + fVar236 * fVar237;
        auVar185._8_4_ =
             fVar216 * fVar217 + fVar277 * fVar348 + fVar259 * fVar224 + fVar238 * fVar239;
        auVar185._12_4_ =
             fVar221 * fVar218 + fVar278 * fVar347 + fVar261 * fVar308 + fVar240 * fVar241;
        auVar185._16_4_ =
             fVar244 * fVar219 + fVar265 * fVar300 + fVar245 * fVar343 + fVar226 * fVar242;
        auVar185._20_4_ =
             fVar262 * fVar223 + fVar276 * fVar222 + fVar257 * fVar160 + fVar236 * fVar243;
        auVar185._24_4_ =
             fVar216 * fVar225 + fVar277 * fVar342 + fVar259 * fVar163 + fVar238 * fVar282;
        auVar185._28_4_ = fVar190 + fVar327 + *(float *)(bspline_basis1 + lVar142 + 0x1c) + fVar279;
        auVar270._0_4_ =
             fVar359 * fVar235 + fVar369 * fVar346 + fVar349 * fVar306 + fVar312 * fVar256;
        auVar270._4_4_ =
             fVar366 * fVar237 + fVar373 * fVar220 + fVar356 * fVar307 + fVar320 * fVar263;
        auVar270._8_4_ =
             fVar367 * fVar239 + fVar374 * fVar348 + fVar357 * fVar224 + fVar324 * fVar217;
        auVar270._12_4_ =
             fVar368 * fVar241 + fVar376 * fVar347 + fVar358 * fVar308 + fVar327 * fVar218;
        auVar270._16_4_ =
             fVar359 * fVar242 + fVar369 * fVar300 + fVar349 * fVar343 + fVar312 * fVar219;
        auVar270._20_4_ =
             fVar366 * fVar243 + fVar373 * fVar222 + fVar356 * fVar160 + fVar320 * fVar223;
        auVar270._24_4_ =
             fVar367 * fVar282 + fVar374 * fVar342 + fVar357 * fVar163 + fVar324 * fVar225;
        auVar270._28_4_ = fVar332 + *(float *)(bspline_basis0 + lVar142 + 0x122c);
        fVar190 = *(float *)(bspline_basis1 + lVar142 + 0x1b18);
        fVar168 = *(float *)(bspline_basis1 + lVar142 + 0x1b1c);
        fVar170 = *(float *)(bspline_basis1 + lVar142 + 0x1b20);
        fVar172 = *(float *)(bspline_basis1 + lVar142 + 0x1b24);
        fVar146 = *(float *)(bspline_basis1 + lVar142 + 0x1b28);
        fVar161 = *(float *)(bspline_basis1 + lVar142 + 0x1b2c);
        fVar164 = *(float *)(bspline_basis1 + lVar142 + 0x1b30);
        fVar166 = *(float *)(bspline_basis1 + lVar142 + 0x1f9c);
        fVar169 = *(float *)(bspline_basis1 + lVar142 + 0x1fa0);
        fVar171 = *(float *)(bspline_basis1 + lVar142 + 0x1fa4);
        fVar173 = *(float *)(bspline_basis1 + lVar142 + 0x1fa8);
        fVar174 = *(float *)(bspline_basis1 + lVar142 + 0x1fac);
        fVar204 = *(float *)(bspline_basis1 + lVar142 + 0x1fb0);
        fVar280 = *(float *)(bspline_basis1 + lVar142 + 0x1fb4);
        fVar309 = *(float *)(bspline_basis1 + lVar142 + 0x1694);
        fVar310 = *(float *)(bspline_basis1 + lVar142 + 0x1698);
        fVar311 = *(float *)(bspline_basis1 + lVar142 + 0x169c);
        fVar162 = *(float *)(bspline_basis1 + lVar142 + 0x16a0);
        fVar167 = *(float *)(bspline_basis1 + lVar142 + 0x16a4);
        fVar319 = *(float *)(bspline_basis1 + lVar142 + 0x16a8);
        fVar323 = *(float *)(bspline_basis1 + lVar142 + 0x16ac);
        fVar284 = *(float *)(bspline_basis1 + lVar142 + 0x1210);
        fVar295 = *(float *)(bspline_basis1 + lVar142 + 0x1214);
        fVar297 = *(float *)(bspline_basis1 + lVar142 + 0x1218);
        fVar329 = *(float *)(bspline_basis1 + lVar142 + 0x121c);
        fVar330 = *(float *)(bspline_basis1 + lVar142 + 0x1220);
        fVar331 = *(float *)(bspline_basis1 + lVar142 + 0x1224);
        fVar375 = *(float *)(bspline_basis1 + lVar142 + 0x1228);
        auVar291._0_4_ =
             fVar313 * fVar284 + fVar294 * fVar309 + fVar165 * fVar190 + fVar333 * fVar166;
        auVar291._4_4_ =
             fVar321 * fVar295 + fVar296 * fVar310 + fVar281 * fVar168 + fVar339 * fVar169;
        auVar291._8_4_ =
             fVar325 * fVar297 + fVar298 * fVar311 + fVar322 * fVar170 + fVar340 * fVar171;
        auVar291._12_4_ =
             fVar328 * fVar329 + fVar299 * fVar162 + fVar326 * fVar172 + fVar341 * fVar173;
        auVar291._16_4_ =
             fVar313 * fVar330 + fVar294 * fVar167 + fVar165 * fVar146 + fVar333 * fVar174;
        auVar291._20_4_ =
             fVar321 * fVar331 + fVar296 * fVar319 + fVar281 * fVar161 + fVar339 * fVar204;
        auVar291._24_4_ =
             fVar325 * fVar375 + fVar298 * fVar323 + fVar322 * fVar164 + fVar340 * fVar280;
        auVar291._28_4_ = fVar278 + fVar278 + fVar332 + fVar341;
        auVar315._0_4_ =
             fVar244 * fVar284 + fVar226 * fVar309 + fVar265 * fVar190 + fVar245 * fVar166;
        auVar315._4_4_ =
             fVar262 * fVar295 + fVar236 * fVar310 + fVar276 * fVar168 + fVar257 * fVar169;
        auVar315._8_4_ =
             fVar216 * fVar297 + fVar238 * fVar311 + fVar277 * fVar170 + fVar259 * fVar171;
        auVar315._12_4_ =
             fVar221 * fVar329 + fVar240 * fVar162 + fVar278 * fVar172 + fVar261 * fVar173;
        auVar315._16_4_ =
             fVar244 * fVar330 + fVar226 * fVar167 + fVar265 * fVar146 + fVar245 * fVar174;
        auVar315._20_4_ =
             fVar262 * fVar331 + fVar236 * fVar319 + fVar276 * fVar161 + fVar257 * fVar204;
        auVar315._24_4_ =
             fVar216 * fVar375 + fVar238 * fVar323 + fVar277 * fVar164 + fVar259 * fVar280;
        auVar315._28_4_ = fVar278 + fVar278 + fVar278 + fVar332;
        auVar202._0_4_ =
             fVar312 * fVar284 + fVar359 * fVar309 + fVar369 * fVar190 + fVar166 * fVar349;
        auVar202._4_4_ =
             fVar320 * fVar295 + fVar366 * fVar310 + fVar373 * fVar168 + fVar169 * fVar356;
        auVar202._8_4_ =
             fVar324 * fVar297 + fVar367 * fVar311 + fVar374 * fVar170 + fVar171 * fVar357;
        auVar202._12_4_ =
             fVar327 * fVar329 + fVar368 * fVar162 + fVar376 * fVar172 + fVar173 * fVar358;
        auVar202._16_4_ =
             fVar312 * fVar330 + fVar359 * fVar167 + fVar369 * fVar146 + fVar174 * fVar349;
        auVar202._20_4_ =
             fVar320 * fVar331 + fVar366 * fVar319 + fVar373 * fVar161 + fVar204 * fVar356;
        auVar202._24_4_ =
             fVar324 * fVar375 + fVar367 * fVar323 + fVar374 * fVar164 + fVar280 * fVar357;
        auVar202._28_4_ =
             *(float *)(bspline_basis1 + lVar142 + 0x122c) +
             *(float *)(bspline_basis1 + lVar142 + 0x16b0) +
             *(float *)(bspline_basis1 + lVar142 + 0x1b34) +
             *(float *)(bspline_basis1 + lVar142 + 0x1fb8);
        auVar231._8_4_ = 0x7fffffff;
        auVar231._0_8_ = 0x7fffffff7fffffff;
        auVar231._12_4_ = 0x7fffffff;
        auVar231._16_4_ = 0x7fffffff;
        auVar231._20_4_ = 0x7fffffff;
        auVar231._24_4_ = 0x7fffffff;
        auVar231._28_4_ = 0x7fffffff;
        auVar126._4_4_ =
             fVar321 * fVar263 + fVar296 * fVar237 + fVar281 * fVar220 + fVar339 * fVar307;
        auVar126._0_4_ =
             fVar313 * fVar256 + fVar294 * fVar235 + fVar165 * fVar346 + fVar333 * fVar306;
        auVar126._8_4_ =
             fVar325 * fVar217 + fVar298 * fVar239 + fVar322 * fVar348 + fVar340 * fVar224;
        auVar126._12_4_ =
             fVar328 * fVar218 + fVar299 * fVar241 + fVar326 * fVar347 + fVar341 * fVar308;
        auVar126._16_4_ =
             fVar313 * fVar219 + fVar294 * fVar242 + fVar165 * fVar300 + fVar333 * fVar343;
        auVar126._20_4_ =
             fVar321 * fVar223 + fVar296 * fVar243 + fVar281 * fVar222 + fVar339 * fVar160;
        auVar126._24_4_ =
             fVar325 * fVar225 + fVar298 * fVar282 + fVar322 * fVar342 + fVar340 * fVar163;
        auVar126._28_4_ =
             *(float *)(bspline_basis0 + lVar142 + 0x16b0) +
             *(float *)(bspline_basis0 + lVar142 + 0x1fb8) + fVar279;
        auVar25 = vandps_avx(auVar126,auVar231);
        auVar26 = vandps_avx(auVar185,auVar231);
        auVar26 = vmaxps_avx(auVar25,auVar26);
        auVar25 = vandps_avx(auVar270,auVar231);
        auVar25 = vmaxps_avx(auVar26,auVar25);
        auVar249 = vpermilps_avx(auVar195,0);
        auVar271._16_16_ = auVar249;
        auVar271._0_16_ = auVar249;
        auVar25 = vcmpps_avx(auVar25,auVar271,1);
        auVar27 = vblendvps_avx(auVar126,auVar28,auVar25);
        auVar30 = vblendvps_avx(auVar185,auVar29,auVar25);
        auVar25 = vandps_avx(auVar291,auVar231);
        auVar26 = vandps_avx(auVar315,auVar231);
        auVar31 = vmaxps_avx(auVar25,auVar26);
        auVar25 = vandps_avx(auVar202,auVar231);
        auVar25 = vmaxps_avx(auVar31,auVar25);
        auVar31 = vcmpps_avx(auVar25,auVar271,1);
        auVar25 = vblendvps_avx(auVar291,auVar28,auVar31);
        auVar28 = vblendvps_avx(auVar315,auVar29,auVar31);
        fVar343 = auVar27._0_4_;
        fVar160 = auVar27._4_4_;
        fVar163 = auVar27._8_4_;
        fVar190 = auVar27._12_4_;
        fVar168 = auVar27._16_4_;
        fVar170 = auVar27._20_4_;
        fVar172 = auVar27._24_4_;
        fVar146 = auVar25._0_4_;
        fVar161 = auVar25._4_4_;
        fVar164 = auVar25._8_4_;
        fVar166 = auVar25._12_4_;
        fVar169 = auVar25._16_4_;
        fVar171 = auVar25._20_4_;
        fVar173 = auVar25._24_4_;
        fStack_784 = -auVar25._28_4_;
        fVar244 = auVar30._0_4_;
        fVar216 = auVar30._4_4_;
        fVar221 = auVar30._8_4_;
        fVar237 = auVar30._12_4_;
        fVar243 = auVar30._16_4_;
        fVar348 = auVar30._20_4_;
        fVar342 = auVar30._24_4_;
        auVar152._0_4_ = fVar244 * fVar244 + fVar343 * fVar343;
        auVar152._4_4_ = fVar216 * fVar216 + fVar160 * fVar160;
        auVar152._8_4_ = fVar221 * fVar221 + fVar163 * fVar163;
        auVar152._12_4_ = fVar237 * fVar237 + fVar190 * fVar190;
        auVar152._16_4_ = fVar243 * fVar243 + fVar168 * fVar168;
        auVar152._20_4_ = fVar348 * fVar348 + fVar170 * fVar170;
        auVar152._24_4_ = fVar342 * fVar342 + fVar172 * fVar172;
        auVar152._28_4_ = auVar315._28_4_ + auVar27._28_4_;
        auVar27 = vrsqrtps_avx(auVar152);
        fVar256 = auVar27._0_4_;
        fVar262 = auVar27._4_4_;
        auVar39._4_4_ = fVar262 * 1.5;
        auVar39._0_4_ = fVar256 * 1.5;
        fVar263 = auVar27._8_4_;
        auVar39._8_4_ = fVar263 * 1.5;
        fVar217 = auVar27._12_4_;
        auVar39._12_4_ = fVar217 * 1.5;
        fVar218 = auVar27._16_4_;
        auVar39._16_4_ = fVar218 * 1.5;
        fVar219 = auVar27._20_4_;
        auVar39._20_4_ = fVar219 * 1.5;
        fVar223 = auVar27._24_4_;
        fVar308 = auVar26._28_4_;
        auVar39._24_4_ = fVar223 * 1.5;
        auVar39._28_4_ = fVar308;
        auVar40._4_4_ = fVar262 * fVar262 * fVar262 * auVar152._4_4_ * 0.5;
        auVar40._0_4_ = fVar256 * fVar256 * fVar256 * auVar152._0_4_ * 0.5;
        auVar40._8_4_ = fVar263 * fVar263 * fVar263 * auVar152._8_4_ * 0.5;
        auVar40._12_4_ = fVar217 * fVar217 * fVar217 * auVar152._12_4_ * 0.5;
        auVar40._16_4_ = fVar218 * fVar218 * fVar218 * auVar152._16_4_ * 0.5;
        auVar40._20_4_ = fVar219 * fVar219 * fVar219 * auVar152._20_4_ * 0.5;
        auVar40._24_4_ = fVar223 * fVar223 * fVar223 * auVar152._24_4_ * 0.5;
        auVar40._28_4_ = auVar152._28_4_;
        auVar26 = vsubps_avx(auVar39,auVar40);
        fVar256 = auVar26._0_4_;
        fVar217 = auVar26._4_4_;
        fVar223 = auVar26._8_4_;
        fVar239 = auVar26._12_4_;
        fVar282 = auVar26._16_4_;
        fVar347 = auVar26._20_4_;
        fVar306 = auVar26._24_4_;
        fVar262 = auVar28._0_4_;
        fVar218 = auVar28._4_4_;
        fVar225 = auVar28._8_4_;
        fVar241 = auVar28._12_4_;
        fVar346 = auVar28._16_4_;
        fVar300 = auVar28._20_4_;
        fVar307 = auVar28._24_4_;
        auVar153._0_4_ = fVar262 * fVar262 + fVar146 * fVar146;
        auVar153._4_4_ = fVar218 * fVar218 + fVar161 * fVar161;
        auVar153._8_4_ = fVar225 * fVar225 + fVar164 * fVar164;
        auVar153._12_4_ = fVar241 * fVar241 + fVar166 * fVar166;
        auVar153._16_4_ = fVar346 * fVar346 + fVar169 * fVar169;
        auVar153._20_4_ = fVar300 * fVar300 + fVar171 * fVar171;
        auVar153._24_4_ = fVar307 * fVar307 + fVar173 * fVar173;
        auVar153._28_4_ = auVar25._28_4_ + auVar26._28_4_;
        auVar25 = vrsqrtps_avx(auVar153);
        fVar263 = auVar25._0_4_;
        fVar219 = auVar25._4_4_;
        auVar41._4_4_ = fVar219 * 1.5;
        auVar41._0_4_ = fVar263 * 1.5;
        fVar235 = auVar25._8_4_;
        auVar41._8_4_ = fVar235 * 1.5;
        fVar242 = auVar25._12_4_;
        auVar41._12_4_ = fVar242 * 1.5;
        fVar220 = auVar25._16_4_;
        auVar41._16_4_ = fVar220 * 1.5;
        fVar222 = auVar25._20_4_;
        auVar41._20_4_ = fVar222 * 1.5;
        fVar224 = auVar25._24_4_;
        auVar41._24_4_ = fVar224 * 1.5;
        auVar41._28_4_ = fVar308;
        auVar42._4_4_ = fVar219 * fVar219 * fVar219 * auVar153._4_4_ * 0.5;
        auVar42._0_4_ = fVar263 * fVar263 * fVar263 * auVar153._0_4_ * 0.5;
        auVar42._8_4_ = fVar235 * fVar235 * fVar235 * auVar153._8_4_ * 0.5;
        auVar42._12_4_ = fVar242 * fVar242 * fVar242 * auVar153._12_4_ * 0.5;
        auVar42._16_4_ = fVar220 * fVar220 * fVar220 * auVar153._16_4_ * 0.5;
        auVar42._20_4_ = fVar222 * fVar222 * fVar222 * auVar153._20_4_ * 0.5;
        auVar42._24_4_ = fVar224 * fVar224 * fVar224 * auVar153._24_4_ * 0.5;
        auVar42._28_4_ = auVar153._28_4_;
        auVar25 = vsubps_avx(auVar41,auVar42);
        fVar263 = auVar25._0_4_;
        fVar219 = auVar25._4_4_;
        fVar235 = auVar25._8_4_;
        fVar242 = auVar25._12_4_;
        fVar220 = auVar25._16_4_;
        fVar222 = auVar25._20_4_;
        fVar224 = auVar25._24_4_;
        fVar174 = (float)local_840._0_4_ * fVar244 * fVar256;
        fVar204 = (float)local_840._4_4_ * fVar216 * fVar217;
        auVar43._4_4_ = fVar204;
        auVar43._0_4_ = fVar174;
        fVar280 = fStack_838 * fVar221 * fVar223;
        auVar43._8_4_ = fVar280;
        fVar237 = fStack_834 * fVar237 * fVar239;
        auVar43._12_4_ = fVar237;
        fStack_790 = fStack_830 * fVar243 * fVar282;
        auVar43._16_4_ = fStack_790;
        fStack_78c = fStack_82c * fVar348 * fVar347;
        auVar43._20_4_ = fStack_78c;
        fStack_788 = fStack_828 * fVar342 * fVar306;
        auVar43._24_4_ = fStack_788;
        auVar43._28_4_ = fStack_784;
        fStack_790 = auVar351._16_4_ + fStack_790;
        fStack_78c = auVar351._20_4_ + fStack_78c;
        fStack_788 = auVar351._24_4_ + fStack_788;
        fStack_784 = auVar351._28_4_ + fStack_784;
        fVar244 = (float)local_840._0_4_ * fVar256 * -fVar343;
        fVar216 = (float)local_840._4_4_ * fVar217 * -fVar160;
        auVar44._4_4_ = fVar216;
        auVar44._0_4_ = fVar244;
        fVar221 = fStack_838 * fVar223 * -fVar163;
        auVar44._8_4_ = fVar221;
        fVar243 = fStack_834 * fVar239 * -fVar190;
        auVar44._12_4_ = fVar243;
        fVar348 = fStack_830 * fVar282 * -fVar168;
        auVar44._16_4_ = fVar348;
        fVar342 = fStack_82c * fVar347 * -fVar170;
        auVar44._20_4_ = fVar342;
        fVar343 = fStack_828 * fVar306 * -fVar172;
        auVar44._24_4_ = fVar343;
        auVar44._28_4_ = fVar308;
        local_5e0._4_4_ = fVar216 + auVar304._4_4_;
        local_5e0._0_4_ = fVar244 + auVar304._0_4_;
        fStack_5d8 = fVar221 + auVar304._8_4_;
        fStack_5d4 = fVar243 + auVar304._12_4_;
        fStack_5d0 = fVar348 + auVar304._16_4_;
        fStack_5cc = fVar342 + auVar304._20_4_;
        fStack_5c8 = fVar343 + auVar304._24_4_;
        fStack_5c4 = fVar308 + 0.0;
        fVar244 = (float)local_840._0_4_ * fVar256 * 0.0;
        fVar256 = (float)local_840._4_4_ * fVar217 * 0.0;
        auVar45._4_4_ = fVar256;
        auVar45._0_4_ = fVar244;
        fVar216 = fStack_838 * fVar223 * 0.0;
        auVar45._8_4_ = fVar216;
        fVar217 = fStack_834 * fVar239 * 0.0;
        auVar45._12_4_ = fVar217;
        fVar221 = fStack_830 * fVar282 * 0.0;
        auVar45._16_4_ = fVar221;
        fVar223 = fStack_82c * fVar347 * 0.0;
        auVar45._20_4_ = fVar223;
        fVar239 = fStack_828 * fVar306 * 0.0;
        auVar45._24_4_ = fVar239;
        auVar45._28_4_ = fVar328;
        auVar272._0_4_ = (float)local_700._0_4_ + fVar244;
        auVar272._4_4_ = (float)local_700._4_4_ + fVar256;
        auVar272._8_4_ = fStack_6f8 + fVar216;
        auVar272._12_4_ = fStack_6f4 + fVar217;
        auVar272._16_4_ = (float)auStack_6f0._0_4_ + fVar221;
        auVar272._20_4_ = (float)auStack_6f0._4_4_ + fVar223;
        auVar272._24_4_ = fStack_6e8 + fVar239;
        auVar272._28_4_ = fStack_6e4 + fVar328;
        fVar244 = local_760._0_4_ * fVar262 * fVar263;
        fVar256 = local_760._4_4_ * fVar218 * fVar219;
        auVar46._4_4_ = fVar256;
        auVar46._0_4_ = fVar244;
        fVar262 = local_760._8_4_ * fVar225 * fVar235;
        auVar46._8_4_ = fVar262;
        fVar216 = local_760._12_4_ * fVar241 * fVar242;
        auVar46._12_4_ = fVar216;
        fVar217 = local_760._16_4_ * fVar346 * fVar220;
        auVar46._16_4_ = fVar217;
        fVar218 = local_760._20_4_ * fVar300 * fVar222;
        auVar46._20_4_ = fVar218;
        fVar221 = local_760._24_4_ * fVar307 * fVar224;
        auVar46._24_4_ = fVar221;
        auVar46._28_4_ = auVar28._28_4_;
        auVar30 = vsubps_avx(auVar351,auVar43);
        auVar316._0_4_ = auVar230._0_4_ + fVar244;
        auVar316._4_4_ = auVar230._4_4_ + fVar256;
        auVar316._8_4_ = auVar230._8_4_ + fVar262;
        auVar316._12_4_ = auVar230._12_4_ + fVar216;
        auVar316._16_4_ = auVar230._16_4_ + fVar217;
        auVar316._20_4_ = auVar230._20_4_ + fVar218;
        auVar316._24_4_ = auVar230._24_4_ + fVar221;
        auVar316._28_4_ = auVar230._28_4_ + auVar28._28_4_;
        fVar244 = local_760._0_4_ * fVar263 * -fVar146;
        fVar256 = local_760._4_4_ * fVar219 * -fVar161;
        auVar47._4_4_ = fVar256;
        auVar47._0_4_ = fVar244;
        fVar262 = local_760._8_4_ * fVar235 * -fVar164;
        auVar47._8_4_ = fVar262;
        fVar216 = local_760._12_4_ * fVar242 * -fVar166;
        auVar47._12_4_ = fVar216;
        fVar217 = local_760._16_4_ * fVar220 * -fVar169;
        auVar47._16_4_ = fVar217;
        fVar218 = local_760._20_4_ * fVar222 * -fVar171;
        auVar47._20_4_ = fVar218;
        fVar221 = local_760._24_4_ * fVar224 * -fVar173;
        auVar47._24_4_ = fVar221;
        auVar47._28_4_ = fVar368;
        auVar31 = vsubps_avx(auVar304,auVar44);
        auVar335._0_4_ = fVar244 + auVar210._0_4_;
        auVar335._4_4_ = fVar256 + auVar210._4_4_;
        auVar335._8_4_ = fVar262 + auVar210._8_4_;
        auVar335._12_4_ = fVar216 + auVar210._12_4_;
        auVar335._16_4_ = fVar217 + auVar210._16_4_;
        auVar335._20_4_ = fVar218 + auVar210._20_4_;
        auVar335._24_4_ = fVar221 + auVar210._24_4_;
        auVar335._28_4_ = fVar368 + auVar210._28_4_;
        fVar244 = local_760._0_4_ * fVar263 * 0.0;
        fVar256 = local_760._4_4_ * fVar219 * 0.0;
        auVar48._4_4_ = fVar256;
        auVar48._0_4_ = fVar244;
        fVar262 = local_760._8_4_ * fVar235 * 0.0;
        auVar48._8_4_ = fVar262;
        fVar263 = local_760._12_4_ * fVar242 * 0.0;
        auVar48._12_4_ = fVar263;
        fVar216 = local_760._16_4_ * fVar220 * 0.0;
        auVar48._16_4_ = fVar216;
        fVar217 = local_760._20_4_ * fVar222 * 0.0;
        auVar48._20_4_ = fVar217;
        fVar218 = local_760._24_4_ * fVar224 * 0.0;
        auVar48._24_4_ = fVar218;
        auVar48._28_4_ = 0x3f000000;
        auVar32 = vsubps_avx(_local_700,auVar45);
        auVar371._0_4_ = fVar244 + (float)local_3e0._0_4_;
        auVar371._4_4_ = fVar256 + (float)local_3e0._4_4_;
        auVar371._8_4_ = fVar262 + fStack_3d8;
        auVar371._12_4_ = fVar263 + fStack_3d4;
        auVar371._16_4_ = fVar216 + fStack_3d0;
        auVar371._20_4_ = fVar217 + fStack_3cc;
        auVar371._24_4_ = fVar218 + fStack_3c8;
        auVar371._28_4_ = fStack_3c4 + 0.5;
        auVar25 = vsubps_avx(auVar230,auVar46);
        auVar26 = vsubps_avx(auVar210,auVar47);
        auVar34 = vsubps_avx(_local_3e0,auVar48);
        auVar27 = vsubps_avx(auVar335,auVar31);
        auVar28 = vsubps_avx(auVar371,auVar32);
        auVar49._4_4_ = auVar32._4_4_ * auVar27._4_4_;
        auVar49._0_4_ = auVar32._0_4_ * auVar27._0_4_;
        auVar49._8_4_ = auVar32._8_4_ * auVar27._8_4_;
        auVar49._12_4_ = auVar32._12_4_ * auVar27._12_4_;
        auVar49._16_4_ = auVar32._16_4_ * auVar27._16_4_;
        auVar49._20_4_ = auVar32._20_4_ * auVar27._20_4_;
        auVar49._24_4_ = auVar32._24_4_ * auVar27._24_4_;
        auVar49._28_4_ = fVar327;
        auVar50._4_4_ = auVar31._4_4_ * auVar28._4_4_;
        auVar50._0_4_ = auVar31._0_4_ * auVar28._0_4_;
        auVar50._8_4_ = auVar31._8_4_ * auVar28._8_4_;
        auVar50._12_4_ = auVar31._12_4_ * auVar28._12_4_;
        auVar50._16_4_ = auVar31._16_4_ * auVar28._16_4_;
        auVar50._20_4_ = auVar31._20_4_ * auVar28._20_4_;
        auVar50._24_4_ = auVar31._24_4_ * auVar28._24_4_;
        auVar50._28_4_ = fStack_3c4;
        auVar29 = vsubps_avx(auVar50,auVar49);
        auVar51._4_4_ = auVar30._4_4_ * auVar28._4_4_;
        auVar51._0_4_ = auVar30._0_4_ * auVar28._0_4_;
        auVar51._8_4_ = auVar30._8_4_ * auVar28._8_4_;
        auVar51._12_4_ = auVar30._12_4_ * auVar28._12_4_;
        auVar51._16_4_ = auVar30._16_4_ * auVar28._16_4_;
        auVar51._20_4_ = auVar30._20_4_ * auVar28._20_4_;
        auVar51._24_4_ = auVar30._24_4_ * auVar28._24_4_;
        auVar51._28_4_ = auVar28._28_4_;
        auVar33 = vsubps_avx(auVar316,auVar30);
        auVar52._4_4_ = auVar32._4_4_ * auVar33._4_4_;
        auVar52._0_4_ = auVar32._0_4_ * auVar33._0_4_;
        auVar52._8_4_ = auVar32._8_4_ * auVar33._8_4_;
        auVar52._12_4_ = auVar32._12_4_ * auVar33._12_4_;
        auVar52._16_4_ = auVar32._16_4_ * auVar33._16_4_;
        auVar52._20_4_ = auVar32._20_4_ * auVar33._20_4_;
        auVar52._24_4_ = auVar32._24_4_ * auVar33._24_4_;
        auVar52._28_4_ = auVar230._28_4_;
        auVar150 = vsubps_avx(auVar52,auVar51);
        auVar53._4_4_ = auVar33._4_4_ * auVar31._4_4_;
        auVar53._0_4_ = auVar33._0_4_ * auVar31._0_4_;
        auVar53._8_4_ = auVar33._8_4_ * auVar31._8_4_;
        auVar53._12_4_ = auVar33._12_4_ * auVar31._12_4_;
        auVar53._16_4_ = auVar33._16_4_ * auVar31._16_4_;
        auVar53._20_4_ = auVar33._20_4_ * auVar31._20_4_;
        auVar53._24_4_ = auVar33._24_4_ * auVar31._24_4_;
        auVar53._28_4_ = auVar28._28_4_;
        auVar54._4_4_ = auVar30._4_4_ * auVar27._4_4_;
        auVar54._0_4_ = auVar30._0_4_ * auVar27._0_4_;
        auVar54._8_4_ = auVar30._8_4_ * auVar27._8_4_;
        auVar54._12_4_ = auVar30._12_4_ * auVar27._12_4_;
        auVar54._16_4_ = auVar30._16_4_ * auVar27._16_4_;
        auVar54._20_4_ = auVar30._20_4_ * auVar27._20_4_;
        auVar54._24_4_ = auVar30._24_4_ * auVar27._24_4_;
        auVar54._28_4_ = auVar27._28_4_;
        auVar27 = vsubps_avx(auVar54,auVar53);
        auVar154._0_4_ = auVar29._0_4_ * 0.0 + auVar27._0_4_ + auVar150._0_4_ * 0.0;
        auVar154._4_4_ = auVar29._4_4_ * 0.0 + auVar27._4_4_ + auVar150._4_4_ * 0.0;
        auVar154._8_4_ = auVar29._8_4_ * 0.0 + auVar27._8_4_ + auVar150._8_4_ * 0.0;
        auVar154._12_4_ = auVar29._12_4_ * 0.0 + auVar27._12_4_ + auVar150._12_4_ * 0.0;
        auVar154._16_4_ = auVar29._16_4_ * 0.0 + auVar27._16_4_ + auVar150._16_4_ * 0.0;
        auVar154._20_4_ = auVar29._20_4_ * 0.0 + auVar27._20_4_ + auVar150._20_4_ * 0.0;
        auVar154._24_4_ = auVar29._24_4_ * 0.0 + auVar27._24_4_ + auVar150._24_4_ * 0.0;
        auVar154._28_4_ = auVar27._28_4_ + auVar27._28_4_ + auVar150._28_4_;
        auVar33 = vcmpps_avx(auVar154,ZEXT432(0) << 0x20,2);
        auVar127._4_4_ = auVar351._4_4_ + fVar204;
        auVar127._0_4_ = auVar351._0_4_ + fVar174;
        auVar127._8_4_ = auVar351._8_4_ + fVar280;
        auVar127._12_4_ = auVar351._12_4_ + fVar237;
        auVar127._16_4_ = fStack_790;
        auVar127._20_4_ = fStack_78c;
        auVar127._24_4_ = fStack_788;
        auVar127._28_4_ = fStack_784;
        _local_780 = vblendvps_avx(auVar25,auVar127,auVar33);
        auVar25 = vblendvps_avx(auVar26,_local_5e0,auVar33);
        auVar26 = vblendvps_avx(auVar34,auVar272,auVar33);
        auVar275 = ZEXT3264(auVar26);
        auVar27 = vblendvps_avx(auVar30,auVar316,auVar33);
        auVar28 = vblendvps_avx(auVar31,auVar335,auVar33);
        auVar29 = vblendvps_avx(auVar32,auVar371,auVar33);
        auVar30 = vblendvps_avx(auVar316,auVar30,auVar33);
        auVar31 = vblendvps_avx(auVar335,auVar31,auVar33);
        _local_6e0 = vpackssdw_avx(local_3c0._0_16_,local_3c0._16_16_);
        _auStack_6d0 = auVar351._16_16_;
        auVar32 = vblendvps_avx(auVar371,auVar32,auVar33);
        auVar30 = vsubps_avx(auVar30,_local_780);
        auVar150 = vsubps_avx(auVar31,auVar25);
        auVar32 = vsubps_avx(auVar32,auVar26);
        auVar151 = vsubps_avx(auVar25,auVar28);
        fVar244 = auVar150._0_4_;
        fVar172 = auVar26._0_4_;
        fVar217 = auVar150._4_4_;
        fVar146 = auVar26._4_4_;
        auVar55._4_4_ = fVar146 * fVar217;
        auVar55._0_4_ = fVar172 * fVar244;
        fVar225 = auVar150._8_4_;
        fVar161 = auVar26._8_4_;
        auVar55._8_4_ = fVar161 * fVar225;
        fVar242 = auVar150._12_4_;
        fVar164 = auVar26._12_4_;
        auVar55._12_4_ = fVar164 * fVar242;
        fVar348 = auVar150._16_4_;
        fVar166 = auVar26._16_4_;
        auVar55._16_4_ = fVar166 * fVar348;
        fVar306 = auVar150._20_4_;
        fVar169 = auVar26._20_4_;
        auVar55._20_4_ = fVar169 * fVar306;
        fVar160 = auVar150._24_4_;
        fVar171 = auVar26._24_4_;
        auVar55._24_4_ = fVar171 * fVar160;
        auVar55._28_4_ = auVar31._28_4_;
        fVar256 = auVar25._0_4_;
        fVar265 = auVar32._0_4_;
        fVar218 = auVar25._4_4_;
        fVar276 = auVar32._4_4_;
        auVar56._4_4_ = fVar276 * fVar218;
        auVar56._0_4_ = fVar265 * fVar256;
        fVar235 = auVar25._8_4_;
        fVar277 = auVar32._8_4_;
        auVar56._8_4_ = fVar277 * fVar235;
        fVar243 = auVar25._12_4_;
        fVar278 = auVar32._12_4_;
        auVar56._12_4_ = fVar278 * fVar243;
        fVar347 = auVar25._16_4_;
        fVar162 = auVar32._16_4_;
        auVar56._16_4_ = fVar162 * fVar347;
        fVar307 = auVar25._20_4_;
        fVar165 = auVar32._20_4_;
        auVar56._20_4_ = fVar165 * fVar307;
        fVar163 = auVar25._24_4_;
        fVar167 = auVar32._24_4_;
        uVar8 = auVar34._28_4_;
        auVar56._24_4_ = fVar167 * fVar163;
        auVar56._28_4_ = uVar8;
        auVar31 = vsubps_avx(auVar56,auVar55);
        fVar262 = local_780;
        fVar219 = local_780._4_4_;
        auVar57._4_4_ = fVar276 * fVar219;
        auVar57._0_4_ = fVar265 * fVar262;
        fVar237 = local_780._8_4_;
        auVar57._8_4_ = fVar277 * fVar237;
        fVar282 = local_780._12_4_;
        auVar57._12_4_ = fVar278 * fVar282;
        fVar300 = local_780._16_4_;
        auVar57._16_4_ = fVar162 * fVar300;
        fVar224 = local_780._20_4_;
        auVar57._20_4_ = fVar165 * fVar224;
        fVar190 = local_780._24_4_;
        auVar57._24_4_ = fVar167 * fVar190;
        auVar57._28_4_ = uVar8;
        fVar263 = auVar30._0_4_;
        fVar221 = auVar30._4_4_;
        auVar58._4_4_ = fVar146 * fVar221;
        auVar58._0_4_ = fVar172 * fVar263;
        fVar239 = auVar30._8_4_;
        auVar58._8_4_ = fVar161 * fVar239;
        fVar346 = auVar30._12_4_;
        auVar58._12_4_ = fVar164 * fVar346;
        fVar222 = auVar30._16_4_;
        auVar58._16_4_ = fVar166 * fVar222;
        fVar308 = auVar30._20_4_;
        auVar58._20_4_ = fVar169 * fVar308;
        fVar168 = auVar30._24_4_;
        auVar58._24_4_ = fVar171 * fVar168;
        auVar58._28_4_ = auVar371._28_4_;
        auVar34 = vsubps_avx(auVar58,auVar57);
        auVar59._4_4_ = fVar218 * fVar221;
        auVar59._0_4_ = fVar256 * fVar263;
        auVar59._8_4_ = fVar235 * fVar239;
        auVar59._12_4_ = fVar243 * fVar346;
        auVar59._16_4_ = fVar347 * fVar222;
        auVar59._20_4_ = fVar307 * fVar308;
        auVar59._24_4_ = fVar163 * fVar168;
        auVar59._28_4_ = uVar8;
        auVar377._0_4_ = fVar262 * fVar244;
        auVar377._4_4_ = fVar219 * fVar217;
        auVar377._8_4_ = fVar237 * fVar225;
        auVar377._12_4_ = fVar282 * fVar242;
        auVar377._16_4_ = fVar300 * fVar348;
        auVar377._20_4_ = fVar224 * fVar306;
        auVar377._24_4_ = fVar190 * fVar160;
        auVar377._28_4_ = 0;
        auVar181 = vsubps_avx(auVar377,auVar59);
        auVar182 = vsubps_avx(auVar26,auVar29);
        fVar216 = auVar181._28_4_ + auVar34._28_4_;
        auVar186._0_4_ = auVar181._0_4_ + auVar34._0_4_ * 0.0 + auVar31._0_4_ * 0.0;
        auVar186._4_4_ = auVar181._4_4_ + auVar34._4_4_ * 0.0 + auVar31._4_4_ * 0.0;
        auVar186._8_4_ = auVar181._8_4_ + auVar34._8_4_ * 0.0 + auVar31._8_4_ * 0.0;
        auVar186._12_4_ = auVar181._12_4_ + auVar34._12_4_ * 0.0 + auVar31._12_4_ * 0.0;
        auVar186._16_4_ = auVar181._16_4_ + auVar34._16_4_ * 0.0 + auVar31._16_4_ * 0.0;
        auVar186._20_4_ = auVar181._20_4_ + auVar34._20_4_ * 0.0 + auVar31._20_4_ * 0.0;
        auVar186._24_4_ = auVar181._24_4_ + auVar34._24_4_ * 0.0 + auVar31._24_4_ * 0.0;
        auVar186._28_4_ = fVar216 + auVar31._28_4_;
        fVar173 = auVar151._0_4_;
        fVar174 = auVar151._4_4_;
        auVar60._4_4_ = fVar174 * auVar29._4_4_;
        auVar60._0_4_ = fVar173 * auVar29._0_4_;
        fVar204 = auVar151._8_4_;
        auVar60._8_4_ = fVar204 * auVar29._8_4_;
        fVar280 = auVar151._12_4_;
        auVar60._12_4_ = fVar280 * auVar29._12_4_;
        fVar309 = auVar151._16_4_;
        auVar60._16_4_ = fVar309 * auVar29._16_4_;
        fVar310 = auVar151._20_4_;
        auVar60._20_4_ = fVar310 * auVar29._20_4_;
        fVar311 = auVar151._24_4_;
        auVar60._24_4_ = fVar311 * auVar29._24_4_;
        auVar60._28_4_ = fVar216;
        fVar216 = auVar182._0_4_;
        fVar223 = auVar182._4_4_;
        auVar61._4_4_ = auVar28._4_4_ * fVar223;
        auVar61._0_4_ = auVar28._0_4_ * fVar216;
        fVar241 = auVar182._8_4_;
        auVar61._8_4_ = auVar28._8_4_ * fVar241;
        fVar220 = auVar182._12_4_;
        auVar61._12_4_ = auVar28._12_4_ * fVar220;
        fVar342 = auVar182._16_4_;
        auVar61._16_4_ = auVar28._16_4_ * fVar342;
        fVar343 = auVar182._20_4_;
        auVar61._20_4_ = auVar28._20_4_ * fVar343;
        fVar170 = auVar182._24_4_;
        auVar61._24_4_ = auVar28._24_4_ * fVar170;
        auVar61._28_4_ = auVar181._28_4_;
        auVar34 = vsubps_avx(auVar61,auVar60);
        auVar151 = vsubps_avx(_local_780,auVar27);
        fVar281 = auVar151._0_4_;
        fVar319 = auVar151._4_4_;
        auVar62._4_4_ = fVar319 * auVar29._4_4_;
        auVar62._0_4_ = fVar281 * auVar29._0_4_;
        fVar322 = auVar151._8_4_;
        auVar62._8_4_ = fVar322 * auVar29._8_4_;
        fVar323 = auVar151._12_4_;
        auVar62._12_4_ = fVar323 * auVar29._12_4_;
        fVar326 = auVar151._16_4_;
        auVar62._16_4_ = fVar326 * auVar29._16_4_;
        fVar333 = auVar151._20_4_;
        auVar62._20_4_ = fVar333 * auVar29._20_4_;
        fVar339 = auVar151._24_4_;
        auVar62._24_4_ = fVar339 * auVar29._24_4_;
        auVar62._28_4_ = auVar29._28_4_;
        auVar63._4_4_ = auVar27._4_4_ * fVar223;
        auVar63._0_4_ = auVar27._0_4_ * fVar216;
        auVar63._8_4_ = auVar27._8_4_ * fVar241;
        auVar63._12_4_ = auVar27._12_4_ * fVar220;
        auVar63._16_4_ = auVar27._16_4_ * fVar342;
        auVar63._20_4_ = auVar27._20_4_ * fVar343;
        auVar63._24_4_ = auVar27._24_4_ * fVar170;
        auVar63._28_4_ = auVar31._28_4_;
        auVar31 = vsubps_avx(auVar62,auVar63);
        auVar64._4_4_ = auVar28._4_4_ * fVar319;
        auVar64._0_4_ = auVar28._0_4_ * fVar281;
        auVar64._8_4_ = auVar28._8_4_ * fVar322;
        auVar64._12_4_ = auVar28._12_4_ * fVar323;
        auVar64._16_4_ = auVar28._16_4_ * fVar326;
        auVar64._20_4_ = auVar28._20_4_ * fVar333;
        auVar64._24_4_ = auVar28._24_4_ * fVar339;
        auVar64._28_4_ = auVar29._28_4_;
        auVar65._4_4_ = auVar27._4_4_ * fVar174;
        auVar65._0_4_ = auVar27._0_4_ * fVar173;
        auVar65._8_4_ = auVar27._8_4_ * fVar204;
        auVar65._12_4_ = auVar27._12_4_ * fVar280;
        auVar65._16_4_ = auVar27._16_4_ * fVar309;
        auVar65._20_4_ = auVar27._20_4_ * fVar310;
        auVar65._24_4_ = auVar27._24_4_ * fVar311;
        auVar65._28_4_ = auVar27._28_4_;
        auVar27 = vsubps_avx(auVar65,auVar64);
        auVar159 = ZEXT864(0) << 0x20;
        auVar232._0_4_ = auVar34._0_4_ * 0.0 + auVar27._0_4_ + auVar31._0_4_ * 0.0;
        auVar232._4_4_ = auVar34._4_4_ * 0.0 + auVar27._4_4_ + auVar31._4_4_ * 0.0;
        auVar232._8_4_ = auVar34._8_4_ * 0.0 + auVar27._8_4_ + auVar31._8_4_ * 0.0;
        auVar232._12_4_ = auVar34._12_4_ * 0.0 + auVar27._12_4_ + auVar31._12_4_ * 0.0;
        auVar232._16_4_ = auVar34._16_4_ * 0.0 + auVar27._16_4_ + auVar31._16_4_ * 0.0;
        auVar232._20_4_ = auVar34._20_4_ * 0.0 + auVar27._20_4_ + auVar31._20_4_ * 0.0;
        auVar232._24_4_ = auVar34._24_4_ * 0.0 + auVar27._24_4_ + auVar31._24_4_ * 0.0;
        auVar232._28_4_ = auVar27._28_4_ + auVar27._28_4_ + auVar31._28_4_;
        auVar27 = vmaxps_avx(auVar186,auVar232);
        auVar27 = vcmpps_avx(auVar27,ZEXT832(0) << 0x20,2);
        auVar249 = vpackssdw_avx(auVar27._0_16_,auVar27._16_16_);
        auVar249 = vpand_avx(auVar249,_local_6e0);
        auVar228 = vpmovsxwd_avx(auVar249);
        auVar207 = vpunpckhwd_avx(auVar249,auVar249);
        auVar212._16_16_ = auVar207;
        auVar212._0_16_ = auVar228;
        if ((((((((auVar212 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar212 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar212 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar212 >> 0x7f,0) == '\0') &&
              (auVar212 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar207 >> 0x3f,0) == '\0') &&
            (auVar212 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar207[0xf]) {
LAB_011b30ef:
          auVar253._8_8_ = uStack_558;
          auVar253._0_8_ = local_560;
          auVar253._16_8_ = uStack_550;
          auVar253._24_8_ = uStack_548;
          auVar215 = ZEXT3264(auVar149);
        }
        else {
          auVar66._4_4_ = fVar223 * fVar217;
          auVar66._0_4_ = fVar216 * fVar244;
          auVar66._8_4_ = fVar241 * fVar225;
          auVar66._12_4_ = fVar220 * fVar242;
          auVar66._16_4_ = fVar342 * fVar348;
          auVar66._20_4_ = fVar343 * fVar306;
          auVar66._24_4_ = fVar170 * fVar160;
          auVar66._28_4_ = auVar207._12_4_;
          auVar352._0_4_ = fVar173 * fVar265;
          auVar352._4_4_ = fVar174 * fVar276;
          auVar352._8_4_ = fVar204 * fVar277;
          auVar352._12_4_ = fVar280 * fVar278;
          auVar352._16_4_ = fVar309 * fVar162;
          auVar352._20_4_ = fVar310 * fVar165;
          auVar352._24_4_ = fVar311 * fVar167;
          auVar352._28_4_ = 0;
          auVar27 = vsubps_avx(auVar352,auVar66);
          auVar67._4_4_ = fVar319 * fVar276;
          auVar67._0_4_ = fVar281 * fVar265;
          auVar67._8_4_ = fVar322 * fVar277;
          auVar67._12_4_ = fVar323 * fVar278;
          auVar67._16_4_ = fVar326 * fVar162;
          auVar67._20_4_ = fVar333 * fVar165;
          auVar67._24_4_ = fVar339 * fVar167;
          auVar67._28_4_ = auVar32._28_4_;
          auVar68._4_4_ = fVar223 * fVar221;
          auVar68._0_4_ = fVar216 * fVar263;
          auVar68._8_4_ = fVar241 * fVar239;
          auVar68._12_4_ = fVar220 * fVar346;
          auVar68._16_4_ = fVar342 * fVar222;
          auVar68._20_4_ = fVar343 * fVar308;
          auVar68._24_4_ = fVar170 * fVar168;
          auVar68._28_4_ = auVar182._28_4_;
          auVar29 = vsubps_avx(auVar68,auVar67);
          auVar69._4_4_ = fVar174 * fVar221;
          auVar69._0_4_ = fVar173 * fVar263;
          auVar69._8_4_ = fVar204 * fVar239;
          auVar69._12_4_ = fVar280 * fVar346;
          auVar69._16_4_ = fVar309 * fVar222;
          auVar69._20_4_ = fVar310 * fVar308;
          auVar69._24_4_ = fVar311 * fVar168;
          auVar69._28_4_ = auVar186._28_4_;
          auVar70._4_4_ = fVar319 * fVar217;
          auVar70._0_4_ = fVar281 * fVar244;
          auVar70._8_4_ = fVar322 * fVar225;
          auVar70._12_4_ = fVar323 * fVar242;
          auVar70._16_4_ = fVar326 * fVar348;
          auVar70._20_4_ = fVar333 * fVar306;
          auVar70._24_4_ = fVar339 * fVar160;
          auVar70._28_4_ = auVar150._28_4_;
          auVar31 = vsubps_avx(auVar70,auVar69);
          auVar292._0_4_ = auVar27._0_4_ * 0.0 + auVar31._0_4_ + auVar29._0_4_ * 0.0;
          auVar292._4_4_ = auVar27._4_4_ * 0.0 + auVar31._4_4_ + auVar29._4_4_ * 0.0;
          auVar292._8_4_ = auVar27._8_4_ * 0.0 + auVar31._8_4_ + auVar29._8_4_ * 0.0;
          auVar292._12_4_ = auVar27._12_4_ * 0.0 + auVar31._12_4_ + auVar29._12_4_ * 0.0;
          auVar292._16_4_ = auVar27._16_4_ * 0.0 + auVar31._16_4_ + auVar29._16_4_ * 0.0;
          auVar292._20_4_ = auVar27._20_4_ * 0.0 + auVar31._20_4_ + auVar29._20_4_ * 0.0;
          auVar292._24_4_ = auVar27._24_4_ * 0.0 + auVar31._24_4_ + auVar29._24_4_ * 0.0;
          auVar292._28_4_ = auVar150._28_4_ + auVar31._28_4_ + auVar186._28_4_;
          auVar28 = vrcpps_avx(auVar292);
          fVar244 = auVar28._0_4_;
          fVar263 = auVar28._4_4_;
          auVar71._4_4_ = auVar292._4_4_ * fVar263;
          auVar71._0_4_ = auVar292._0_4_ * fVar244;
          fVar216 = auVar28._8_4_;
          auVar71._8_4_ = auVar292._8_4_ * fVar216;
          fVar217 = auVar28._12_4_;
          auVar71._12_4_ = auVar292._12_4_ * fVar217;
          fVar221 = auVar28._16_4_;
          auVar71._16_4_ = auVar292._16_4_ * fVar221;
          fVar223 = auVar28._20_4_;
          auVar71._20_4_ = auVar292._20_4_ * fVar223;
          fVar225 = auVar28._24_4_;
          auVar71._24_4_ = auVar292._24_4_ * fVar225;
          auVar71._28_4_ = auVar182._28_4_;
          auVar353._8_4_ = 0x3f800000;
          auVar353._0_8_ = &DAT_3f8000003f800000;
          auVar353._12_4_ = 0x3f800000;
          auVar353._16_4_ = 0x3f800000;
          auVar353._20_4_ = 0x3f800000;
          auVar353._24_4_ = 0x3f800000;
          auVar353._28_4_ = 0x3f800000;
          auVar32 = vsubps_avx(auVar353,auVar71);
          fVar244 = auVar32._0_4_ * fVar244 + fVar244;
          fVar263 = auVar32._4_4_ * fVar263 + fVar263;
          fVar216 = auVar32._8_4_ * fVar216 + fVar216;
          fVar217 = auVar32._12_4_ * fVar217 + fVar217;
          fVar221 = auVar32._16_4_ * fVar221 + fVar221;
          fVar223 = auVar32._20_4_ * fVar223 + fVar223;
          fVar225 = auVar32._24_4_ * fVar225 + fVar225;
          auVar72._4_4_ =
               (auVar27._4_4_ * fVar219 + auVar29._4_4_ * fVar218 + auVar31._4_4_ * fVar146) *
               fVar263;
          auVar72._0_4_ =
               (auVar27._0_4_ * fVar262 + auVar29._0_4_ * fVar256 + auVar31._0_4_ * fVar172) *
               fVar244;
          auVar72._8_4_ =
               (auVar27._8_4_ * fVar237 + auVar29._8_4_ * fVar235 + auVar31._8_4_ * fVar161) *
               fVar216;
          auVar72._12_4_ =
               (auVar27._12_4_ * fVar282 + auVar29._12_4_ * fVar243 + auVar31._12_4_ * fVar164) *
               fVar217;
          auVar72._16_4_ =
               (auVar27._16_4_ * fVar300 + auVar29._16_4_ * fVar347 + auVar31._16_4_ * fVar166) *
               fVar221;
          auVar72._20_4_ =
               (auVar27._20_4_ * fVar224 + auVar29._20_4_ * fVar307 + auVar31._20_4_ * fVar169) *
               fVar223;
          auVar72._24_4_ =
               (auVar27._24_4_ * fVar190 + auVar29._24_4_ * fVar163 + auVar31._24_4_ * fVar171) *
               fVar225;
          auVar72._28_4_ = local_780._28_4_ + auVar30._28_4_ + auVar26._28_4_;
          auVar228 = vpermilps_avx(ZEXT416(uVar9),0);
          auVar213._16_16_ = auVar228;
          auVar213._0_16_ = auVar228;
          auVar26 = vcmpps_avx(auVar213,auVar72,2);
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar251._4_4_ = uVar8;
          auVar251._0_4_ = uVar8;
          auVar251._8_4_ = uVar8;
          auVar251._12_4_ = uVar8;
          auVar251._16_4_ = uVar8;
          auVar251._20_4_ = uVar8;
          auVar251._24_4_ = uVar8;
          auVar251._28_4_ = uVar8;
          auVar27 = vcmpps_avx(auVar72,auVar251,2);
          auVar26 = vandps_avx(auVar27,auVar26);
          auVar228 = vpackssdw_avx(auVar26._0_16_,auVar26._16_16_);
          auVar249 = vpand_avx(auVar249,auVar228);
          auVar228 = vpmovsxwd_avx(auVar249);
          auVar207 = vpshufd_avx(auVar249,0xee);
          auVar207 = vpmovsxwd_avx(auVar207);
          auVar275 = ZEXT1664(auVar207);
          auVar214._16_16_ = auVar207;
          auVar214._0_16_ = auVar228;
          if ((((((((auVar214 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar214 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar214 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar214 >> 0x7f,0) == '\0') &&
                (auVar214 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar207 >> 0x3f,0) == '\0') &&
              (auVar214 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar207[0xf]) goto LAB_011b30ef;
          auVar26 = vcmpps_avx(ZEXT832(0) << 0x20,auVar292,4);
          auVar228 = vpackssdw_avx(auVar26._0_16_,auVar26._16_16_);
          auVar249 = vpand_avx(auVar249,auVar228);
          auVar228 = vpmovsxwd_avx(auVar249);
          auVar249 = vpunpckhwd_avx(auVar249,auVar249);
          auVar273._16_16_ = auVar249;
          auVar273._0_16_ = auVar228;
          auVar275 = ZEXT3264(auVar273);
          auVar253._8_8_ = uStack_558;
          auVar253._0_8_ = local_560;
          auVar253._16_8_ = uStack_550;
          auVar253._24_8_ = uStack_548;
          auVar215 = ZEXT3264(auVar149);
          if ((((((((auVar273 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar273 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar273 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar273 >> 0x7f,0) != '\0') ||
                (auVar273 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar249 >> 0x3f,0) != '\0') ||
              (auVar273 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar249[0xf] < '\0') {
            auVar73._4_4_ = auVar186._4_4_ * fVar263;
            auVar73._0_4_ = auVar186._0_4_ * fVar244;
            auVar73._8_4_ = auVar186._8_4_ * fVar216;
            auVar73._12_4_ = auVar186._12_4_ * fVar217;
            auVar73._16_4_ = auVar186._16_4_ * fVar221;
            auVar73._20_4_ = auVar186._20_4_ * fVar223;
            auVar73._24_4_ = auVar186._24_4_ * fVar225;
            auVar73._28_4_ = auVar338._28_4_;
            auVar74._4_4_ = auVar232._4_4_ * fVar263;
            auVar74._0_4_ = auVar232._0_4_ * fVar244;
            auVar74._8_4_ = auVar232._8_4_ * fVar216;
            auVar74._12_4_ = auVar232._12_4_ * fVar217;
            auVar74._16_4_ = auVar232._16_4_ * fVar221;
            auVar74._20_4_ = auVar232._20_4_ * fVar223;
            auVar74._24_4_ = auVar232._24_4_ * fVar225;
            auVar74._28_4_ = auVar32._28_4_ + auVar28._28_4_;
            auVar252._8_4_ = 0x3f800000;
            auVar252._0_8_ = &DAT_3f8000003f800000;
            auVar252._12_4_ = 0x3f800000;
            auVar252._16_4_ = 0x3f800000;
            auVar252._20_4_ = 0x3f800000;
            auVar252._24_4_ = 0x3f800000;
            auVar252._28_4_ = 0x3f800000;
            auVar149 = vsubps_avx(auVar252,auVar73);
            _local_1c0 = vblendvps_avx(auVar149,auVar73,auVar33);
            auVar149 = vsubps_avx(auVar252,auVar74);
            _local_400 = vblendvps_avx(auVar149,auVar74,auVar33);
            auVar215 = ZEXT3264(auVar72);
            auVar253 = auVar273;
          }
        }
        if ((((((((auVar253 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar253 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar253 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar253 >> 0x7f,0) == '\0') &&
              (auVar253 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar253 >> 0xbf,0) == '\0') &&
            (auVar253 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar253[0x1f]) {
          uVar144 = 0;
          auVar338 = ZEXT3264(local_7c0);
          auVar372 = ZEXT3264(_local_640);
        }
        else {
          auVar149 = vsubps_avx(local_760,_local_840);
          local_740 = auVar215._0_32_;
          local_840._0_4_ = (float)local_840._0_4_ + auVar149._0_4_ * (float)local_1c0._0_4_;
          local_840._4_4_ = (float)local_840._4_4_ + auVar149._4_4_ * (float)local_1c0._4_4_;
          fStack_838 = fStack_838 + auVar149._8_4_ * fStack_1b8;
          fStack_834 = fStack_834 + auVar149._12_4_ * fStack_1b4;
          fStack_830 = fStack_830 + auVar149._16_4_ * fStack_1b0;
          fStack_82c = fStack_82c + auVar149._20_4_ * fStack_1ac;
          fStack_828 = fStack_828 + auVar149._24_4_ * fStack_1a8;
          fStack_824 = fStack_824 + auVar149._28_4_;
          fVar244 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          auVar75._4_4_ = ((float)local_840._4_4_ + (float)local_840._4_4_) * fVar244;
          auVar75._0_4_ = ((float)local_840._0_4_ + (float)local_840._0_4_) * fVar244;
          auVar75._8_4_ = (fStack_838 + fStack_838) * fVar244;
          auVar75._12_4_ = (fStack_834 + fStack_834) * fVar244;
          auVar75._16_4_ = (fStack_830 + fStack_830) * fVar244;
          auVar75._20_4_ = (fStack_82c + fStack_82c) * fVar244;
          auVar75._24_4_ = (fStack_828 + fStack_828) * fVar244;
          auVar75._28_4_ = fStack_824 + fStack_824;
          auVar149 = vcmpps_avx(local_740,auVar75,6);
          auVar26 = auVar253 & auVar149;
          if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar26 >> 0x7f,0) == '\0') &&
                (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar26 >> 0xbf,0) == '\0') &&
              (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar26[0x1f]) {
            uVar144 = 0;
            auVar338 = ZEXT3264(local_7c0);
            auVar372 = ZEXT3264(_local_640);
            auVar215 = ZEXT3264(local_740);
          }
          else {
            local_280 = vandps_avx(auVar149,auVar253);
            local_320 = (float)local_400._0_4_ + (float)local_400._0_4_ + -1.0;
            fStack_31c = (float)local_400._4_4_ + (float)local_400._4_4_ + -1.0;
            fStack_318 = (float)uStack_3f8 + (float)uStack_3f8 + -1.0;
            fStack_314 = uStack_3f8._4_4_ + uStack_3f8._4_4_ + -1.0;
            fStack_310 = (float)uStack_3f0 + (float)uStack_3f0 + -1.0;
            fStack_30c = uStack_3f0._4_4_ + uStack_3f0._4_4_ + -1.0;
            fStack_308 = (float)uStack_3e8 + (float)uStack_3e8 + -1.0;
            fStack_304 = uStack_3e8._4_4_ + uStack_3e8._4_4_ + -1.0;
            local_340 = (float)local_1c0._0_4_;
            fStack_33c = (float)local_1c0._4_4_;
            fStack_338 = fStack_1b8;
            fStack_334 = fStack_1b4;
            fStack_330 = fStack_1b0;
            fStack_32c = fStack_1ac;
            fStack_328 = fStack_1a8;
            fStack_324 = fStack_1a4;
            local_2e0 = 0;
            local_2d0 = local_7f0;
            uStack_2c8 = uStack_7e8;
            uStack_2b8 = local_710._8_8_;
            auVar215 = ZEXT3264(local_740);
            local_400._4_4_ = fStack_31c;
            local_400._0_4_ = local_320;
            uStack_3f8._0_4_ = fStack_318;
            uStack_3f8._4_4_ = fStack_314;
            uStack_3f0._0_4_ = fStack_310;
            uStack_3f0._4_4_ = fStack_30c;
            auVar137 = _local_400;
            uStack_3e8._0_4_ = fStack_308;
            uStack_3e8._4_4_ = fStack_304;
            auVar149 = _local_400;
            if ((pGVar21->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              uVar144 = 0;
              auVar338 = ZEXT3264(local_7c0);
              auVar372 = ZEXT3264(_local_640);
            }
            else {
              auVar338 = ZEXT3264(local_7c0);
              auVar372 = ZEXT3264(_local_640);
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (uVar144 = CONCAT71((int7)(uVar144 >> 8),1),
                 pGVar21->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar192._0_4_ = 1.0 / local_500;
                auVar192._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar249 = vshufps_avx(auVar192,auVar192,0);
                local_260[0] = auVar249._0_4_ * ((float)local_1c0._0_4_ + 0.0);
                local_260[1] = auVar249._4_4_ * ((float)local_1c0._4_4_ + 1.0);
                local_260[2] = auVar249._8_4_ * (fStack_1b8 + 2.0);
                local_260[3] = auVar249._12_4_ * (fStack_1b4 + 3.0);
                fStack_250 = auVar249._0_4_ * (fStack_1b0 + 4.0);
                fStack_24c = auVar249._4_4_ * (fStack_1ac + 5.0);
                fStack_248 = auVar249._8_4_ * (fStack_1a8 + 6.0);
                fStack_244 = fStack_1a4 + 7.0;
                uStack_3f0 = auVar137._16_8_;
                uStack_3e8 = auVar149._24_8_;
                local_240 = local_400;
                uStack_238 = uStack_3f8;
                uStack_230 = uStack_3f0;
                uStack_228 = uStack_3e8;
                local_220 = local_740;
                iVar139 = vmovmskps_avx(local_280);
                local_840 = (undefined1  [8])CONCAT44((int)((ulong)context->args >> 0x20),iVar139);
                lVar141 = 0;
                if (local_840 != (undefined1  [8])0x0) {
                  for (; ((ulong)local_840 >> lVar141 & 1) == 0; lVar141 = lVar141 + 1) {
                  }
                }
                uVar144 = CONCAT71((int7)(uVar144 >> 8),iVar139 != 0);
                _local_400 = auVar149;
                if (iVar139 != 0) {
                  _local_6a0 = vshufps_avx(ZEXT416(uVar138),ZEXT416(uVar138),0);
                  _auStack_690 = auVar25._16_16_;
                  _local_6c0 = vshufps_avx(ZEXT416(uVar19),ZEXT416(uVar19),0);
                  _auStack_6b0 = auVar210._16_16_;
                  _local_700 = local_710;
                  local_7a0 = local_720._0_4_;
                  fStack_79c = local_720._4_4_;
                  fStack_798 = local_720._8_4_;
                  fStack_794 = local_720._12_4_;
                  _local_5e0 = local_580;
                  local_540 = *local_678;
                  _local_380 = *pauVar3;
                  local_300 = local_740;
                  local_2dc = uVar20;
                  local_2c0 = local_710._0_8_;
                  local_2b0 = local_720;
                  local_2a0 = local_580;
                  do {
                    auVar283 = *(undefined1 (*) [4])(ray + k * 4 + 0x80);
                    local_480 = local_260[lVar141];
                    local_760._0_8_ = lVar141;
                    local_470 = *(undefined4 *)((long)&local_240 + lVar141 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_220 + lVar141 * 4);
                    fVar256 = 1.0 - local_480;
                    fVar244 = local_480 * fVar256 * 4.0;
                    auVar275 = ZEXT464(0x3f000000);
                    auVar249 = ZEXT416((uint)(local_480 * local_480 * 0.5));
                    auVar249 = vshufps_avx(auVar249,auVar249,0);
                    auVar195 = ZEXT416((uint)((fVar256 * fVar256 + fVar244) * 0.5));
                    auVar195 = vshufps_avx(auVar195,auVar195,0);
                    auVar228 = ZEXT416((uint)((-local_480 * local_480 - fVar244) * 0.5));
                    auVar228 = vshufps_avx(auVar228,auVar228,0);
                    local_670.context = context->user;
                    auVar207 = ZEXT416((uint)(fVar256 * -fVar256 * 0.5));
                    auVar207 = vshufps_avx(auVar207,auVar207,0);
                    auVar193._0_4_ =
                         fVar258 * auVar207._0_4_ +
                         auVar228._0_4_ * (float)local_700._0_4_ +
                         auVar249._0_4_ * (float)local_5e0._0_4_ + auVar195._0_4_ * local_7a0;
                    auVar193._4_4_ =
                         fVar260 * auVar207._4_4_ +
                         auVar228._4_4_ * (float)local_700._4_4_ +
                         auVar249._4_4_ * (float)local_5e0._4_4_ + auVar195._4_4_ * fStack_79c;
                    auVar193._8_4_ =
                         fVar264 * auVar207._8_4_ +
                         auVar228._8_4_ * fStack_6f8 +
                         auVar249._8_4_ * fStack_5d8 + auVar195._8_4_ * fStack_798;
                    auVar193._12_4_ =
                         fVar205 * auVar207._12_4_ +
                         auVar228._12_4_ * fStack_6f4 +
                         auVar249._12_4_ * fStack_5d4 + auVar195._12_4_ * fStack_794;
                    local_4b0 = (RTCHitN  [16])vshufps_avx(auVar193,auVar193,0);
                    local_4a0 = vshufps_avx(auVar193,auVar193,0x55);
                    local_490 = vshufps_avx(auVar193,auVar193,0xaa);
                    local_460 = local_6c0;
                    uStack_458 = uStack_6b8;
                    local_450 = local_6a0;
                    uStack_448 = uStack_698;
                    vcmpps_avx(auVar159._0_32_,auVar159._0_32_,0xf);
                    uStack_43c = (local_670.context)->instID[0];
                    local_440 = uStack_43c;
                    uStack_438 = uStack_43c;
                    uStack_434 = uStack_43c;
                    uStack_430 = (local_670.context)->instPrimID[0];
                    uStack_42c = uStack_430;
                    uStack_428 = uStack_430;
                    uStack_424 = uStack_430;
                    local_7e0 = local_540._0_8_;
                    uStack_7d8 = local_540._8_8_;
                    local_670.valid = (int *)&local_7e0;
                    local_670.geometryUserPtr = pGVar21->userPtr;
                    local_670.hit = local_4b0;
                    local_670.N = 4;
                    local_6e0._0_4_ = (int)uVar144;
                    local_780 = auVar283;
                    auVar149 = auVar215._0_32_;
                    local_670.ray = (RTCRayN *)ray;
                    fStack_47c = local_480;
                    fStack_478 = local_480;
                    fStack_474 = local_480;
                    uStack_46c = local_470;
                    uStack_468 = local_470;
                    uStack_464 = local_470;
                    if (pGVar21->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar275 = ZEXT1664(auVar275._0_16_);
                      (*pGVar21->occlusionFilterN)(&local_670);
                      uVar144 = (ulong)(uint)local_6e0._0_4_;
                      auVar372 = ZEXT3264(_local_640);
                      auVar338 = ZEXT3264(local_7c0);
                      auVar159 = ZEXT1664(ZEXT816(0) << 0x40);
                      auVar149 = local_740;
                      auVar283 = local_780;
                    }
                    auVar215 = ZEXT3264(auVar149);
                    auVar122._8_8_ = uStack_7d8;
                    auVar122._0_8_ = local_7e0;
                    if (auVar122 == (undefined1  [16])0x0) {
                      auVar249 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                      auVar249 = auVar249 ^ _DAT_01febe20;
                    }
                    else {
                      p_Var23 = context->args->filter;
                      if ((p_Var23 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar21->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar275 = ZEXT1664(auVar275._0_16_);
                        (*p_Var23)(&local_670);
                        uVar144 = (ulong)(uint)local_6e0._0_4_;
                        auVar372 = ZEXT3264(_local_640);
                        auVar338 = ZEXT3264(local_7c0);
                        auVar215 = ZEXT3264(local_740);
                        auVar159 = ZEXT1664(ZEXT816(0) << 0x40);
                        auVar283 = local_780;
                      }
                      auVar123._8_8_ = uStack_7d8;
                      auVar123._0_8_ = local_7e0;
                      auVar195 = vpcmpeqd_avx((undefined1  [16])0x0,auVar123);
                      auVar249 = auVar195 ^ _DAT_01febe20;
                      auVar194._8_4_ = 0xff800000;
                      auVar194._0_8_ = 0xff800000ff800000;
                      auVar194._12_4_ = 0xff800000;
                      auVar195 = vblendvps_avx(auVar194,*(undefined1 (*) [16])(local_670.ray + 0x80)
                                               ,auVar195);
                      *(undefined1 (*) [16])(local_670.ray + 0x80) = auVar195;
                    }
                    auVar178._8_8_ = 0x100000001;
                    auVar178._0_8_ = 0x100000001;
                    if ((auVar178 & auVar249) != (undefined1  [16])0x0) break;
                    *(undefined1 (*) [4])(ray + k * 4 + 0x80) = auVar283;
                    local_840 = (undefined1  [8])((ulong)local_840 ^ 1L << (local_760._0_8_ & 0x3f))
                    ;
                    lVar141 = 0;
                    if (local_840 != (undefined1  [8])0x0) {
                      for (; ((ulong)local_840 >> lVar141 & 1) == 0; lVar141 = lVar141 + 1) {
                      }
                    }
                    uVar144 = CONCAT71((int7)(uVar144 >> 8),local_840 != (undefined1  [8])0x0);
                  } while (local_840 != (undefined1  [8])0x0);
                }
                uVar144 = uVar144 & 0xffffffffffffff01;
              }
            }
            auVar195 = local_620._0_16_;
          }
        }
      }
      if (8 < (int)uVar20) {
        local_540 = vpshufd_avx(ZEXT416(uVar20),0);
        auVar249 = vshufps_avx(auVar195,auVar195,0);
        local_3c0._16_16_ = auVar249;
        local_3c0._0_16_ = auVar249;
        auVar249 = vpermilps_avx(ZEXT416(uVar9),0);
        register0x00001210 = auVar249;
        _local_3e0 = auVar249;
        auVar148._0_4_ = 1.0 / local_500;
        auVar148._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar249 = vshufps_avx(auVar148,auVar148,0);
        register0x00001210 = auVar249;
        _local_100 = auVar249;
        local_350 = vshufps_avx(ZEXT416((uint)local_7c8),ZEXT416((uint)local_7c8),0);
        local_5b0 = vshufps_avx(ZEXT416((uint)local_5b0._0_4_),ZEXT416((uint)local_5b0._0_4_),0);
        auVar159 = ZEXT1664(local_5b0);
        lVar141 = 8;
        local_740 = auVar215._0_32_;
        _local_640 = auVar372._0_32_;
        fVar244 = (float)local_5a0._0_4_;
        fVar256 = (float)local_5a0._4_4_;
        fVar262 = fStack_598;
        fVar263 = fStack_594;
        fVar216 = fStack_590;
        fVar217 = fStack_58c;
        fVar218 = fStack_588;
        fVar219 = fStack_584;
        do {
          pauVar1 = (undefined1 (*) [28])(bspline_basis0 + lVar141 * 4 + lVar142);
          fVar221 = *(float *)*pauVar1;
          fVar223 = *(float *)(*pauVar1 + 4);
          fVar225 = *(float *)(*pauVar1 + 8);
          fVar235 = *(float *)(*pauVar1 + 0xc);
          fVar237 = *(float *)(*pauVar1 + 0x10);
          fVar239 = *(float *)(*pauVar1 + 0x14);
          fVar241 = *(float *)(*pauVar1 + 0x18);
          auVar134 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar142 + 0x222bfac + lVar141 * 4);
          fVar242 = *(float *)*pauVar1;
          fVar243 = *(float *)(*pauVar1 + 4);
          fVar282 = *(float *)(*pauVar1 + 8);
          fVar346 = *(float *)(*pauVar1 + 0xc);
          fVar220 = *(float *)(*pauVar1 + 0x10);
          fVar348 = *(float *)(*pauVar1 + 0x14);
          fVar347 = *(float *)(*pauVar1 + 0x18);
          auVar133 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar142 + 0x222c430 + lVar141 * 4);
          fVar300 = *(float *)*pauVar1;
          fVar222 = *(float *)(*pauVar1 + 4);
          fVar342 = *(float *)(*pauVar1 + 8);
          fVar306 = *(float *)(*pauVar1 + 0xc);
          fVar307 = *(float *)(*pauVar1 + 0x10);
          fVar224 = *(float *)(*pauVar1 + 0x14);
          fVar308 = *(float *)(*pauVar1 + 0x18);
          auVar132 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar142 + 0x222c8b4 + lVar141 * 4);
          fVar343 = *(float *)*pauVar1;
          fVar160 = *(float *)(*pauVar1 + 4);
          fVar163 = *(float *)(*pauVar1 + 8);
          fVar190 = *(float *)(*pauVar1 + 0xc);
          fVar168 = *(float *)(*pauVar1 + 0x10);
          fVar170 = *(float *)(*pauVar1 + 0x14);
          fVar172 = *(float *)(*pauVar1 + 0x18);
          auVar131 = *pauVar1;
          fVar280 = auVar215._28_4_;
          fVar309 = auVar338._0_4_;
          fVar310 = auVar338._4_4_;
          fVar311 = auVar338._8_4_;
          fVar265 = auVar338._12_4_;
          fVar276 = auVar338._16_4_;
          fVar277 = auVar338._20_4_;
          fVar278 = auVar338._24_4_;
          fVar204 = fVar280 + *(float *)pauVar1[1];
          fVar174 = fVar280 + fVar280 + auVar159._28_4_;
          local_620._0_4_ =
               (float)local_c0._0_4_ * fVar221 +
               auVar372._0_4_ * fVar242 + fVar300 * fVar244 + (float)local_4e0._0_4_ * fVar343;
          local_620._4_4_ =
               (float)local_c0._4_4_ * fVar223 +
               auVar372._4_4_ * fVar243 + fVar222 * fVar256 + (float)local_4e0._4_4_ * fVar160;
          local_620._8_4_ =
               fStack_b8 * fVar225 +
               auVar372._8_4_ * fVar282 + fVar342 * fVar262 + fStack_4d8 * fVar163;
          local_620._12_4_ =
               fStack_b4 * fVar235 +
               auVar372._12_4_ * fVar346 + fVar306 * fVar263 + fStack_4d4 * fVar190;
          local_620._16_4_ =
               fStack_b0 * fVar237 +
               auVar372._16_4_ * fVar220 + fVar307 * fVar216 + fStack_4d0 * fVar168;
          local_620._20_4_ =
               fStack_ac * fVar239 +
               auVar372._20_4_ * fVar348 + fVar224 * fVar217 + fStack_4cc * fVar170;
          local_620._24_4_ =
               fStack_a8 * fVar241 +
               auVar372._24_4_ * fVar347 + fVar308 * fVar218 + fStack_4c8 * fVar172;
          local_620._28_4_ = fVar204 + fVar174;
          auVar203._0_4_ =
               (float)local_140._0_4_ * fVar221 +
               fVar226 * fVar242 + fVar309 * fVar300 + fVar245 * fVar343;
          auVar203._4_4_ =
               (float)local_140._4_4_ * fVar223 +
               fVar236 * fVar243 + fVar310 * fVar222 + fVar257 * fVar160;
          auVar203._8_4_ =
               fStack_138 * fVar225 + fVar238 * fVar282 + fVar311 * fVar342 + fVar259 * fVar163;
          auVar203._12_4_ =
               fStack_134 * fVar235 + fVar240 * fVar346 + fVar265 * fVar306 + fVar261 * fVar190;
          auVar203._16_4_ =
               fStack_130 * fVar237 + fVar226 * fVar220 + fVar276 * fVar307 + fVar245 * fVar168;
          auVar203._20_4_ =
               fStack_12c * fVar239 + fVar236 * fVar348 + fVar277 * fVar224 + fVar257 * fVar170;
          auVar203._24_4_ =
               fStack_128 * fVar241 + fVar238 * fVar347 + fVar278 * fVar308 + fVar259 * fVar172;
          auVar203._28_4_ = fVar174 + fVar280 + fVar280 + auVar275._28_4_;
          fVar146 = fVar221 * (float)local_180._0_4_ +
                    (float)local_a0._0_4_ * fVar242 +
                    (float)local_120._0_4_ * fVar300 + fVar343 * (float)local_160._0_4_;
          fVar161 = fVar223 * (float)local_180._4_4_ +
                    (float)local_a0._4_4_ * fVar243 +
                    (float)local_120._4_4_ * fVar222 + fVar160 * (float)local_160._4_4_;
          fVar164 = fVar225 * fStack_178 +
                    fStack_98 * fVar282 + fStack_118 * fVar342 + fVar163 * fStack_158;
          fVar166 = fVar235 * fStack_174 +
                    fStack_94 * fVar346 + fStack_114 * fVar306 + fVar190 * fStack_154;
          fVar169 = fVar237 * fStack_170 +
                    fStack_90 * fVar220 + fStack_110 * fVar307 + fVar168 * fStack_150;
          fVar171 = fVar239 * fStack_16c +
                    fStack_8c * fVar348 + fStack_10c * fVar224 + fVar170 * fStack_14c;
          fVar173 = fVar241 * fStack_168 +
                    fStack_88 * fVar347 + fStack_108 * fVar308 + fVar172 * fStack_148;
          fVar174 = fVar174 + fVar280 + fVar204;
          pfVar2 = (float *)(bspline_basis1 + lVar141 * 4 + lVar142);
          fVar221 = *pfVar2;
          fVar223 = pfVar2[1];
          fVar225 = pfVar2[2];
          fVar235 = pfVar2[3];
          fVar237 = pfVar2[4];
          fVar239 = pfVar2[5];
          fVar241 = pfVar2[6];
          pauVar1 = (undefined1 (*) [28])(lVar142 + 0x222e3cc + lVar141 * 4);
          fVar242 = *(float *)*pauVar1;
          fVar243 = *(float *)(*pauVar1 + 4);
          fVar282 = *(float *)(*pauVar1 + 8);
          fVar346 = *(float *)(*pauVar1 + 0xc);
          fVar220 = *(float *)(*pauVar1 + 0x10);
          fVar348 = *(float *)(*pauVar1 + 0x14);
          fVar347 = *(float *)(*pauVar1 + 0x18);
          auVar136 = *pauVar1;
          pfVar4 = (float *)(lVar142 + 0x222e850 + lVar141 * 4);
          fVar300 = *pfVar4;
          fVar222 = pfVar4[1];
          fVar342 = pfVar4[2];
          fVar306 = pfVar4[3];
          fVar307 = pfVar4[4];
          fVar224 = pfVar4[5];
          fVar308 = pfVar4[6];
          pauVar1 = (undefined1 (*) [28])(lVar142 + 0x222ecd4 + lVar141 * 4);
          fVar343 = *(float *)*pauVar1;
          fVar160 = *(float *)(*pauVar1 + 4);
          fVar163 = *(float *)(*pauVar1 + 8);
          fVar190 = *(float *)(*pauVar1 + 0xc);
          fVar168 = *(float *)(*pauVar1 + 0x10);
          fVar170 = *(float *)(*pauVar1 + 0x14);
          fVar172 = *(float *)(*pauVar1 + 0x18);
          auVar135 = *pauVar1;
          fVar280 = fVar219 + *(float *)pauVar1[1];
          fVar204 = fVar219 + fVar219 + fStack_4c4;
          auVar362._0_4_ =
               (float)local_c0._0_4_ * fVar221 +
               auVar372._0_4_ * fVar242 + fVar244 * fVar300 + (float)local_4e0._0_4_ * fVar343;
          auVar362._4_4_ =
               (float)local_c0._4_4_ * fVar223 +
               auVar372._4_4_ * fVar243 + fVar256 * fVar222 + (float)local_4e0._4_4_ * fVar160;
          auVar362._8_4_ =
               fStack_b8 * fVar225 +
               auVar372._8_4_ * fVar282 + fVar262 * fVar342 + fStack_4d8 * fVar163;
          auVar362._12_4_ =
               fStack_b4 * fVar235 +
               auVar372._12_4_ * fVar346 + fVar263 * fVar306 + fStack_4d4 * fVar190;
          auVar362._16_4_ =
               fStack_b0 * fVar237 +
               auVar372._16_4_ * fVar220 + fVar216 * fVar307 + fStack_4d0 * fVar168;
          auVar362._20_4_ =
               fStack_ac * fVar239 +
               auVar372._20_4_ * fVar348 + fVar217 * fVar224 + fStack_4cc * fVar170;
          auVar362._24_4_ =
               fStack_a8 * fVar241 +
               auVar372._24_4_ * fVar347 + fVar218 * fVar308 + fStack_4c8 * fVar172;
          auVar362._28_4_ = fVar280 + fVar204;
          auVar254._0_4_ =
               (float)local_140._0_4_ * fVar221 +
               fVar226 * fVar242 + fVar309 * fVar300 + fVar245 * fVar343;
          auVar254._4_4_ =
               (float)local_140._4_4_ * fVar223 +
               fVar236 * fVar243 + fVar310 * fVar222 + fVar257 * fVar160;
          auVar254._8_4_ =
               fStack_138 * fVar225 + fVar238 * fVar282 + fVar311 * fVar342 + fVar259 * fVar163;
          auVar254._12_4_ =
               fStack_134 * fVar235 + fVar240 * fVar346 + fVar265 * fVar306 + fVar261 * fVar190;
          auVar254._16_4_ =
               fStack_130 * fVar237 + fVar226 * fVar220 + fVar276 * fVar307 + fVar245 * fVar168;
          auVar254._20_4_ =
               fStack_12c * fVar239 + fVar236 * fVar348 + fVar277 * fVar224 + fVar257 * fVar170;
          auVar254._24_4_ =
               fStack_128 * fVar241 + fVar238 * fVar347 + fVar278 * fVar308 + fVar259 * fVar172;
          auVar254._28_4_ = fVar204 + fVar219 + fVar219 + fVar261;
          auVar293._0_4_ =
               (float)local_a0._0_4_ * fVar242 +
               (float)local_120._0_4_ * fVar300 + fVar343 * (float)local_160._0_4_ +
               fVar221 * (float)local_180._0_4_;
          auVar293._4_4_ =
               (float)local_a0._4_4_ * fVar243 +
               (float)local_120._4_4_ * fVar222 + fVar160 * (float)local_160._4_4_ +
               fVar223 * (float)local_180._4_4_;
          auVar293._8_4_ =
               fStack_98 * fVar282 + fStack_118 * fVar342 + fVar163 * fStack_158 +
               fVar225 * fStack_178;
          auVar293._12_4_ =
               fStack_94 * fVar346 + fStack_114 * fVar306 + fVar190 * fStack_154 +
               fVar235 * fStack_174;
          auVar293._16_4_ =
               fStack_90 * fVar220 + fStack_110 * fVar307 + fVar168 * fStack_150 +
               fVar237 * fStack_170;
          auVar293._20_4_ =
               fStack_8c * fVar348 + fStack_10c * fVar224 + fVar170 * fStack_14c +
               fVar239 * fStack_16c;
          auVar293._24_4_ =
               fStack_88 * fVar347 + fStack_108 * fVar308 + fVar172 * fStack_148 +
               fVar241 * fStack_168;
          auVar293._28_4_ = fVar219 + fVar280 + fVar204;
          auVar25 = vsubps_avx(auVar362,local_620);
          auVar26 = vsubps_avx(auVar254,auVar203);
          fVar219 = auVar25._0_4_;
          fVar242 = auVar25._4_4_;
          auVar76._4_4_ = fVar242 * auVar203._4_4_;
          auVar76._0_4_ = fVar219 * auVar203._0_4_;
          fVar243 = auVar25._8_4_;
          auVar76._8_4_ = fVar243 * auVar203._8_4_;
          fVar282 = auVar25._12_4_;
          auVar76._12_4_ = fVar282 * auVar203._12_4_;
          fVar346 = auVar25._16_4_;
          auVar76._16_4_ = fVar346 * auVar203._16_4_;
          fVar220 = auVar25._20_4_;
          auVar76._20_4_ = fVar220 * auVar203._20_4_;
          fVar348 = auVar25._24_4_;
          auVar76._24_4_ = fVar348 * auVar203._24_4_;
          auVar76._28_4_ = fVar204;
          fVar244 = auVar26._0_4_;
          fVar256 = auVar26._4_4_;
          auVar77._4_4_ = local_620._4_4_ * fVar256;
          auVar77._0_4_ = (float)local_620._0_4_ * fVar244;
          fVar262 = auVar26._8_4_;
          auVar77._8_4_ = local_620._8_4_ * fVar262;
          fVar263 = auVar26._12_4_;
          auVar77._12_4_ = local_620._12_4_ * fVar263;
          fVar216 = auVar26._16_4_;
          auVar77._16_4_ = local_620._16_4_ * fVar216;
          fVar217 = auVar26._20_4_;
          auVar77._20_4_ = local_620._20_4_ * fVar217;
          fVar218 = auVar26._24_4_;
          auVar77._24_4_ = local_620._24_4_ * fVar218;
          auVar77._28_4_ = auVar254._28_4_;
          auVar27 = vsubps_avx(auVar76,auVar77);
          auVar121._4_4_ = fVar161;
          auVar121._0_4_ = fVar146;
          auVar121._8_4_ = fVar164;
          auVar121._12_4_ = fVar166;
          auVar121._16_4_ = fVar169;
          auVar121._20_4_ = fVar171;
          auVar121._24_4_ = fVar173;
          auVar121._28_4_ = fVar174;
          auVar159 = ZEXT3264(auVar121);
          auVar149 = vmaxps_avx(auVar121,auVar293);
          auVar78._4_4_ = auVar149._4_4_ * auVar149._4_4_ * (fVar242 * fVar242 + fVar256 * fVar256);
          auVar78._0_4_ = auVar149._0_4_ * auVar149._0_4_ * (fVar219 * fVar219 + fVar244 * fVar244);
          auVar78._8_4_ = auVar149._8_4_ * auVar149._8_4_ * (fVar243 * fVar243 + fVar262 * fVar262);
          auVar78._12_4_ =
               auVar149._12_4_ * auVar149._12_4_ * (fVar282 * fVar282 + fVar263 * fVar263);
          auVar78._16_4_ =
               auVar149._16_4_ * auVar149._16_4_ * (fVar346 * fVar346 + fVar216 * fVar216);
          auVar78._20_4_ =
               auVar149._20_4_ * auVar149._20_4_ * (fVar220 * fVar220 + fVar217 * fVar217);
          auVar78._24_4_ =
               auVar149._24_4_ * auVar149._24_4_ * (fVar348 * fVar348 + fVar218 * fVar218);
          auVar78._28_4_ = fVar280 + auVar254._28_4_;
          auVar79._4_4_ = auVar27._4_4_ * auVar27._4_4_;
          auVar79._0_4_ = auVar27._0_4_ * auVar27._0_4_;
          auVar79._8_4_ = auVar27._8_4_ * auVar27._8_4_;
          auVar79._12_4_ = auVar27._12_4_ * auVar27._12_4_;
          auVar79._16_4_ = auVar27._16_4_ * auVar27._16_4_;
          auVar79._20_4_ = auVar27._20_4_ * auVar27._20_4_;
          auVar79._24_4_ = auVar27._24_4_ * auVar27._24_4_;
          auVar79._28_4_ = auVar27._28_4_;
          auVar149 = vcmpps_avx(auVar79,auVar78,2);
          local_2e0 = (uint)lVar141;
          auVar195 = vpshufd_avx(ZEXT416(local_2e0),0);
          auVar249 = vpor_avx(auVar195,_DAT_01ff0cf0);
          auVar195 = vpor_avx(auVar195,_DAT_02020ea0);
          auVar249 = vpcmpgtd_avx(local_540,auVar249);
          auVar275 = ZEXT1664(auVar249);
          auVar195 = vpcmpgtd_avx(local_540,auVar195);
          register0x000012d0 = auVar195;
          _local_380 = auVar249;
          auVar27 = _local_380 & auVar149;
          fVar244 = (float)local_5a0._0_4_;
          fVar256 = (float)local_5a0._4_4_;
          fVar262 = fStack_598;
          fVar263 = fStack_594;
          fVar216 = fStack_590;
          fVar217 = fStack_58c;
          fVar218 = fStack_588;
          fVar219 = fStack_584;
          if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar27 >> 0x7f,0) == '\0') &&
                (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar27 >> 0xbf,0) == '\0') &&
              (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar27[0x1f]) {
            auVar215 = ZEXT3264(local_740);
            auVar338 = ZEXT3264(auVar338._0_32_);
            auVar372 = ZEXT3264(_local_640);
          }
          else {
            local_700._0_4_ = auVar136._0_4_;
            local_700._4_4_ = auVar136._4_4_;
            fStack_6f8 = auVar136._8_4_;
            fStack_6f4 = auVar136._12_4_;
            auStack_6f0._0_4_ = auVar136._16_4_;
            auStack_6f0._4_4_ = auVar136._20_4_;
            fStack_6e8 = auVar136._24_4_;
            local_5e0._0_4_ = auVar135._0_4_;
            local_5e0._4_4_ = auVar135._4_4_;
            fStack_5d8 = auVar135._8_4_;
            fStack_5d4 = auVar135._12_4_;
            fStack_5d0 = auVar135._16_4_;
            fStack_5cc = auVar135._20_4_;
            fStack_5c8 = auVar135._24_4_;
            fVar280 = fVar221 * (float)local_1a0._0_4_ +
                      (float)local_520._0_4_ * (float)local_700._0_4_ +
                      (float)local_e0._0_4_ * fVar300 +
                      (float)local_600._0_4_ * (float)local_5e0._0_4_;
            fVar162 = fVar223 * (float)local_1a0._4_4_ +
                      (float)local_520._4_4_ * (float)local_700._4_4_ +
                      (float)local_e0._4_4_ * fVar222 +
                      (float)local_600._4_4_ * (float)local_5e0._4_4_;
            fVar165 = fVar225 * fStack_198 +
                      fStack_518 * fStack_6f8 + fStack_d8 * fVar342 + fStack_5f8 * fStack_5d8;
            fVar167 = fVar235 * fStack_194 +
                      fStack_514 * fStack_6f4 + fStack_d4 * fVar306 + fStack_5f4 * fStack_5d4;
            fStack_790 = fVar237 * fStack_190 +
                         fStack_510 * (float)auStack_6f0._0_4_ +
                         fStack_d0 * fVar307 + fStack_5f0 * fStack_5d0;
            fStack_78c = fVar239 * fStack_18c +
                         fStack_50c * (float)auStack_6f0._4_4_ +
                         fStack_cc * fVar224 + fStack_5ec * fStack_5cc;
            fStack_788 = fVar241 * fStack_188 +
                         fStack_508 * fStack_6e8 + fStack_c8 * fVar308 + fStack_5e8 * fStack_5c8;
            fStack_784 = pfVar2[7] + fVar174 + pfVar4[7] + 0.0;
            local_780 = auVar133._0_4_;
            auStack_77c._0_4_ = auVar133._4_4_;
            auStack_77c._4_4_ = auVar133._8_4_;
            fStack_774 = auVar133._12_4_;
            fStack_770 = auVar133._16_4_;
            fStack_76c = auVar133._20_4_;
            fStack_768 = auVar133._24_4_;
            local_6a0._0_4_ = auVar132._0_4_;
            local_6a0._4_4_ = auVar132._4_4_;
            uStack_698._0_4_ = auVar132._8_4_;
            uStack_698._4_4_ = auVar132._12_4_;
            auStack_690._0_4_ = auVar132._16_4_;
            auStack_690._4_4_ = auVar132._20_4_;
            fStack_688 = auVar132._24_4_;
            local_6c0._0_4_ = auVar131._0_4_;
            local_6c0._4_4_ = auVar131._4_4_;
            uStack_6b8._0_4_ = auVar131._8_4_;
            uStack_6b8._4_4_ = auVar131._12_4_;
            auStack_6b0._0_4_ = auVar131._16_4_;
            auStack_6b0._4_4_ = auVar131._20_4_;
            fStack_6a8 = auVar131._24_4_;
            pfVar2 = (float *)(lVar142 + 0x222d640 + lVar141 * 4);
            fVar221 = *pfVar2;
            fVar223 = pfVar2[1];
            fVar225 = pfVar2[2];
            fVar235 = pfVar2[3];
            fVar237 = pfVar2[4];
            fVar239 = pfVar2[5];
            fVar241 = pfVar2[6];
            pfVar5 = (float *)(lVar142 + 0x222dac4 + lVar141 * 4);
            fVar242 = *pfVar5;
            fVar243 = pfVar5[1];
            fVar282 = pfVar5[2];
            fVar346 = pfVar5[3];
            fVar220 = pfVar5[4];
            fVar348 = pfVar5[5];
            fVar347 = pfVar5[6];
            pfVar6 = (float *)(lVar142 + 0x222d1bc + lVar141 * 4);
            fVar300 = *pfVar6;
            fVar222 = pfVar6[1];
            fVar342 = pfVar6[2];
            fVar306 = pfVar6[3];
            fVar307 = pfVar6[4];
            fVar224 = pfVar6[5];
            fVar308 = pfVar6[6];
            fVar204 = pfVar2[7] + pfVar5[7];
            fStack_4e4 = pfVar5[7] + local_620._28_4_ + 0.0;
            fVar281 = local_620._28_4_ + auVar362._28_4_ + local_620._28_4_ + 0.0;
            pfVar2 = (float *)(lVar142 + 0x222cd38 + lVar141 * 4);
            fVar343 = *pfVar2;
            fVar160 = pfVar2[1];
            fVar163 = pfVar2[2];
            fVar190 = pfVar2[3];
            fVar168 = pfVar2[4];
            fVar170 = pfVar2[5];
            fVar172 = pfVar2[6];
            local_3a0 = (float)local_c0._0_4_ * fVar343 +
                        fVar300 * (float)local_640._0_4_ +
                        (float)local_5a0._0_4_ * fVar221 + (float)local_4e0._0_4_ * fVar242;
            fStack_39c = (float)local_c0._4_4_ * fVar160 +
                         fVar222 * (float)local_640._4_4_ +
                         (float)local_5a0._4_4_ * fVar223 + (float)local_4e0._4_4_ * fVar243;
            fStack_398 = fStack_b8 * fVar163 +
                         fVar342 * fStack_638 + fStack_598 * fVar225 + fStack_4d8 * fVar282;
            fStack_394 = fStack_b4 * fVar190 +
                         fVar306 * fStack_634 + fStack_594 * fVar235 + fStack_4d4 * fVar346;
            fStack_390 = fStack_b0 * fVar168 +
                         fVar307 * fStack_630 + fStack_590 * fVar237 + fStack_4d0 * fVar220;
            fStack_38c = fStack_ac * fVar170 +
                         fVar224 * fStack_62c + fStack_58c * fVar239 + fStack_4cc * fVar348;
            fStack_388 = fStack_a8 * fVar172 +
                         fVar308 * fStack_628 + fStack_588 * fVar241 + fStack_4c8 * fVar347;
            fStack_384 = fVar204 + fStack_4e4;
            local_500 = (float)local_140._0_4_ * fVar343 +
                        fVar309 * fVar221 + fVar245 * fVar242 + fVar300 * fVar226;
            fStack_4fc = (float)local_140._4_4_ * fVar160 +
                         fVar310 * fVar223 + fVar257 * fVar243 + fVar222 * fVar236;
            fStack_4f8 = fStack_138 * fVar163 +
                         fVar311 * fVar225 + fVar259 * fVar282 + fVar342 * fVar238;
            fStack_4f4 = fStack_134 * fVar190 +
                         fVar265 * fVar235 + fVar261 * fVar346 + fVar306 * fVar240;
            fStack_4f0 = fStack_130 * fVar168 +
                         fVar276 * fVar237 + fVar245 * fVar220 + fVar307 * fVar226;
            fStack_4ec = fStack_12c * fVar170 +
                         fVar277 * fVar239 + fVar257 * fVar348 + fVar224 * fVar236;
            fStack_4e8 = fStack_128 * fVar172 +
                         fVar278 * fVar241 + fVar259 * fVar347 + fVar308 * fVar238;
            fStack_4e4 = fStack_4e4 + fVar281;
            auVar363._0_4_ =
                 fVar300 * (float)local_520._0_4_ +
                 (float)local_e0._0_4_ * fVar221 + (float)local_600._0_4_ * fVar242 +
                 fVar343 * (float)local_1a0._0_4_;
            auVar363._4_4_ =
                 fVar222 * (float)local_520._4_4_ +
                 (float)local_e0._4_4_ * fVar223 + (float)local_600._4_4_ * fVar243 +
                 fVar160 * (float)local_1a0._4_4_;
            auVar363._8_4_ =
                 fVar342 * fStack_518 + fStack_d8 * fVar225 + fStack_5f8 * fVar282 +
                 fVar163 * fStack_198;
            auVar363._12_4_ =
                 fVar306 * fStack_514 + fStack_d4 * fVar235 + fStack_5f4 * fVar346 +
                 fVar190 * fStack_194;
            auVar363._16_4_ =
                 fVar307 * fStack_510 + fStack_d0 * fVar237 + fStack_5f0 * fVar220 +
                 fVar168 * fStack_190;
            auVar363._20_4_ =
                 fVar224 * fStack_50c + fStack_cc * fVar239 + fStack_5ec * fVar348 +
                 fVar170 * fStack_18c;
            auVar363._24_4_ =
                 fVar308 * fStack_508 + fStack_c8 * fVar241 + fStack_5e8 * fVar347 +
                 fVar172 * fStack_188;
            auVar363._28_4_ = pfVar6[7] + fVar204 + fVar281;
            pfVar2 = (float *)(lVar142 + 0x222fa60 + lVar141 * 4);
            fVar223 = *pfVar2;
            fVar225 = pfVar2[1];
            fVar235 = pfVar2[2];
            fVar237 = pfVar2[3];
            fVar239 = pfVar2[4];
            fVar241 = pfVar2[5];
            fVar242 = pfVar2[6];
            pfVar5 = (float *)(lVar142 + 0x222fee4 + lVar141 * 4);
            fVar243 = *pfVar5;
            fVar282 = pfVar5[1];
            fVar346 = pfVar5[2];
            fVar220 = pfVar5[3];
            fVar348 = pfVar5[4];
            fVar347 = pfVar5[5];
            fVar300 = pfVar5[6];
            pfVar6 = (float *)(lVar142 + 0x222f5dc + lVar141 * 4);
            fVar222 = *pfVar6;
            fVar342 = pfVar6[1];
            fVar306 = pfVar6[2];
            fVar307 = pfVar6[3];
            fVar224 = pfVar6[4];
            fVar308 = pfVar6[5];
            fVar343 = pfVar6[6];
            fVar221 = auVar338._28_4_;
            pfVar7 = (float *)(lVar142 + 0x222f158 + lVar141 * 4);
            fVar160 = *pfVar7;
            fVar163 = pfVar7[1];
            fVar190 = pfVar7[2];
            fVar168 = pfVar7[3];
            fVar170 = pfVar7[4];
            fVar172 = pfVar7[5];
            fVar204 = pfVar7[6];
            auVar317._0_4_ =
                 (float)local_c0._0_4_ * fVar160 +
                 fVar222 * (float)local_640._0_4_ +
                 (float)local_5a0._0_4_ * fVar223 + (float)local_4e0._0_4_ * fVar243;
            auVar317._4_4_ =
                 (float)local_c0._4_4_ * fVar163 +
                 fVar342 * (float)local_640._4_4_ +
                 (float)local_5a0._4_4_ * fVar225 + (float)local_4e0._4_4_ * fVar282;
            auVar317._8_4_ =
                 fStack_b8 * fVar190 +
                 fVar306 * fStack_638 + fStack_598 * fVar235 + fStack_4d8 * fVar346;
            auVar317._12_4_ =
                 fStack_b4 * fVar168 +
                 fVar307 * fStack_634 + fStack_594 * fVar237 + fStack_4d4 * fVar220;
            auVar317._16_4_ =
                 fStack_b0 * fVar170 +
                 fVar224 * fStack_630 + fStack_590 * fVar239 + fStack_4d0 * fVar348;
            auVar317._20_4_ =
                 fStack_ac * fVar172 +
                 fVar308 * fStack_62c + fStack_58c * fVar241 + fStack_4cc * fVar347;
            auVar317._24_4_ =
                 fStack_a8 * fVar204 +
                 fVar343 * fStack_628 + fStack_588 * fVar242 + fStack_4c8 * fVar300;
            auVar317._28_4_ = fVar221 + fVar221 + fStack_4c4 + fStack_4e4;
            auVar354._0_4_ =
                 fVar160 * (float)local_140._0_4_ +
                 fVar222 * fVar226 + fVar309 * fVar223 + fVar243 * fVar245;
            auVar354._4_4_ =
                 fVar163 * (float)local_140._4_4_ +
                 fVar342 * fVar236 + fVar310 * fVar225 + fVar282 * fVar257;
            auVar354._8_4_ =
                 fVar190 * fStack_138 + fVar306 * fVar238 + fVar311 * fVar235 + fVar346 * fVar259;
            auVar354._12_4_ =
                 fVar168 * fStack_134 + fVar307 * fVar240 + fVar265 * fVar237 + fVar220 * fVar261;
            auVar354._16_4_ =
                 fVar170 * fStack_130 + fVar224 * fVar226 + fVar276 * fVar239 + fVar348 * fVar245;
            auVar354._20_4_ =
                 fVar172 * fStack_12c + fVar308 * fVar236 + fVar277 * fVar241 + fVar347 * fVar257;
            auVar354._24_4_ =
                 fVar204 * fStack_128 + fVar343 * fVar238 + fVar278 * fVar242 + fVar300 * fVar259;
            auVar354._28_4_ = fVar221 + fVar221 + fStack_124 + fStack_4e4;
            auVar255._8_4_ = 0x7fffffff;
            auVar255._0_8_ = 0x7fffffff7fffffff;
            auVar255._12_4_ = 0x7fffffff;
            auVar255._16_4_ = 0x7fffffff;
            auVar255._20_4_ = 0x7fffffff;
            auVar255._24_4_ = 0x7fffffff;
            auVar255._28_4_ = 0x7fffffff;
            auVar130._4_4_ = fStack_39c;
            auVar130._0_4_ = local_3a0;
            auVar130._8_4_ = fStack_398;
            auVar130._12_4_ = fStack_394;
            auVar130._16_4_ = fStack_390;
            auVar130._20_4_ = fStack_38c;
            auVar130._24_4_ = fStack_388;
            auVar130._28_4_ = fStack_384;
            auVar27 = vandps_avx(auVar130,auVar255);
            auVar129._4_4_ = fStack_4fc;
            auVar129._0_4_ = local_500;
            auVar129._8_4_ = fStack_4f8;
            auVar129._12_4_ = fStack_4f4;
            auVar129._16_4_ = fStack_4f0;
            auVar129._20_4_ = fStack_4ec;
            auVar129._24_4_ = fStack_4e8;
            auVar129._28_4_ = fStack_4e4;
            auVar28 = vandps_avx(auVar129,auVar255);
            auVar28 = vmaxps_avx(auVar27,auVar28);
            auVar27 = vandps_avx(auVar363,auVar255);
            auVar28 = vmaxps_avx(auVar28,auVar27);
            auVar28 = vcmpps_avx(auVar28,local_3c0,1);
            auVar29 = vblendvps_avx(auVar130,auVar25,auVar28);
            auVar156._0_4_ =
                 fVar160 * (float)local_1a0._0_4_ +
                 fVar222 * (float)local_520._0_4_ +
                 fVar243 * (float)local_600._0_4_ + (float)local_e0._0_4_ * fVar223;
            auVar156._4_4_ =
                 fVar163 * (float)local_1a0._4_4_ +
                 fVar342 * (float)local_520._4_4_ +
                 fVar282 * (float)local_600._4_4_ + (float)local_e0._4_4_ * fVar225;
            auVar156._8_4_ =
                 fVar190 * fStack_198 +
                 fVar306 * fStack_518 + fVar346 * fStack_5f8 + fStack_d8 * fVar235;
            auVar156._12_4_ =
                 fVar168 * fStack_194 +
                 fVar307 * fStack_514 + fVar220 * fStack_5f4 + fStack_d4 * fVar237;
            auVar156._16_4_ =
                 fVar170 * fStack_190 +
                 fVar224 * fStack_510 + fVar348 * fStack_5f0 + fStack_d0 * fVar239;
            auVar156._20_4_ =
                 fVar172 * fStack_18c +
                 fVar308 * fStack_50c + fVar347 * fStack_5ec + fStack_cc * fVar241;
            auVar156._24_4_ =
                 fVar204 * fStack_188 +
                 fVar343 * fStack_508 + fVar300 * fStack_5e8 + fStack_c8 * fVar242;
            auVar156._28_4_ = auVar27._28_4_ + pfVar6[7] + pfVar5[7] + pfVar2[7];
            auVar30 = vblendvps_avx(auVar129,auVar26,auVar28);
            auVar27 = vandps_avx(auVar317,auVar255);
            auVar28 = vandps_avx(auVar354,auVar255);
            auVar31 = vmaxps_avx(auVar27,auVar28);
            auVar27 = vandps_avx(auVar156,auVar255);
            auVar27 = vmaxps_avx(auVar31,auVar27);
            local_6e0._0_4_ = auVar134._0_4_;
            local_6e0._4_4_ = auVar134._4_4_;
            fStack_6d8 = auVar134._8_4_;
            fStack_6d4 = auVar134._12_4_;
            auStack_6d0._0_4_ = auVar134._16_4_;
            auStack_6d0._4_4_ = auVar134._20_4_;
            fStack_6c8 = auVar134._24_4_;
            auVar28 = vcmpps_avx(auVar27,local_3c0,1);
            auVar27 = vblendvps_avx(auVar317,auVar25,auVar28);
            auVar157._0_4_ =
                 (float)local_1a0._0_4_ * (float)local_6e0._0_4_ +
                 (float)local_520._0_4_ * (float)local_780 +
                 (float)local_e0._0_4_ * (float)local_6a0._0_4_ +
                 (float)local_600._0_4_ * (float)local_6c0._0_4_;
            auVar157._4_4_ =
                 (float)local_1a0._4_4_ * (float)local_6e0._4_4_ +
                 (float)local_520._4_4_ * (float)auStack_77c._0_4_ +
                 (float)local_e0._4_4_ * (float)local_6a0._4_4_ +
                 (float)local_600._4_4_ * (float)local_6c0._4_4_;
            auVar157._8_4_ =
                 fStack_198 * fStack_6d8 +
                 fStack_518 * (float)auStack_77c._4_4_ +
                 fStack_d8 * (float)uStack_698 + fStack_5f8 * (float)uStack_6b8;
            auVar157._12_4_ =
                 fStack_194 * fStack_6d4 +
                 fStack_514 * fStack_774 +
                 fStack_d4 * uStack_698._4_4_ + fStack_5f4 * uStack_6b8._4_4_;
            auVar157._16_4_ =
                 fStack_190 * (float)auStack_6d0._0_4_ +
                 fStack_510 * fStack_770 +
                 fStack_d0 * (float)auStack_690._0_4_ + fStack_5f0 * (float)auStack_6b0._0_4_;
            auVar157._20_4_ =
                 fStack_18c * (float)auStack_6d0._4_4_ +
                 fStack_50c * fStack_76c +
                 fStack_cc * (float)auStack_690._4_4_ + fStack_5ec * (float)auStack_6b0._4_4_;
            auVar157._24_4_ =
                 fStack_188 * fStack_6c8 +
                 fStack_508 * fStack_768 + fStack_c8 * fStack_688 + fStack_5e8 * fStack_6a8;
            auVar157._28_4_ = auVar31._28_4_ + fStack_784 + pfVar4[7] + 0.0;
            auVar28 = vblendvps_avx(auVar354,auVar26,auVar28);
            fVar278 = auVar29._0_4_;
            fVar281 = auVar29._4_4_;
            fVar319 = auVar29._8_4_;
            fVar322 = auVar29._12_4_;
            fVar323 = auVar29._16_4_;
            fVar326 = auVar29._20_4_;
            fVar333 = auVar29._24_4_;
            fVar339 = auVar29._28_4_;
            fVar300 = auVar27._0_4_;
            fVar342 = auVar27._4_4_;
            fVar307 = auVar27._8_4_;
            fVar308 = auVar27._12_4_;
            fVar160 = auVar27._16_4_;
            fVar190 = auVar27._20_4_;
            fVar170 = auVar27._24_4_;
            fVar221 = auVar30._0_4_;
            fVar225 = auVar30._4_4_;
            fVar237 = auVar30._8_4_;
            fVar241 = auVar30._12_4_;
            fVar243 = auVar30._16_4_;
            fVar346 = auVar30._20_4_;
            fVar348 = auVar30._24_4_;
            auVar336._0_4_ = fVar221 * fVar221 + fVar278 * fVar278;
            auVar336._4_4_ = fVar225 * fVar225 + fVar281 * fVar281;
            auVar336._8_4_ = fVar237 * fVar237 + fVar319 * fVar319;
            auVar336._12_4_ = fVar241 * fVar241 + fVar322 * fVar322;
            auVar336._16_4_ = fVar243 * fVar243 + fVar323 * fVar323;
            auVar336._20_4_ = fVar346 * fVar346 + fVar326 * fVar326;
            auVar336._24_4_ = fVar348 * fVar348 + fVar333 * fVar333;
            auVar336._28_4_ = auVar25._28_4_ + fStack_584;
            auVar25 = vrsqrtps_avx(auVar336);
            fVar223 = auVar25._0_4_;
            fVar235 = auVar25._4_4_;
            auVar80._4_4_ = fVar235 * 1.5;
            auVar80._0_4_ = fVar223 * 1.5;
            fVar239 = auVar25._8_4_;
            auVar80._8_4_ = fVar239 * 1.5;
            fVar242 = auVar25._12_4_;
            auVar80._12_4_ = fVar242 * 1.5;
            fVar282 = auVar25._16_4_;
            auVar80._16_4_ = fVar282 * 1.5;
            fVar220 = auVar25._20_4_;
            auVar80._20_4_ = fVar220 * 1.5;
            fVar347 = auVar25._24_4_;
            auVar80._24_4_ = fVar347 * 1.5;
            auVar80._28_4_ = auVar354._28_4_;
            auVar81._4_4_ = fVar235 * fVar235 * fVar235 * auVar336._4_4_ * 0.5;
            auVar81._0_4_ = fVar223 * fVar223 * fVar223 * auVar336._0_4_ * 0.5;
            auVar81._8_4_ = fVar239 * fVar239 * fVar239 * auVar336._8_4_ * 0.5;
            auVar81._12_4_ = fVar242 * fVar242 * fVar242 * auVar336._12_4_ * 0.5;
            auVar81._16_4_ = fVar282 * fVar282 * fVar282 * auVar336._16_4_ * 0.5;
            auVar81._20_4_ = fVar220 * fVar220 * fVar220 * auVar336._20_4_ * 0.5;
            auVar81._24_4_ = fVar347 * fVar347 * fVar347 * auVar336._24_4_ * 0.5;
            auVar81._28_4_ = auVar336._28_4_;
            auVar29 = vsubps_avx(auVar80,auVar81);
            fVar204 = auVar29._0_4_;
            fVar309 = auVar29._4_4_;
            fVar310 = auVar29._8_4_;
            fVar311 = auVar29._12_4_;
            fVar265 = auVar29._16_4_;
            fVar276 = auVar29._20_4_;
            fVar277 = auVar29._24_4_;
            fVar223 = auVar28._0_4_;
            fVar235 = auVar28._4_4_;
            fVar239 = auVar28._8_4_;
            fVar242 = auVar28._12_4_;
            fVar282 = auVar28._16_4_;
            fVar220 = auVar28._20_4_;
            fVar347 = auVar28._24_4_;
            auVar305._0_4_ = fVar223 * fVar223 + fVar300 * fVar300;
            auVar305._4_4_ = fVar235 * fVar235 + fVar342 * fVar342;
            auVar305._8_4_ = fVar239 * fVar239 + fVar307 * fVar307;
            auVar305._12_4_ = fVar242 * fVar242 + fVar308 * fVar308;
            auVar305._16_4_ = fVar282 * fVar282 + fVar160 * fVar160;
            auVar305._20_4_ = fVar220 * fVar220 + fVar190 * fVar190;
            auVar305._24_4_ = fVar347 * fVar347 + fVar170 * fVar170;
            auVar305._28_4_ = auVar25._28_4_ + auVar27._28_4_;
            auVar25 = vrsqrtps_avx(auVar305);
            fVar222 = auVar25._0_4_;
            fVar306 = auVar25._4_4_;
            auVar82._4_4_ = fVar306 * 1.5;
            auVar82._0_4_ = fVar222 * 1.5;
            fVar224 = auVar25._8_4_;
            auVar82._8_4_ = fVar224 * 1.5;
            fVar343 = auVar25._12_4_;
            auVar82._12_4_ = fVar343 * 1.5;
            fVar163 = auVar25._16_4_;
            auVar82._16_4_ = fVar163 * 1.5;
            fVar168 = auVar25._20_4_;
            auVar82._20_4_ = fVar168 * 1.5;
            fVar172 = auVar25._24_4_;
            auVar82._24_4_ = fVar172 * 1.5;
            auVar82._28_4_ = auVar354._28_4_;
            auVar83._4_4_ = fVar306 * fVar306 * fVar306 * auVar305._4_4_ * 0.5;
            auVar83._0_4_ = fVar222 * fVar222 * fVar222 * auVar305._0_4_ * 0.5;
            auVar83._8_4_ = fVar224 * fVar224 * fVar224 * auVar305._8_4_ * 0.5;
            auVar83._12_4_ = fVar343 * fVar343 * fVar343 * auVar305._12_4_ * 0.5;
            auVar83._16_4_ = fVar163 * fVar163 * fVar163 * auVar305._16_4_ * 0.5;
            auVar83._20_4_ = fVar168 * fVar168 * fVar168 * auVar305._20_4_ * 0.5;
            auVar83._24_4_ = fVar172 * fVar172 * fVar172 * auVar305._24_4_ * 0.5;
            auVar83._28_4_ = auVar305._28_4_;
            auVar27 = vsubps_avx(auVar82,auVar83);
            fVar222 = auVar27._0_4_;
            fVar306 = auVar27._4_4_;
            fVar224 = auVar27._8_4_;
            fVar343 = auVar27._12_4_;
            fVar163 = auVar27._16_4_;
            fVar168 = auVar27._20_4_;
            fVar172 = auVar27._24_4_;
            fVar221 = fVar146 * fVar204 * fVar221;
            fVar225 = fVar161 * fVar309 * fVar225;
            auVar84._4_4_ = fVar225;
            auVar84._0_4_ = fVar221;
            fVar237 = fVar164 * fVar310 * fVar237;
            auVar84._8_4_ = fVar237;
            fVar241 = fVar166 * fVar311 * fVar241;
            auVar84._12_4_ = fVar241;
            fVar243 = fVar169 * fVar265 * fVar243;
            auVar84._16_4_ = fVar243;
            fVar346 = fVar171 * fVar276 * fVar346;
            auVar84._20_4_ = fVar346;
            fVar348 = fVar173 * fVar277 * fVar348;
            auVar84._24_4_ = fVar348;
            auVar84._28_4_ = auVar25._28_4_;
            local_6e0._4_4_ = fVar225 + local_620._4_4_;
            local_6e0._0_4_ = fVar221 + (float)local_620._0_4_;
            fStack_6d8 = fVar237 + local_620._8_4_;
            fStack_6d4 = fVar241 + local_620._12_4_;
            auStack_6d0._0_4_ = fVar243 + local_620._16_4_;
            auStack_6d0._4_4_ = fVar346 + local_620._20_4_;
            fStack_6c8 = fVar348 + local_620._24_4_;
            fStack_6c4 = auVar25._28_4_ + local_620._28_4_;
            fVar221 = fVar146 * fVar204 * -fVar278;
            fVar225 = fVar161 * fVar309 * -fVar281;
            auVar85._4_4_ = fVar225;
            auVar85._0_4_ = fVar221;
            fVar237 = fVar164 * fVar310 * -fVar319;
            auVar85._8_4_ = fVar237;
            fVar241 = fVar166 * fVar311 * -fVar322;
            auVar85._12_4_ = fVar241;
            fVar243 = fVar169 * fVar265 * -fVar323;
            auVar85._16_4_ = fVar243;
            fVar346 = fVar171 * fVar276 * -fVar326;
            auVar85._20_4_ = fVar346;
            fVar348 = fVar173 * fVar277 * -fVar333;
            auVar85._24_4_ = fVar348;
            auVar85._28_4_ = -fVar339;
            local_6c0._4_4_ = auVar203._4_4_ + fVar225;
            local_6c0._0_4_ = auVar203._0_4_ + fVar221;
            uStack_6b8._0_4_ = auVar203._8_4_ + fVar237;
            uStack_6b8._4_4_ = auVar203._12_4_ + fVar241;
            auStack_6b0._0_4_ = auVar203._16_4_ + fVar243;
            auStack_6b0._4_4_ = auVar203._20_4_ + fVar346;
            fStack_6a8 = auVar203._24_4_ + fVar348;
            fStack_6a4 = auVar203._28_4_ + -fVar339;
            fVar221 = fVar204 * 0.0 * fVar146;
            fVar225 = fVar309 * 0.0 * fVar161;
            auVar86._4_4_ = fVar225;
            auVar86._0_4_ = fVar221;
            fVar237 = fVar310 * 0.0 * fVar164;
            auVar86._8_4_ = fVar237;
            fVar241 = fVar311 * 0.0 * fVar166;
            auVar86._12_4_ = fVar241;
            fVar243 = fVar265 * 0.0 * fVar169;
            auVar86._16_4_ = fVar243;
            fVar346 = fVar276 * 0.0 * fVar171;
            auVar86._20_4_ = fVar346;
            fVar348 = fVar277 * 0.0 * fVar173;
            auVar86._24_4_ = fVar348;
            auVar86._28_4_ = fVar339;
            auVar25 = vsubps_avx(local_620,auVar84);
            auVar378._0_4_ = fVar221 + auVar157._0_4_;
            auVar378._4_4_ = fVar225 + auVar157._4_4_;
            auVar378._8_4_ = fVar237 + auVar157._8_4_;
            auVar378._12_4_ = fVar241 + auVar157._12_4_;
            auVar378._16_4_ = fVar243 + auVar157._16_4_;
            auVar378._20_4_ = fVar346 + auVar157._20_4_;
            auVar378._24_4_ = fVar348 + auVar157._24_4_;
            auVar378._28_4_ = fVar339 + auVar157._28_4_;
            fVar221 = auVar293._0_4_ * fVar222 * fVar223;
            fVar223 = auVar293._4_4_ * fVar306 * fVar235;
            auVar87._4_4_ = fVar223;
            auVar87._0_4_ = fVar221;
            fVar225 = auVar293._8_4_ * fVar224 * fVar239;
            auVar87._8_4_ = fVar225;
            fVar235 = auVar293._12_4_ * fVar343 * fVar242;
            auVar87._12_4_ = fVar235;
            fVar237 = auVar293._16_4_ * fVar163 * fVar282;
            auVar87._16_4_ = fVar237;
            fVar239 = auVar293._20_4_ * fVar168 * fVar220;
            auVar87._20_4_ = fVar239;
            fVar241 = auVar293._24_4_ * fVar172 * fVar347;
            auVar87._24_4_ = fVar241;
            auVar87._28_4_ = fVar174;
            auVar181 = vsubps_avx(auVar203,auVar85);
            auVar364._0_4_ = auVar362._0_4_ + fVar221;
            auVar364._4_4_ = auVar362._4_4_ + fVar223;
            auVar364._8_4_ = auVar362._8_4_ + fVar225;
            auVar364._12_4_ = auVar362._12_4_ + fVar235;
            auVar364._16_4_ = auVar362._16_4_ + fVar237;
            auVar364._20_4_ = auVar362._20_4_ + fVar239;
            auVar364._24_4_ = auVar362._24_4_ + fVar241;
            auVar364._28_4_ = auVar362._28_4_ + fVar174;
            fVar221 = fVar222 * -fVar300 * auVar293._0_4_;
            fVar223 = fVar306 * -fVar342 * auVar293._4_4_;
            auVar88._4_4_ = fVar223;
            auVar88._0_4_ = fVar221;
            fVar225 = fVar224 * -fVar307 * auVar293._8_4_;
            auVar88._8_4_ = fVar225;
            fVar235 = fVar343 * -fVar308 * auVar293._12_4_;
            auVar88._12_4_ = fVar235;
            fVar237 = fVar163 * -fVar160 * auVar293._16_4_;
            auVar88._16_4_ = fVar237;
            fVar239 = fVar168 * -fVar190 * auVar293._20_4_;
            auVar88._20_4_ = fVar239;
            fVar241 = fVar172 * -fVar170 * auVar293._24_4_;
            auVar88._24_4_ = fVar241;
            auVar88._28_4_ = local_620._28_4_;
            auVar182 = vsubps_avx(auVar157,auVar86);
            auVar233._0_4_ = auVar254._0_4_ + fVar221;
            auVar233._4_4_ = auVar254._4_4_ + fVar223;
            auVar233._8_4_ = auVar254._8_4_ + fVar225;
            auVar233._12_4_ = auVar254._12_4_ + fVar235;
            auVar233._16_4_ = auVar254._16_4_ + fVar237;
            auVar233._20_4_ = auVar254._20_4_ + fVar239;
            auVar233._24_4_ = auVar254._24_4_ + fVar241;
            auVar233._28_4_ = auVar254._28_4_ + local_620._28_4_;
            fVar221 = fVar222 * 0.0 * auVar293._0_4_;
            fVar223 = fVar306 * 0.0 * auVar293._4_4_;
            auVar89._4_4_ = fVar223;
            auVar89._0_4_ = fVar221;
            fVar225 = fVar224 * 0.0 * auVar293._8_4_;
            auVar89._8_4_ = fVar225;
            fVar235 = fVar343 * 0.0 * auVar293._12_4_;
            auVar89._12_4_ = fVar235;
            fVar237 = fVar163 * 0.0 * auVar293._16_4_;
            auVar89._16_4_ = fVar237;
            fVar239 = fVar168 * 0.0 * auVar293._20_4_;
            auVar89._20_4_ = fVar239;
            fVar241 = fVar172 * 0.0 * auVar293._24_4_;
            auVar89._24_4_ = fVar241;
            auVar89._28_4_ = auVar157._28_4_;
            auVar28 = vsubps_avx(auVar362,auVar87);
            auVar128._4_4_ = fVar162;
            auVar128._0_4_ = fVar280;
            auVar128._8_4_ = fVar165;
            auVar128._12_4_ = fVar167;
            auVar128._16_4_ = fStack_790;
            auVar128._20_4_ = fStack_78c;
            auVar128._24_4_ = fStack_788;
            auVar128._28_4_ = fStack_784;
            auVar318._0_4_ = fVar280 + fVar221;
            auVar318._4_4_ = fVar162 + fVar223;
            auVar318._8_4_ = fVar165 + fVar225;
            auVar318._12_4_ = fVar167 + fVar235;
            auVar318._16_4_ = fStack_790 + fVar237;
            auVar318._20_4_ = fStack_78c + fVar239;
            auVar318._24_4_ = fStack_788 + fVar241;
            auVar318._28_4_ = fStack_784 + auVar157._28_4_;
            auVar29 = vsubps_avx(auVar254,auVar88);
            auVar30 = vsubps_avx(auVar128,auVar89);
            auVar31 = vsubps_avx(auVar233,auVar181);
            auVar32 = vsubps_avx(auVar318,auVar182);
            auVar90._4_4_ = auVar182._4_4_ * auVar31._4_4_;
            auVar90._0_4_ = auVar182._0_4_ * auVar31._0_4_;
            auVar90._8_4_ = auVar182._8_4_ * auVar31._8_4_;
            auVar90._12_4_ = auVar182._12_4_ * auVar31._12_4_;
            auVar90._16_4_ = auVar182._16_4_ * auVar31._16_4_;
            auVar90._20_4_ = auVar182._20_4_ * auVar31._20_4_;
            auVar90._24_4_ = auVar182._24_4_ * auVar31._24_4_;
            auVar90._28_4_ = auVar354._28_4_;
            auVar91._4_4_ = auVar181._4_4_ * auVar32._4_4_;
            auVar91._0_4_ = auVar181._0_4_ * auVar32._0_4_;
            auVar91._8_4_ = auVar181._8_4_ * auVar32._8_4_;
            auVar91._12_4_ = auVar181._12_4_ * auVar32._12_4_;
            auVar91._16_4_ = auVar181._16_4_ * auVar32._16_4_;
            auVar91._20_4_ = auVar181._20_4_ * auVar32._20_4_;
            auVar91._24_4_ = auVar181._24_4_ * auVar32._24_4_;
            auVar91._28_4_ = auVar254._28_4_;
            auVar33 = vsubps_avx(auVar91,auVar90);
            auVar92._4_4_ = auVar25._4_4_ * auVar32._4_4_;
            auVar92._0_4_ = auVar25._0_4_ * auVar32._0_4_;
            auVar92._8_4_ = auVar25._8_4_ * auVar32._8_4_;
            auVar92._12_4_ = auVar25._12_4_ * auVar32._12_4_;
            auVar92._16_4_ = auVar25._16_4_ * auVar32._16_4_;
            auVar92._20_4_ = auVar25._20_4_ * auVar32._20_4_;
            auVar92._24_4_ = auVar25._24_4_ * auVar32._24_4_;
            auVar92._28_4_ = auVar32._28_4_;
            auVar32 = vsubps_avx(auVar364,auVar25);
            auVar93._4_4_ = auVar182._4_4_ * auVar32._4_4_;
            auVar93._0_4_ = auVar182._0_4_ * auVar32._0_4_;
            auVar93._8_4_ = auVar182._8_4_ * auVar32._8_4_;
            auVar93._12_4_ = auVar182._12_4_ * auVar32._12_4_;
            auVar93._16_4_ = auVar182._16_4_ * auVar32._16_4_;
            auVar93._20_4_ = auVar182._20_4_ * auVar32._20_4_;
            auVar93._24_4_ = auVar182._24_4_ * auVar32._24_4_;
            auVar93._28_4_ = auVar27._28_4_;
            auVar34 = vsubps_avx(auVar93,auVar92);
            auVar94._4_4_ = auVar181._4_4_ * auVar32._4_4_;
            auVar94._0_4_ = auVar181._0_4_ * auVar32._0_4_;
            auVar94._8_4_ = auVar181._8_4_ * auVar32._8_4_;
            auVar94._12_4_ = auVar181._12_4_ * auVar32._12_4_;
            auVar94._16_4_ = auVar181._16_4_ * auVar32._16_4_;
            auVar94._20_4_ = auVar181._20_4_ * auVar32._20_4_;
            auVar94._24_4_ = auVar181._24_4_ * auVar32._24_4_;
            auVar94._28_4_ = auVar27._28_4_;
            auVar95._4_4_ = auVar25._4_4_ * auVar31._4_4_;
            auVar95._0_4_ = auVar25._0_4_ * auVar31._0_4_;
            auVar95._8_4_ = auVar25._8_4_ * auVar31._8_4_;
            auVar95._12_4_ = auVar25._12_4_ * auVar31._12_4_;
            auVar95._16_4_ = auVar25._16_4_ * auVar31._16_4_;
            auVar95._20_4_ = auVar25._20_4_ * auVar31._20_4_;
            auVar95._24_4_ = auVar25._24_4_ * auVar31._24_4_;
            auVar95._28_4_ = auVar31._28_4_;
            auVar27 = vsubps_avx(auVar95,auVar94);
            auVar187._0_4_ = auVar33._0_4_ * 0.0 + auVar27._0_4_ + auVar34._0_4_ * 0.0;
            auVar187._4_4_ = auVar33._4_4_ * 0.0 + auVar27._4_4_ + auVar34._4_4_ * 0.0;
            auVar187._8_4_ = auVar33._8_4_ * 0.0 + auVar27._8_4_ + auVar34._8_4_ * 0.0;
            auVar187._12_4_ = auVar33._12_4_ * 0.0 + auVar27._12_4_ + auVar34._12_4_ * 0.0;
            auVar187._16_4_ = auVar33._16_4_ * 0.0 + auVar27._16_4_ + auVar34._16_4_ * 0.0;
            auVar187._20_4_ = auVar33._20_4_ * 0.0 + auVar27._20_4_ + auVar34._20_4_ * 0.0;
            auVar187._24_4_ = auVar33._24_4_ * 0.0 + auVar27._24_4_ + auVar34._24_4_ * 0.0;
            auVar187._28_4_ = auVar33._28_4_ + auVar27._28_4_ + auVar34._28_4_;
            auVar151 = vcmpps_avx(auVar187,ZEXT832(0) << 0x20,2);
            auVar28 = vblendvps_avx(auVar28,_local_6e0,auVar151);
            auVar27 = vblendvps_avx(auVar29,_local_6c0,auVar151);
            auVar29 = vblendvps_avx(auVar30,auVar378,auVar151);
            auVar30 = vblendvps_avx(auVar25,auVar364,auVar151);
            auVar31 = vblendvps_avx(auVar181,auVar233,auVar151);
            auVar32 = vblendvps_avx(auVar182,auVar318,auVar151);
            auVar33 = vblendvps_avx(auVar364,auVar25,auVar151);
            auVar34 = vblendvps_avx(auVar233,auVar181,auVar151);
            auVar150 = vblendvps_avx(auVar318,auVar182,auVar151);
            auVar25 = vandps_avx(auVar149,_local_380);
            auVar33 = vsubps_avx(auVar33,auVar28);
            auVar183 = vsubps_avx(auVar34,auVar27);
            auVar150 = vsubps_avx(auVar150,auVar29);
            auVar184 = vsubps_avx(auVar27,auVar31);
            fVar221 = auVar183._0_4_;
            fVar284 = auVar29._0_4_;
            fVar242 = auVar183._4_4_;
            fVar294 = auVar29._4_4_;
            auVar96._4_4_ = fVar294 * fVar242;
            auVar96._0_4_ = fVar284 * fVar221;
            fVar300 = auVar183._8_4_;
            fVar295 = auVar29._8_4_;
            auVar96._8_4_ = fVar295 * fVar300;
            fVar343 = auVar183._12_4_;
            fVar296 = auVar29._12_4_;
            auVar96._12_4_ = fVar296 * fVar343;
            fVar204 = auVar183._16_4_;
            fVar297 = auVar29._16_4_;
            auVar96._16_4_ = fVar297 * fVar204;
            fVar277 = auVar183._20_4_;
            fVar298 = auVar29._20_4_;
            auVar96._20_4_ = fVar298 * fVar277;
            fVar322 = auVar183._24_4_;
            fVar299 = auVar29._24_4_;
            auVar96._24_4_ = fVar299 * fVar322;
            auVar96._28_4_ = auVar34._28_4_;
            fVar223 = auVar27._0_4_;
            fVar313 = auVar150._0_4_;
            fVar243 = auVar27._4_4_;
            fVar321 = auVar150._4_4_;
            auVar97._4_4_ = fVar321 * fVar243;
            auVar97._0_4_ = fVar313 * fVar223;
            fVar222 = auVar27._8_4_;
            fVar325 = auVar150._8_4_;
            auVar97._8_4_ = fVar325 * fVar222;
            fVar160 = auVar27._12_4_;
            fVar328 = auVar150._12_4_;
            auVar97._12_4_ = fVar328 * fVar160;
            fVar280 = auVar27._16_4_;
            fVar329 = auVar150._16_4_;
            auVar97._16_4_ = fVar329 * fVar280;
            fVar278 = auVar27._20_4_;
            fVar330 = auVar150._20_4_;
            auVar97._20_4_ = fVar330 * fVar278;
            fVar323 = auVar27._24_4_;
            fVar331 = auVar150._24_4_;
            uVar8 = auVar181._28_4_;
            auVar97._24_4_ = fVar331 * fVar323;
            auVar97._28_4_ = uVar8;
            auVar34 = vsubps_avx(auVar97,auVar96);
            fVar225 = auVar28._0_4_;
            fVar282 = auVar28._4_4_;
            auVar98._4_4_ = fVar321 * fVar282;
            auVar98._0_4_ = fVar313 * fVar225;
            fVar342 = auVar28._8_4_;
            auVar98._8_4_ = fVar325 * fVar342;
            fVar163 = auVar28._12_4_;
            auVar98._12_4_ = fVar328 * fVar163;
            fVar309 = auVar28._16_4_;
            auVar98._16_4_ = fVar329 * fVar309;
            fVar162 = auVar28._20_4_;
            auVar98._20_4_ = fVar330 * fVar162;
            fVar326 = auVar28._24_4_;
            auVar98._24_4_ = fVar331 * fVar326;
            auVar98._28_4_ = uVar8;
            fVar235 = auVar33._0_4_;
            fVar346 = auVar33._4_4_;
            auVar99._4_4_ = fVar294 * fVar346;
            auVar99._0_4_ = fVar284 * fVar235;
            fVar306 = auVar33._8_4_;
            auVar99._8_4_ = fVar295 * fVar306;
            fVar190 = auVar33._12_4_;
            auVar99._12_4_ = fVar296 * fVar190;
            fVar310 = auVar33._16_4_;
            auVar99._16_4_ = fVar297 * fVar310;
            fVar165 = auVar33._20_4_;
            auVar99._20_4_ = fVar298 * fVar165;
            fVar333 = auVar33._24_4_;
            auVar99._24_4_ = fVar299 * fVar333;
            auVar99._28_4_ = auVar364._28_4_;
            auVar181 = vsubps_avx(auVar99,auVar98);
            auVar100._4_4_ = fVar243 * fVar346;
            auVar100._0_4_ = fVar223 * fVar235;
            auVar100._8_4_ = fVar222 * fVar306;
            auVar100._12_4_ = fVar160 * fVar190;
            auVar100._16_4_ = fVar280 * fVar310;
            auVar100._20_4_ = fVar278 * fVar165;
            auVar100._24_4_ = fVar323 * fVar333;
            auVar100._28_4_ = uVar8;
            auVar101._4_4_ = fVar282 * fVar242;
            auVar101._0_4_ = fVar225 * fVar221;
            auVar101._8_4_ = fVar342 * fVar300;
            auVar101._12_4_ = fVar163 * fVar343;
            auVar101._16_4_ = fVar309 * fVar204;
            auVar101._20_4_ = fVar162 * fVar277;
            auVar101._24_4_ = fVar326 * fVar322;
            auVar101._28_4_ = auVar182._28_4_;
            auVar182 = vsubps_avx(auVar101,auVar100);
            auVar198 = vsubps_avx(auVar29,auVar32);
            fVar239 = auVar182._28_4_ + auVar181._28_4_;
            auVar337._0_4_ = auVar182._0_4_ + auVar181._0_4_ * 0.0 + auVar34._0_4_ * 0.0;
            auVar337._4_4_ = auVar182._4_4_ + auVar181._4_4_ * 0.0 + auVar34._4_4_ * 0.0;
            auVar337._8_4_ = auVar182._8_4_ + auVar181._8_4_ * 0.0 + auVar34._8_4_ * 0.0;
            auVar337._12_4_ = auVar182._12_4_ + auVar181._12_4_ * 0.0 + auVar34._12_4_ * 0.0;
            auVar337._16_4_ = auVar182._16_4_ + auVar181._16_4_ * 0.0 + auVar34._16_4_ * 0.0;
            auVar337._20_4_ = auVar182._20_4_ + auVar181._20_4_ * 0.0 + auVar34._20_4_ * 0.0;
            auVar337._24_4_ = auVar182._24_4_ + auVar181._24_4_ * 0.0 + auVar34._24_4_ * 0.0;
            auVar337._28_4_ = fVar239 + auVar34._28_4_;
            fVar237 = auVar184._0_4_;
            fVar220 = auVar184._4_4_;
            auVar102._4_4_ = auVar32._4_4_ * fVar220;
            auVar102._0_4_ = auVar32._0_4_ * fVar237;
            fVar307 = auVar184._8_4_;
            auVar102._8_4_ = auVar32._8_4_ * fVar307;
            fVar168 = auVar184._12_4_;
            auVar102._12_4_ = auVar32._12_4_ * fVar168;
            fVar311 = auVar184._16_4_;
            auVar102._16_4_ = auVar32._16_4_ * fVar311;
            fVar167 = auVar184._20_4_;
            auVar102._20_4_ = auVar32._20_4_ * fVar167;
            fVar339 = auVar184._24_4_;
            auVar102._24_4_ = auVar32._24_4_ * fVar339;
            auVar102._28_4_ = fVar239;
            fVar239 = auVar198._0_4_;
            fVar348 = auVar198._4_4_;
            auVar103._4_4_ = auVar31._4_4_ * fVar348;
            auVar103._0_4_ = auVar31._0_4_ * fVar239;
            fVar224 = auVar198._8_4_;
            auVar103._8_4_ = auVar31._8_4_ * fVar224;
            fVar170 = auVar198._12_4_;
            auVar103._12_4_ = auVar31._12_4_ * fVar170;
            fVar265 = auVar198._16_4_;
            auVar103._16_4_ = auVar31._16_4_ * fVar265;
            fVar281 = auVar198._20_4_;
            auVar103._20_4_ = auVar31._20_4_ * fVar281;
            fVar340 = auVar198._24_4_;
            auVar103._24_4_ = auVar31._24_4_ * fVar340;
            auVar103._28_4_ = auVar182._28_4_;
            auVar181 = vsubps_avx(auVar103,auVar102);
            auVar182 = vsubps_avx(auVar28,auVar30);
            fVar241 = auVar182._0_4_;
            fVar347 = auVar182._4_4_;
            auVar104._4_4_ = auVar32._4_4_ * fVar347;
            auVar104._0_4_ = auVar32._0_4_ * fVar241;
            fVar308 = auVar182._8_4_;
            auVar104._8_4_ = auVar32._8_4_ * fVar308;
            fVar172 = auVar182._12_4_;
            auVar104._12_4_ = auVar32._12_4_ * fVar172;
            fVar276 = auVar182._16_4_;
            auVar104._16_4_ = auVar32._16_4_ * fVar276;
            fVar319 = auVar182._20_4_;
            auVar104._20_4_ = auVar32._20_4_ * fVar319;
            fVar341 = auVar182._24_4_;
            auVar104._24_4_ = auVar32._24_4_ * fVar341;
            auVar104._28_4_ = auVar32._28_4_;
            auVar105._4_4_ = fVar348 * auVar30._4_4_;
            auVar105._0_4_ = fVar239 * auVar30._0_4_;
            auVar105._8_4_ = fVar224 * auVar30._8_4_;
            auVar105._12_4_ = fVar170 * auVar30._12_4_;
            auVar105._16_4_ = fVar265 * auVar30._16_4_;
            auVar105._20_4_ = fVar281 * auVar30._20_4_;
            auVar105._24_4_ = fVar340 * auVar30._24_4_;
            auVar105._28_4_ = auVar34._28_4_;
            auVar32 = vsubps_avx(auVar104,auVar105);
            auVar106._4_4_ = auVar31._4_4_ * fVar347;
            auVar106._0_4_ = auVar31._0_4_ * fVar241;
            auVar106._8_4_ = auVar31._8_4_ * fVar308;
            auVar106._12_4_ = auVar31._12_4_ * fVar172;
            auVar106._16_4_ = auVar31._16_4_ * fVar276;
            auVar106._20_4_ = auVar31._20_4_ * fVar319;
            auVar106._24_4_ = auVar31._24_4_ * fVar341;
            auVar106._28_4_ = auVar31._28_4_;
            auVar107._4_4_ = fVar220 * auVar30._4_4_;
            auVar107._0_4_ = fVar237 * auVar30._0_4_;
            auVar107._8_4_ = fVar307 * auVar30._8_4_;
            auVar107._12_4_ = fVar168 * auVar30._12_4_;
            auVar107._16_4_ = fVar311 * auVar30._16_4_;
            auVar107._20_4_ = fVar167 * auVar30._20_4_;
            auVar107._24_4_ = fVar339 * auVar30._24_4_;
            auVar107._28_4_ = auVar30._28_4_;
            auVar30 = vsubps_avx(auVar107,auVar106);
            auVar158._0_4_ = auVar181._0_4_ * 0.0 + auVar30._0_4_ + auVar32._0_4_ * 0.0;
            auVar158._4_4_ = auVar181._4_4_ * 0.0 + auVar30._4_4_ + auVar32._4_4_ * 0.0;
            auVar158._8_4_ = auVar181._8_4_ * 0.0 + auVar30._8_4_ + auVar32._8_4_ * 0.0;
            auVar158._12_4_ = auVar181._12_4_ * 0.0 + auVar30._12_4_ + auVar32._12_4_ * 0.0;
            auVar158._16_4_ = auVar181._16_4_ * 0.0 + auVar30._16_4_ + auVar32._16_4_ * 0.0;
            auVar158._20_4_ = auVar181._20_4_ * 0.0 + auVar30._20_4_ + auVar32._20_4_ * 0.0;
            auVar158._24_4_ = auVar181._24_4_ * 0.0 + auVar30._24_4_ + auVar32._24_4_ * 0.0;
            auVar158._28_4_ = auVar32._28_4_ + auVar30._28_4_ + auVar32._28_4_;
            auVar159 = ZEXT3264(auVar158);
            auVar30 = vmaxps_avx(auVar337,auVar158);
            auVar30 = vcmpps_avx(auVar30,ZEXT432(0) << 0x20,2);
            auVar31 = auVar25 & auVar30;
            if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar31 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar31 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar31 >> 0x7f,0) == '\0') &&
                  (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar31 >> 0xbf,0) == '\0') &&
                (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar31[0x1f]) {
LAB_011b3061:
              auVar275 = ZEXT3264(auVar27);
              auVar189._8_8_ = uStack_558;
              auVar189._0_8_ = local_560;
              auVar189._16_8_ = uStack_550;
              auVar189._24_8_ = uStack_548;
              auVar365._4_4_ = fVar161;
              auVar365._0_4_ = fVar146;
              auVar365._8_4_ = fVar164;
              auVar365._12_4_ = fVar166;
              auVar365._16_4_ = fVar169;
              auVar365._20_4_ = fVar171;
              auVar365._24_4_ = fVar173;
              auVar365._28_4_ = fVar174;
            }
            else {
              auVar31 = vandps_avx(auVar30,auVar25);
              auVar108._4_4_ = fVar348 * fVar242;
              auVar108._0_4_ = fVar239 * fVar221;
              auVar108._8_4_ = fVar224 * fVar300;
              auVar108._12_4_ = fVar170 * fVar343;
              auVar108._16_4_ = fVar265 * fVar204;
              auVar108._20_4_ = fVar281 * fVar277;
              auVar108._24_4_ = fVar340 * fVar322;
              auVar108._28_4_ = auVar25._28_4_;
              auVar109._4_4_ = fVar220 * fVar321;
              auVar109._0_4_ = fVar237 * fVar313;
              auVar109._8_4_ = fVar307 * fVar325;
              auVar109._12_4_ = fVar168 * fVar328;
              auVar109._16_4_ = fVar311 * fVar329;
              auVar109._20_4_ = fVar167 * fVar330;
              auVar109._24_4_ = fVar339 * fVar331;
              auVar109._28_4_ = auVar30._28_4_;
              auVar30 = vsubps_avx(auVar109,auVar108);
              auVar110._4_4_ = fVar347 * fVar321;
              auVar110._0_4_ = fVar241 * fVar313;
              auVar110._8_4_ = fVar308 * fVar325;
              auVar110._12_4_ = fVar172 * fVar328;
              auVar110._16_4_ = fVar276 * fVar329;
              auVar110._20_4_ = fVar319 * fVar330;
              auVar110._24_4_ = fVar341 * fVar331;
              auVar110._28_4_ = auVar150._28_4_;
              auVar111._4_4_ = fVar348 * fVar346;
              auVar111._0_4_ = fVar239 * fVar235;
              auVar111._8_4_ = fVar224 * fVar306;
              auVar111._12_4_ = fVar170 * fVar190;
              auVar111._16_4_ = fVar265 * fVar310;
              auVar111._20_4_ = fVar281 * fVar165;
              auVar111._24_4_ = fVar340 * fVar333;
              auVar111._28_4_ = auVar198._28_4_;
              auVar32 = vsubps_avx(auVar111,auVar110);
              auVar112._4_4_ = fVar220 * fVar346;
              auVar112._0_4_ = fVar237 * fVar235;
              auVar112._8_4_ = fVar307 * fVar306;
              auVar112._12_4_ = fVar168 * fVar190;
              auVar112._16_4_ = fVar311 * fVar310;
              auVar112._20_4_ = fVar167 * fVar165;
              auVar112._24_4_ = fVar339 * fVar333;
              auVar112._28_4_ = auVar33._28_4_;
              auVar113._4_4_ = fVar347 * fVar242;
              auVar113._0_4_ = fVar241 * fVar221;
              auVar113._8_4_ = fVar308 * fVar300;
              auVar113._12_4_ = fVar172 * fVar343;
              auVar113._16_4_ = fVar276 * fVar204;
              auVar113._20_4_ = fVar319 * fVar277;
              auVar113._24_4_ = fVar341 * fVar322;
              auVar113._28_4_ = auVar183._28_4_;
              auVar34 = vsubps_avx(auVar113,auVar112);
              auVar188._0_4_ = auVar30._0_4_ * 0.0 + auVar34._0_4_ + auVar32._0_4_ * 0.0;
              auVar188._4_4_ = auVar30._4_4_ * 0.0 + auVar34._4_4_ + auVar32._4_4_ * 0.0;
              auVar188._8_4_ = auVar30._8_4_ * 0.0 + auVar34._8_4_ + auVar32._8_4_ * 0.0;
              auVar188._12_4_ = auVar30._12_4_ * 0.0 + auVar34._12_4_ + auVar32._12_4_ * 0.0;
              auVar188._16_4_ = auVar30._16_4_ * 0.0 + auVar34._16_4_ + auVar32._16_4_ * 0.0;
              auVar188._20_4_ = auVar30._20_4_ * 0.0 + auVar34._20_4_ + auVar32._20_4_ * 0.0;
              auVar188._24_4_ = auVar30._24_4_ * 0.0 + auVar34._24_4_ + auVar32._24_4_ * 0.0;
              auVar188._28_4_ = auVar183._28_4_ + auVar34._28_4_ + auVar33._28_4_;
              auVar25 = vrcpps_avx(auVar188);
              fVar221 = auVar25._0_4_;
              fVar235 = auVar25._4_4_;
              auVar114._4_4_ = auVar188._4_4_ * fVar235;
              auVar114._0_4_ = auVar188._0_4_ * fVar221;
              fVar237 = auVar25._8_4_;
              auVar114._8_4_ = auVar188._8_4_ * fVar237;
              fVar239 = auVar25._12_4_;
              auVar114._12_4_ = auVar188._12_4_ * fVar239;
              fVar241 = auVar25._16_4_;
              auVar114._16_4_ = auVar188._16_4_ * fVar241;
              fVar242 = auVar25._20_4_;
              auVar114._20_4_ = auVar188._20_4_ * fVar242;
              fVar346 = auVar25._24_4_;
              auVar114._24_4_ = auVar188._24_4_ * fVar346;
              auVar114._28_4_ = auVar198._28_4_;
              auVar355._8_4_ = 0x3f800000;
              auVar355._0_8_ = &DAT_3f8000003f800000;
              auVar355._12_4_ = 0x3f800000;
              auVar355._16_4_ = 0x3f800000;
              auVar355._20_4_ = 0x3f800000;
              auVar355._24_4_ = 0x3f800000;
              auVar355._28_4_ = 0x3f800000;
              auVar25 = vsubps_avx(auVar355,auVar114);
              fVar221 = auVar25._0_4_ * fVar221 + fVar221;
              fVar235 = auVar25._4_4_ * fVar235 + fVar235;
              fVar237 = auVar25._8_4_ * fVar237 + fVar237;
              fVar239 = auVar25._12_4_ * fVar239 + fVar239;
              fVar241 = auVar25._16_4_ * fVar241 + fVar241;
              fVar242 = auVar25._20_4_ * fVar242 + fVar242;
              fVar346 = auVar25._24_4_ * fVar346 + fVar346;
              auVar115._4_4_ =
                   (fVar282 * auVar30._4_4_ + auVar32._4_4_ * fVar243 + auVar34._4_4_ * fVar294) *
                   fVar235;
              auVar115._0_4_ =
                   (fVar225 * auVar30._0_4_ + auVar32._0_4_ * fVar223 + auVar34._0_4_ * fVar284) *
                   fVar221;
              auVar115._8_4_ =
                   (fVar342 * auVar30._8_4_ + auVar32._8_4_ * fVar222 + auVar34._8_4_ * fVar295) *
                   fVar237;
              auVar115._12_4_ =
                   (fVar163 * auVar30._12_4_ + auVar32._12_4_ * fVar160 + auVar34._12_4_ * fVar296)
                   * fVar239;
              auVar115._16_4_ =
                   (fVar309 * auVar30._16_4_ + auVar32._16_4_ * fVar280 + auVar34._16_4_ * fVar297)
                   * fVar241;
              auVar115._20_4_ =
                   (fVar162 * auVar30._20_4_ + auVar32._20_4_ * fVar278 + auVar34._20_4_ * fVar298)
                   * fVar242;
              auVar115._24_4_ =
                   (fVar326 * auVar30._24_4_ + auVar32._24_4_ * fVar323 + auVar34._24_4_ * fVar299)
                   * fVar346;
              auVar115._28_4_ = auVar28._28_4_ + auVar27._28_4_ + auVar29._28_4_;
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar234._4_4_ = uVar8;
              auVar234._0_4_ = uVar8;
              auVar234._8_4_ = uVar8;
              auVar234._12_4_ = uVar8;
              auVar234._16_4_ = uVar8;
              auVar234._20_4_ = uVar8;
              auVar234._24_4_ = uVar8;
              auVar234._28_4_ = uVar8;
              auVar25 = vcmpps_avx(_local_3e0,auVar115,2);
              auVar28 = vcmpps_avx(auVar115,auVar234,2);
              auVar27 = vandps_avx(auVar25,auVar28);
              auVar25 = auVar31 & auVar27;
              if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar25 >> 0x7f,0) == '\0') &&
                    (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar25 >> 0xbf,0) == '\0') &&
                  (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar25[0x1f]) goto LAB_011b3061;
              auVar25 = vandps_avx(auVar31,auVar27);
              auVar275 = ZEXT3264(auVar25);
              auVar27 = vcmpps_avx(ZEXT432(0) << 0x20,auVar188,4);
              auVar29 = auVar25 & auVar27;
              auVar189._8_8_ = uStack_558;
              auVar189._0_8_ = local_560;
              auVar189._16_8_ = uStack_550;
              auVar189._24_8_ = uStack_548;
              auVar365._4_4_ = fVar161;
              auVar365._0_4_ = fVar146;
              auVar365._8_4_ = fVar164;
              auVar365._12_4_ = fVar166;
              auVar365._16_4_ = fVar169;
              auVar365._20_4_ = fVar171;
              auVar365._24_4_ = fVar173;
              auVar365._28_4_ = fVar174;
              if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar29 >> 0x7f,0) != '\0') ||
                    (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar29 >> 0xbf,0) != '\0') ||
                  (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar29[0x1f] < '\0') {
                auVar189 = vandps_avx(auVar27,auVar25);
                auVar116._4_4_ = auVar337._4_4_ * fVar235;
                auVar116._0_4_ = auVar337._0_4_ * fVar221;
                auVar116._8_4_ = auVar337._8_4_ * fVar237;
                auVar116._12_4_ = auVar337._12_4_ * fVar239;
                auVar116._16_4_ = auVar337._16_4_ * fVar241;
                auVar116._20_4_ = auVar337._20_4_ * fVar242;
                auVar116._24_4_ = auVar337._24_4_ * fVar346;
                auVar116._28_4_ = auVar28._28_4_;
                auVar117._4_4_ = auVar158._4_4_ * fVar235;
                auVar117._0_4_ = auVar158._0_4_ * fVar221;
                auVar117._8_4_ = auVar158._8_4_ * fVar237;
                auVar117._12_4_ = auVar158._12_4_ * fVar239;
                auVar117._16_4_ = auVar158._16_4_ * fVar241;
                auVar117._20_4_ = auVar158._20_4_ * fVar242;
                auVar117._24_4_ = auVar158._24_4_ * fVar346;
                auVar117._28_4_ = auVar158._28_4_;
                auVar274._8_4_ = 0x3f800000;
                auVar274._0_8_ = &DAT_3f8000003f800000;
                auVar274._12_4_ = 0x3f800000;
                auVar274._16_4_ = 0x3f800000;
                auVar274._20_4_ = 0x3f800000;
                auVar274._24_4_ = 0x3f800000;
                auVar274._28_4_ = 0x3f800000;
                auVar275 = ZEXT3264(auVar274);
                auVar25 = vsubps_avx(auVar274,auVar116);
                _local_1e0 = vblendvps_avx(auVar25,auVar116,auVar151);
                auVar25 = vsubps_avx(auVar274,auVar117);
                _local_420 = vblendvps_avx(auVar25,auVar117,auVar151);
                auVar159 = ZEXT3264(_local_420);
                local_200 = auVar115;
              }
            }
            auVar372 = ZEXT3264(_local_640);
            if ((((((((auVar189 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar189 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar189 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar189 >> 0x7f,0) != '\0') ||
                  (auVar189 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar189 >> 0xbf,0) != '\0') ||
                (auVar189 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar189[0x1f] < '\0') {
              auVar25 = vsubps_avx(auVar293,auVar365);
              fVar223 = auVar365._0_4_ + auVar25._0_4_ * (float)local_1e0._0_4_;
              fVar225 = auVar365._4_4_ + auVar25._4_4_ * (float)local_1e0._4_4_;
              fVar235 = auVar365._8_4_ + auVar25._8_4_ * fStack_1d8;
              fVar237 = auVar365._12_4_ + auVar25._12_4_ * fStack_1d4;
              fVar239 = auVar365._16_4_ + auVar25._16_4_ * fStack_1d0;
              fVar241 = auVar365._20_4_ + auVar25._20_4_ * fStack_1cc;
              fVar242 = auVar365._24_4_ + auVar25._24_4_ * fStack_1c8;
              fVar243 = auVar365._28_4_ + auVar25._28_4_;
              fVar221 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
              auVar118._4_4_ = (fVar225 + fVar225) * fVar221;
              auVar118._0_4_ = (fVar223 + fVar223) * fVar221;
              auVar118._8_4_ = (fVar235 + fVar235) * fVar221;
              auVar118._12_4_ = (fVar237 + fVar237) * fVar221;
              auVar118._16_4_ = (fVar239 + fVar239) * fVar221;
              auVar118._20_4_ = (fVar241 + fVar241) * fVar221;
              auVar118._24_4_ = (fVar242 + fVar242) * fVar221;
              auVar118._28_4_ = fVar243 + fVar243;
              auVar25 = vcmpps_avx(local_200,auVar118,6);
              auVar159 = ZEXT3264(auVar25);
              auVar27 = auVar189 & auVar25;
              if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar27 >> 0x7f,0) != '\0') ||
                    (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar27 >> 0xbf,0) != '\0') ||
                  (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar27[0x1f] < '\0') {
                local_280 = vandps_avx(auVar25,auVar189);
                auVar159 = ZEXT3264(local_280);
                local_320 = (float)local_420._0_4_ + (float)local_420._0_4_ + -1.0;
                fStack_31c = (float)local_420._4_4_ + (float)local_420._4_4_ + -1.0;
                fStack_318 = (float)uStack_418 + (float)uStack_418 + -1.0;
                fStack_314 = uStack_418._4_4_ + uStack_418._4_4_ + -1.0;
                fStack_310 = (float)uStack_410 + (float)uStack_410 + -1.0;
                fStack_30c = uStack_410._4_4_ + uStack_410._4_4_ + -1.0;
                fStack_308 = (float)uStack_408 + (float)uStack_408 + -1.0;
                fStack_304 = uStack_408._4_4_ + uStack_408._4_4_ + -1.0;
                local_340 = (float)local_1e0._0_4_;
                fStack_33c = (float)local_1e0._4_4_;
                fStack_338 = fStack_1d8;
                fStack_334 = fStack_1d4;
                fStack_330 = fStack_1d0;
                fStack_32c = fStack_1cc;
                fStack_328 = fStack_1c8;
                fStack_324 = fStack_1c4;
                local_300 = local_200;
                local_2d0 = local_7f0;
                uStack_2c8 = uStack_7e8;
                local_2c0 = local_710._0_8_;
                uStack_2b8 = local_710._8_8_;
                local_2b0 = local_720;
                local_2a0 = local_580;
                local_760._0_8_ = (context->scene->geometries).items[local_7c8].ptr;
                local_420._4_4_ = fStack_31c;
                local_420._0_4_ = local_320;
                uStack_418._0_4_ = fStack_318;
                uStack_418._4_4_ = fStack_314;
                uStack_410._0_4_ = fStack_310;
                uStack_410._4_4_ = fStack_30c;
                auVar137 = _local_420;
                uStack_408._0_4_ = fStack_308;
                uStack_408._4_4_ = fStack_304;
                auVar25 = _local_420;
                if ((((Geometry *)local_760._0_8_)->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  pRVar140 = (RTCIntersectArguments *)0x0;
                  auVar338 = ZEXT3264(local_7c0);
                  auVar215 = ZEXT3264(local_740);
                }
                else {
                  pRVar140 = context->args;
                  auVar338 = ZEXT3264(local_7c0);
                  if (pRVar140->filter == (RTCFilterFunctionN)0x0) {
                    auVar215 = ZEXT3264(local_740);
                    pRVar140 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar140 >> 8),1);
                    if (((Geometry *)local_760._0_8_)->occlusionFilterN == (RTCFilterFunctionN)0x0)
                    goto LAB_011b3059;
                  }
                  local_760._8_24_ = auVar254._8_24_;
                  local_6e0._0_4_ = (int)uVar144;
                  auVar179._0_4_ = (float)(int)local_2e0;
                  auVar179._4_8_ = SUB128(ZEXT812(0),4);
                  auVar179._12_4_ = 0;
                  auVar249 = vshufps_avx(auVar179,auVar179,0);
                  local_260[0] = (auVar249._0_4_ + (float)local_1e0._0_4_ + 0.0) *
                                 (float)local_100._0_4_;
                  local_260[1] = (auVar249._4_4_ + (float)local_1e0._4_4_ + 1.0) *
                                 (float)local_100._4_4_;
                  local_260[2] = (auVar249._8_4_ + fStack_1d8 + 2.0) * fStack_f8;
                  local_260[3] = (auVar249._12_4_ + fStack_1d4 + 3.0) * fStack_f4;
                  fStack_250 = (auVar249._0_4_ + fStack_1d0 + 4.0) * fStack_f0;
                  fStack_24c = (auVar249._4_4_ + fStack_1cc + 5.0) * fStack_ec;
                  fStack_248 = (auVar249._8_4_ + fStack_1c8 + 6.0) * fStack_e8;
                  fStack_244 = auVar249._12_4_ + fStack_1c4 + 7.0;
                  uStack_410 = auVar137._16_8_;
                  uStack_408 = auVar25._24_8_;
                  local_240 = local_420;
                  uStack_238 = uStack_418;
                  uStack_230 = uStack_410;
                  uStack_228 = uStack_408;
                  local_220 = local_200;
                  iVar139 = vmovmskps_avx(local_280);
                  local_840 = (undefined1  [8])CONCAT44((int)((ulong)pRVar140 >> 0x20),iVar139);
                  lVar24 = 0;
                  if (local_840 != (undefined1  [8])0x0) {
                    for (; ((ulong)local_840 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                    }
                  }
                  local_820 = (uint)lVar24;
                  uStack_81c = (undefined4)((ulong)lVar24 >> 0x20);
                  _auStack_77c = auVar149._4_28_;
                  local_780 = (undefined1  [4])
                              (int)CONCAT71((int7)((ulong)local_840 >> 8),iVar139 != 0);
                  _local_420 = auVar25;
                  if (iVar139 != 0) {
                    _auStack_690 = auVar362._16_16_;
                    _local_6a0 = local_710;
                    _local_6c0 = local_720;
                    _auStack_6f0 = auVar293._16_16_;
                    _local_700 = local_580;
                    local_7a0 = (float)*(undefined8 *)*local_678;
                    fStack_79c = (float)((ulong)*(undefined8 *)*local_678 >> 0x20);
                    fStack_798 = (float)*(undefined8 *)(*local_678 + 8);
                    fStack_794 = (float)((ulong)*(undefined8 *)(*local_678 + 8) >> 0x20);
                    _local_5e0 = auVar26;
                    local_2dc = uVar20;
                    do {
                      local_620._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      lVar24 = CONCAT44(uStack_81c,local_820);
                      local_480 = local_260[lVar24];
                      local_470 = *(undefined4 *)((long)&local_240 + lVar24 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_220 + lVar24 * 4);
                      fVar256 = 1.0 - local_480;
                      fVar244 = local_480 * fVar256 * 4.0;
                      auVar275 = ZEXT464(0x3f000000);
                      auVar249 = ZEXT416((uint)(local_480 * local_480 * 0.5));
                      auVar249 = vshufps_avx(auVar249,auVar249,0);
                      auVar195 = ZEXT416((uint)((fVar256 * fVar256 + fVar244) * 0.5));
                      auVar195 = vshufps_avx(auVar195,auVar195,0);
                      auVar228 = ZEXT416((uint)((-local_480 * local_480 - fVar244) * 0.5));
                      auVar228 = vshufps_avx(auVar228,auVar228,0);
                      local_670.context = context->user;
                      auVar207 = ZEXT416((uint)(fVar256 * -fVar256 * 0.5));
                      auVar207 = vshufps_avx(auVar207,auVar207,0);
                      auVar196._0_4_ =
                           auVar207._0_4_ * fVar258 +
                           auVar228._0_4_ * (float)local_6a0._0_4_ +
                           auVar249._0_4_ * (float)local_700._0_4_ +
                           auVar195._0_4_ * (float)local_6c0._0_4_;
                      auVar196._4_4_ =
                           auVar207._4_4_ * fVar260 +
                           auVar228._4_4_ * (float)local_6a0._4_4_ +
                           auVar249._4_4_ * (float)local_700._4_4_ +
                           auVar195._4_4_ * (float)local_6c0._4_4_;
                      auVar196._8_4_ =
                           auVar207._8_4_ * fVar264 +
                           auVar228._8_4_ * (float)uStack_698 +
                           auVar249._8_4_ * fStack_6f8 + auVar195._8_4_ * (float)uStack_6b8;
                      auVar196._12_4_ =
                           auVar207._12_4_ * fVar205 +
                           auVar228._12_4_ * uStack_698._4_4_ +
                           auVar249._12_4_ * fStack_6f4 + auVar195._12_4_ * uStack_6b8._4_4_;
                      local_4b0 = (RTCHitN  [16])vshufps_avx(auVar196,auVar196,0);
                      local_4a0 = vshufps_avx(auVar196,auVar196,0x55);
                      local_490 = vshufps_avx(auVar196,auVar196,0xaa);
                      local_460 = local_5b0._0_8_;
                      uStack_458 = local_5b0._8_8_;
                      local_450 = local_350._0_8_;
                      uStack_448 = local_350._8_8_;
                      vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                      uStack_43c = (local_670.context)->instID[0];
                      local_440 = uStack_43c;
                      uStack_438 = uStack_43c;
                      uStack_434 = uStack_43c;
                      uStack_430 = (local_670.context)->instPrimID[0];
                      uStack_42c = uStack_430;
                      uStack_428 = uStack_430;
                      uStack_424 = uStack_430;
                      local_7e0 = CONCAT44(fStack_79c,local_7a0);
                      uStack_7d8 = CONCAT44(fStack_794,fStack_798);
                      local_670.valid = (int *)&local_7e0;
                      local_670.geometryUserPtr = *(void **)(local_760._0_8_ + 0x18);
                      local_670.hit = local_4b0;
                      local_670.N = 4;
                      local_670.ray = (RTCRayN *)ray;
                      fStack_47c = local_480;
                      fStack_478 = local_480;
                      fStack_474 = local_480;
                      uStack_46c = local_470;
                      uStack_468 = local_470;
                      uStack_464 = local_470;
                      if (*(code **)(local_760._0_8_ + 0x48) != (code *)0x0) {
                        auVar275 = ZEXT1664(auVar275._0_16_);
                        (**(code **)(local_760._0_8_ + 0x48))(&local_670);
                      }
                      auVar124._8_8_ = uStack_7d8;
                      auVar124._0_8_ = local_7e0;
                      if (auVar124 == (undefined1  [16])0x0) {
                        auVar249 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                        auVar249 = auVar249 ^ _DAT_01febe20;
                      }
                      else {
                        p_Var23 = context->args->filter;
                        if ((p_Var23 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            ((*(byte *)(local_760._0_8_ + 0x3e) & 0x40) != 0)))) {
                          auVar275 = ZEXT1664(auVar275._0_16_);
                          (*p_Var23)(&local_670);
                        }
                        auVar125._8_8_ = uStack_7d8;
                        auVar125._0_8_ = local_7e0;
                        auVar195 = vpcmpeqd_avx((undefined1  [16])0x0,auVar125);
                        auVar249 = auVar195 ^ _DAT_01febe20;
                        auVar197._8_4_ = 0xff800000;
                        auVar197._0_8_ = 0xff800000ff800000;
                        auVar197._12_4_ = 0xff800000;
                        auVar195 = vblendvps_avx(auVar197,*(undefined1 (*) [16])
                                                           (local_670.ray + 0x80),auVar195);
                        *(undefined1 (*) [16])(local_670.ray + 0x80) = auVar195;
                      }
                      auVar159 = ZEXT1664(auVar249);
                      auVar180._8_8_ = 0x100000001;
                      auVar180._0_8_ = 0x100000001;
                      if ((auVar180 & auVar249) != (undefined1  [16])0x0) break;
                      auVar159 = ZEXT464((uint)local_620._0_4_);
                      *(undefined4 *)(ray + k * 4 + 0x80) = local_620._0_4_;
                      local_840 = (undefined1  [8])
                                  ((ulong)local_840 ^ 1L << ((ulong)local_820 & 0x3f));
                      lVar24 = 0;
                      if (local_840 != (undefined1  [8])0x0) {
                        for (; ((ulong)local_840 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                        }
                      }
                      local_820 = (uint)lVar24;
                      uStack_81c = (undefined4)((ulong)lVar24 >> 0x20);
                      local_780 = (undefined1  [4])
                                  (int)CONCAT71((int7)((ulong)local_840 >> 8),
                                                local_840 != (undefined1  [8])0x0);
                    } while (local_840 != (undefined1  [8])0x0);
                  }
                  pRVar140 = (RTCIntersectArguments *)(ulong)(local_780[0] & 1);
                  auVar215 = ZEXT3264(local_740);
                  auVar338 = ZEXT3264(local_7c0);
                  auVar372 = ZEXT3264(_local_640);
                  uVar144 = (ulong)(uint)local_6e0._0_4_;
                  fVar244 = (float)local_5a0._0_4_;
                  fVar256 = (float)local_5a0._4_4_;
                  fVar262 = fStack_598;
                  fVar263 = fStack_594;
                  fVar216 = fStack_590;
                  fVar217 = fStack_58c;
                  fVar218 = fStack_588;
                  fVar219 = fStack_584;
                }
LAB_011b3059:
                uVar144 = CONCAT71((int7)(uVar144 >> 8),(byte)uVar144 | (byte)pRVar140);
                goto LAB_011b2b23;
              }
            }
            auVar338 = ZEXT3264(local_7c0);
            auVar215 = ZEXT3264(local_740);
          }
LAB_011b2b23:
          lVar141 = lVar141 + 8;
        } while ((int)lVar141 < (int)uVar20);
      }
      if ((uVar144 & 1) != 0) {
        return local_89d;
      }
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar155._4_4_ = uVar8;
      auVar155._0_4_ = uVar8;
      auVar155._8_4_ = uVar8;
      auVar155._12_4_ = uVar8;
      auVar155._16_4_ = uVar8;
      auVar155._20_4_ = uVar8;
      auVar155._24_4_ = uVar8;
      auVar155._28_4_ = uVar8;
      auVar149 = vcmpps_avx(local_80,auVar155,2);
      uVar138 = vmovmskps_avx(auVar149);
      uVar138 = (uint)uVar145 & uVar138;
      local_89d = uVar138 != 0;
      auVar338 = auVar215;
    } while (local_89d);
  }
  return local_89d;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }